

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

char * duckdb_yyjson::yyjson_mut_write_opts_impl
                 (yyjson_mut_val *val,usize estimated_val_num,yyjson_write_flag flg,
                 yyjson_alc *alc_ptr,usize *dat_len,yyjson_write_err *err)

{
  byte bVar1;
  ushort uVar2;
  undefined4 uVar3;
  _func_void_ptr_void_ptr_size_t *p_Var4;
  _func_void_void_ptr_void_ptr *p_Var5;
  void *pvVar6;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *p_Var7;
  void *pvVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  ulong uVar103;
  ulong uVar104;
  uint64_t uVar105;
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  char *pcVar109;
  byte *pbVar110;
  undefined2 uVar111;
  byte *pbVar112;
  uint *puVar113;
  undefined8 uVar114;
  long lVar115;
  long lVar116;
  char *pcVar117;
  yyjson_write_err *pyVar118;
  yyjson_write_err *pyVar119;
  uint uVar120;
  int iVar121;
  undefined **ppuVar122;
  ulong uVar123;
  uint *puVar124;
  size_t sVar125;
  ulong uVar126;
  uint *puVar127;
  ulong *puVar128;
  uint *puVar129;
  undefined8 *puVar130;
  char cVar131;
  undefined1 *puVar132;
  uint uVar133;
  int iVar134;
  size_t sVar135;
  yyjson_mut_val *pyVar136;
  yyjson_mut_val *pyVar137;
  long lVar138;
  int iVar139;
  long lVar140;
  int iVar141;
  uint uVar142;
  undefined2 *puVar143;
  ulong uVar144;
  long lVar145;
  long lVar146;
  int iVar147;
  uint uVar148;
  int iVar149;
  long lVar150;
  long lVar151;
  uint uVar152;
  long lVar153;
  ushort *puVar154;
  uint *puVar155;
  byte bVar156;
  uint uVar157;
  byte *pbVar158;
  size_t sVar159;
  undefined1 *puVar160;
  ulong uVar161;
  bool bVar162;
  bool bVar163;
  long lStack_120;
  uint *local_110;
  char local_fc;
  ulong *local_f8;
  ulong local_f0;
  uint local_e0;
  uint *local_d0;
  ulong local_c0;
  ulong *local_b0;
  yyjson_mut_val *local_80;
  yyjson_write_err dummy_err;
  ulong local_40;
  
  ppuVar122 = &YYJSON_DEFAULT_ALC;
  if (alc_ptr != (yyjson_alc *)0x0) {
    ppuVar122 = &alc_ptr->malloc;
  }
  pyVar119 = err;
  if (err == (yyjson_write_err *)0x0) {
    pyVar119 = &dummy_err;
  }
  if (val == (yyjson_mut_val *)0x0) {
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar118 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar118 = err;
    }
    pyVar118->msg = "input JSON is NULL";
    pyVar119->code = 1;
    return (char *)0x0;
  }
  p_Var4 = ((yyjson_alc *)ppuVar122)->malloc;
  p_Var5 = ((yyjson_alc *)ppuVar122)->free;
  pvVar6 = ((yyjson_alc *)ppuVar122)->ctx;
  uVar107 = val->tag;
  bVar156 = (byte)uVar107;
  local_fc = (char)flg;
  if (0xff < uVar107 && (~bVar156 & 6) == 0) {
    p_Var7 = ((yyjson_alc *)ppuVar122)->realloc;
    if ((flg & 0x41) == 0) {
      if ((flg & 2) == 0) {
        puVar132 = enc_table_cpy;
        puVar160 = enc_table_cpy_slash;
      }
      else {
        puVar132 = enc_table_esc;
        puVar160 = enc_table_esc_slash;
      }
      if ((flg & 4) == 0) {
        puVar160 = puVar132;
      }
      local_f0 = estimated_val_num * 0x12 + 0x4f & 0xfffffffffffffff0;
      local_110 = (uint *)(*p_Var4)(pvVar6,local_f0);
      if (local_110 != (uint *)0x0) {
        uVar107 = val->tag;
        uVar120 = (uint)uVar107 & 7;
        bVar163 = uVar120 == 7;
        local_c0 = (ulong)bVar163;
        *(byte *)local_110 = bVar163 << 5 | 0x5b;
        pyVar136 = (yyjson_mut_val *)(val->uni).u64;
        if (uVar120 == 7) {
          pyVar136 = pyVar136->next;
        }
        puVar155 = (uint *)((long)local_110 + local_f0);
        puVar127 = (uint *)((long)local_110 + 1);
        lVar151 = (uVar107 >> 8) << bVar163;
        local_d0 = puVar155;
LAB_01f521fc:
        do {
          puVar124 = puVar127;
          pyVar137 = pyVar136;
          do {
            pyVar137 = pyVar137->next;
            uVar107 = pyVar137->tag;
            bVar156 = (byte)uVar107 & 7;
            puVar113 = puVar155;
            if (bVar156 == 4) {
              if (puVar155 <= puVar124 + 8) {
                uVar107 = local_f0 >> 1;
                if (local_f0 >> 1 < 0x21) {
                  uVar107 = 0x20;
                }
                sVar135 = (uVar107 + 0xf & 0xfffffffffffffff0) + local_f0;
                pbVar158 = (byte *)(*p_Var7)(pvVar6,local_110,local_f0,sVar135);
                if (pbVar158 == (byte *)0x0) goto LAB_01f54af9;
                puVar113 = (uint *)(pbVar158 + (sVar135 - ((long)local_d0 - (long)puVar155)));
                memmove(puVar113,pbVar158 + ((long)puVar155 - (long)local_110),
                        (long)local_d0 - (long)puVar155);
                puVar124 = (uint *)(pbVar158 + ((long)puVar124 - (long)local_110));
                local_d0 = (uint *)(pbVar158 + sVar135);
                uVar107 = pyVar137->tag;
                local_110 = (uint *)pbVar158;
                local_f0 = sVar135;
              }
              pcVar109 = (char *)(pyVar137->uni).u64;
              uVar120 = (uint)((ulong)pcVar109 >> 0x20);
              if ((uVar107 & 0x10) == 0) {
                uVar120 = uVar120 >> 0x1f & (uint)(uVar107 >> 3);
                *(byte *)puVar124 = 0x2d;
                pcVar117 = (char *)-(long)pcVar109;
                if (uVar120 == 0) {
                  pcVar117 = pcVar109;
                }
                pbVar158 = (byte *)((ulong)uVar120 + (long)puVar124);
                if (pcVar117 < (char *)0x5f5e100) {
                  if (pcVar117 < (char *)0x64) {
                    *(undefined2 *)pbVar158 =
                         *(undefined2 *)
                          (digit_table + (ulong)(pcVar117 < (char *)0xa) + (long)pcVar117 * 2);
                    puVar124 = (uint *)(pbVar158 + (2 - (ulong)(pcVar117 < (char *)0xa)));
                  }
                  else {
                    iVar141 = (int)pcVar117;
                    if (pcVar117 < (char *)0x2710) {
                      uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                      uVar107 = (ulong)(pcVar117 < (char *)0x3e8);
                      *(undefined2 *)pbVar158 =
                           *(undefined2 *)(digit_table + uVar107 + (ulong)uVar120 * 2);
                      *(undefined2 *)(pbVar158 + (2 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                      puVar124 = (uint *)(pbVar158 + (4 - uVar107));
                    }
                    else if (pcVar117 < (char *)0xf4240) {
                      iVar141 = (int)((ulong)((long)pcVar117 * 0x68db9) >> 0x20) * -10000 + iVar141;
                      uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                      uVar107 = (ulong)(pcVar117 < (char *)0x186a0);
                      *(undefined2 *)pbVar158 =
                           *(undefined2 *)
                            (digit_table + uVar107 + ((ulong)((long)pcVar117 * 0x68db9) >> 0x20) * 2
                            );
                      *(undefined2 *)(pbVar158 + (2 - uVar107)) =
                           *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                      *(undefined2 *)(pbVar158 + (4 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                      puVar124 = (uint *)(pbVar158 + (6 - uVar107));
                    }
                    else {
                      uVar120 = (uint)((ulong)((long)pcVar117 * 0x68db8bb) >> 0x20);
                      uVar133 = uVar120 >> 8;
                      iVar141 = uVar133 * -10000 + iVar141;
                      uVar133 = uVar133 * 0x147b >> 0x13;
                      uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
                      uVar107 = (ulong)(pcVar117 <
                                       "E_17_Hashtable_traitsILb1ELb0ELb1EEEE9_M_rehashEmRKm");
                      *(undefined2 *)pbVar158 =
                           *(undefined2 *)(digit_table + uVar107 + (ulong)uVar133 * 2);
                      *(undefined2 *)(pbVar158 + (2 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                      *(undefined2 *)(pbVar158 + (4 - uVar107)) =
                           *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                      *(undefined2 *)(pbVar158 + (6 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar142 * -100 + iVar141) * 2);
                      puVar124 = (uint *)(pbVar158 + (8 - uVar107));
                    }
                  }
                }
                else {
                  auVar17._8_8_ = 0;
                  auVar17._0_8_ = pcVar117;
                  lVar153 = SUB168(auVar17 / ZEXT816(100000000),0);
                  pcVar109 = pcVar117 + lVar153 * 0xfa0a1f00;
                  iVar141 = SUB164(auVar17 / ZEXT816(100000000),0);
                  if (pcVar117 < (char *)0x2386f26fc10000) {
                    if (pcVar117 < (char *)0x2540be400) {
                      *(undefined2 *)pbVar158 =
                           *(undefined2 *)
                            (digit_table + (ulong)(pcVar117 < (char *)0x3b9aca00) + lVar153 * 2);
                      pbVar158 = pbVar158 + (2 - (ulong)(pcVar117 < (char *)0x3b9aca00));
                    }
                    else if (pcVar117 < (char *)0xe8d4a51000) {
                      uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                      uVar107 = (ulong)((ulong)pcVar117 >> 0xb < 0x2e90edd);
                      *(undefined2 *)pbVar158 =
                           *(undefined2 *)(digit_table + uVar107 + (ulong)uVar120 * 2);
                      *(undefined2 *)(pbVar158 + (2 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                      pbVar158 = pbVar158 + (4 - uVar107);
                    }
                    else if (pcVar117 < (char *)0x5af3107a4000) {
                      iVar141 = (int)((ulong)(lVar153 * 0x68db9) >> 0x20) * -10000 + iVar141;
                      uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                      uVar107 = (ulong)((ulong)pcVar117 >> 0xd < 0x48c27395);
                      *(undefined2 *)pbVar158 =
                           *(undefined2 *)
                            (digit_table + uVar107 + ((ulong)(lVar153 * 0x68db9) >> 0x20) * 2);
                      *(undefined2 *)(pbVar158 + (2 - uVar107)) =
                           *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                      *(undefined2 *)(pbVar158 + (4 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                      pbVar158 = pbVar158 + (6 - uVar107);
                    }
                    else {
                      uVar120 = (uint)((ulong)(lVar153 * 0x68db8bb) >> 0x20);
                      uVar133 = uVar120 >> 8;
                      iVar141 = uVar133 * -10000 + iVar141;
                      uVar133 = uVar133 * 0x147b >> 0x13;
                      uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
                      uVar107 = (ulong)(pcVar117 < (char *)0x38d7ea4c68000);
                      *(undefined2 *)pbVar158 =
                           *(undefined2 *)(digit_table + uVar107 + (ulong)uVar133 * 2);
                      *(undefined2 *)(pbVar158 + (2 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                      *(undefined2 *)(pbVar158 + (4 - uVar107)) =
                           *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                      *(undefined2 *)(pbVar158 + (6 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar142 * -100 + iVar141) * 2);
                      pbVar158 = pbVar158 + (8 - uVar107);
                    }
                    uVar120 = (uint)(((ulong)pcVar109 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar133 = uVar120 >> 8;
                    iVar141 = uVar133 * -10000 + (int)pcVar109;
                    uVar133 = uVar133 * 0x147b >> 0x13;
                    uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar158 = *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                    *(undefined2 *)(pbVar158 + 2) =
                         *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                    *(undefined2 *)(pbVar158 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                    *(undefined2 *)(pbVar158 + 6) =
                         *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar141) * 2);
                    puVar124 = (uint *)(pbVar158 + 8);
                  }
                  else {
                    auVar18._8_8_ = 0;
                    auVar18._0_8_ = pcVar117;
                    lVar153 = SUB168(auVar18 / ZEXT816(1000000000000),0);
                    iVar139 = SUB164(auVar18 / ZEXT816(1000000000000),0);
                    if (pcVar117 < (char *)0xde0b6b3a7640000) {
                      uVar107 = lVar153 * 0x68db9;
                      iVar147 = (int)(uVar107 >> 0x20) * -10000 + iVar139;
                      uVar120 = (uint)(iVar147 * 0x147b) >> 0x13;
                      uVar161 = (ulong)(pcVar117 < (char *)0x16345785d8a0000);
                      *(undefined2 *)pbVar158 =
                           *(undefined2 *)(digit_table + uVar161 + (uVar107 >> 0x20) * 2);
                      *(undefined2 *)(pbVar158 + (2 - uVar161)) =
                           *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                      *(undefined2 *)(pbVar158 + (4 - uVar161)) =
                           *(undefined2 *)(digit_table + (uVar120 * -100 + iVar147) * 2);
                      lVar153 = 6 - uVar161;
                    }
                    else {
                      uVar120 = (uint)((ulong)(lVar153 * 0x68db8bb) >> 0x20);
                      uVar133 = uVar120 >> 8;
                      iVar147 = uVar133 * -10000 + iVar139;
                      uVar133 = uVar133 * 0x147b >> 0x13;
                      uVar142 = (uint)(iVar147 * 0x147b) >> 0x13;
                      uVar107 = (ulong)(pcVar117 < (char *)0x8ac7230489e80000);
                      *(undefined2 *)pbVar158 =
                           *(undefined2 *)(digit_table + uVar107 + (ulong)uVar133 * 2);
                      *(undefined2 *)(pbVar158 + (2 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                      *(undefined2 *)(pbVar158 + (4 - uVar107)) =
                           *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                      *(undefined2 *)(pbVar158 + (6 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar142 * -100 + iVar147) * 2);
                      lVar153 = 8 - uVar107;
                    }
                    pbVar158 = pbVar158 + lVar153;
                    iVar141 = iVar141 + iVar139 * -10000;
                    uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar158 = *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                    *(undefined2 *)(pbVar158 + 2) =
                         *(undefined2 *)(digit_table + (uVar120 * 0x7fffff9c + iVar141) * 2);
                    uVar120 = (uint)(((ulong)pcVar109 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar133 = uVar120 >> 8;
                    iVar141 = uVar133 * -10000 + (int)pcVar109;
                    uVar133 = uVar133 * 0x147b >> 0x13;
                    uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
                    *(undefined2 *)(pbVar158 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                    *(undefined2 *)(pbVar158 + 6) =
                         *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                    *(undefined2 *)(pbVar158 + 8) =
                         *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                    *(undefined2 *)(pbVar158 + 10) =
                         *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar141) * 2);
                    puVar124 = (uint *)(pbVar158 + 0xc);
                  }
                }
                goto LAB_01f53ed1;
              }
              uVar107 = (ulong)pcVar109 & 0xfffffffffffff;
              uVar120 = uVar120 >> 0x14 & 0x7ff;
              if (uVar120 == 0x7ff) {
                if ((flg & 0x10) == 0) {
                  if ((flg & 8) == 0) goto LAB_01f54b90;
                  if (uVar107 == 0) {
                    *(byte *)puVar124 = 0x2d;
                    puVar130 = (undefined8 *)((long)puVar124 - ((long)pcVar109 >> 0x3f));
                    *puVar130 = 0x7974696e69666e49;
                    puVar124 = (uint *)(puVar130 + 1);
                  }
                  else {
                    *puVar124 = 0x4e614e;
LAB_01f53aa6:
                    puVar124 = (uint *)((long)puVar124 + 3);
                  }
                }
                else {
                  *puVar124 = 0x6c6c756e;
                  puVar124 = puVar124 + 1;
                }
              }
              else {
                *(byte *)puVar124 = 0x2d;
                lVar153 = -((long)pcVar109 >> 0x3f);
                puVar130 = (undefined8 *)((long)puVar124 + lVar153);
                if (((ulong)pcVar109 & 0x7fffffffffffffff) == 0) {
                  *(undefined4 *)puVar130 = 0x302e30;
                  puVar124 = (uint *)((long)puVar130 + 3);
                  goto LAB_01f53ed1;
                }
                if (uVar120 == 0) {
                  uVar161 = (ulong)((uint)pcVar109 & 1);
                  uVar107 = uVar107 * 0x20;
                  auVar49._8_8_ = 0;
                  auVar49._0_8_ = uVar107 - 0x10;
                  auVar94._8_8_ = 0;
                  auVar94._0_8_ = SUB168(auVar49 * ZEXT816(0x6c07a2c26a8346d2),8);
                  auVar50._8_8_ = 0;
                  auVar50._0_8_ = uVar107 - 0x10;
                  auVar94 = auVar50 * ZEXT816(0x9e19db92b4e31ba9) + auVar94;
                  auVar51._8_8_ = 0;
                  auVar51._0_8_ = uVar107;
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ = SUB168(auVar51 * ZEXT816(0x6c07a2c26a8346d2),8);
                  auVar52._8_8_ = 0;
                  auVar52._0_8_ = uVar107;
                  auVar95 = auVar52 * ZEXT816(0x9e19db92b4e31ba9) + auVar95;
                  uVar106 = auVar95._8_8_;
                  auVar53._8_8_ = 0;
                  auVar53._0_8_ = uVar107 + 0x10;
                  auVar96._8_8_ = 0;
                  auVar96._0_8_ = SUB168(auVar53 * ZEXT816(0x6c07a2c26a8346d2),8);
                  auVar54._8_8_ = 0;
                  auVar54._0_8_ = uVar107 + 0x10;
                  auVar96 = auVar54 * ZEXT816(0x9e19db92b4e31ba9) + auVar96;
                  uVar107 = ((ulong)((auVar94 & (undefined1  [16])0xfffffffffffffffe) !=
                                    (undefined1  [16])0x0) | auVar94._8_8_) + uVar161;
                  uVar161 = ((ulong)((auVar96 & (undefined1  [16])0xfffffffffffffffe) !=
                                    (undefined1  [16])0x0) | auVar96._8_8_) - uVar161;
                  if (uVar106 < 0x28) {
LAB_01f54204:
                    uVar108 = (auVar95 & (undefined1  [16])0xfffffffffffffffe) !=
                              (undefined1  [16])0x0 | uVar106;
                    uVar123 = uVar106 & 0x7ffffffffffffffc;
                    bVar163 = true;
                    if (uVar108 <= (uVar123 | 2)) {
                      bVar163 = (bool)((byte)((uVar106 & 0xffffffff) >> 2) & 0x3f &
                                      uVar108 == (uVar123 | 2));
                    }
                    uVar108 = uVar106 >> 2;
                    bVar162 = uVar123 + 4 <= uVar161;
                    if (uVar123 < uVar107 == bVar162) {
                      bVar163 = bVar162;
                    }
                    iVar141 = -0x144;
                  }
                  else {
                    uVar108 = uVar106 / 0x28;
                    bVar163 = uVar108 * 0x28 + 0x28 <= uVar161;
                    if (uVar108 * 0x28 < uVar107 != bVar163) goto LAB_01f54204;
                    iVar141 = -0x143;
                  }
                  pcVar117 = (char *)(bVar163 + uVar108);
                  pcVar109 = (char *)((long)puVar130 + 1);
                  if (pcVar117 < (char *)0x38d7ea4c68000) {
                    iVar139 = (int)pcVar117;
                    if (pcVar117 < (char *)0x5f5e100) {
                      if (pcVar117 < (char *)0x64) {
                        *(undefined2 *)pcVar109 =
                             *(undefined2 *)
                              (digit_table + (ulong)(pcVar117 < (char *)0xa) + (long)pcVar117 * 2);
                        pcVar109 = pcVar109 + (2 - (ulong)(pcVar117 < (char *)0xa));
                      }
                      else if (pcVar117 < (char *)0x2710) {
                        uVar120 = (uint)(iVar139 * 0x147b) >> 0x13;
                        uVar107 = (ulong)(pcVar117 < (char *)0x3e8);
                        *(undefined2 *)pcVar109 =
                             *(undefined2 *)(digit_table + uVar107 + (ulong)uVar120 * 2);
                        *(undefined2 *)(pcVar109 + (2 - uVar107)) =
                             *(undefined2 *)(digit_table + (uVar120 * -100 + iVar139) * 2);
                        pcVar109 = pcVar109 + (4 - uVar107);
                      }
                      else {
                        if ((char *)0xf423f < pcVar117) {
                          uVar120 = (uint)((ulong)((long)pcVar117 * 0x68db8bb) >> 0x20);
                          uVar133 = uVar120 >> 8;
                          iVar139 = uVar133 * -10000 + iVar139;
                          uVar133 = uVar133 * 0x147b >> 0x13;
                          uVar142 = (uint)(iVar139 * 0x147b) >> 0x13;
                          *(undefined2 *)pcVar109 =
                               *(undefined2 *)
                                (digit_table +
                                (ulong)(pcVar117 <
                                       "E_17_Hashtable_traitsILb1ELb0ELb1EEEE9_M_rehashEmRKm") +
                                (ulong)uVar133 * 2);
                          pcVar109 = pcVar109 +
                                     -(ulong)(pcVar117 <
                                             "E_17_Hashtable_traitsILb1ELb0ELb1EEEE9_M_rehashEmRKm")
                          ;
                          *(undefined2 *)(pcVar109 + 2) =
                               *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                          *(undefined2 *)(pcVar109 + 4) =
                               *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                          uVar111 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar139) * 2);
                          goto LAB_01f548c6;
                        }
                        iVar139 = (int)((ulong)((long)pcVar117 * 0x68db9) >> 0x20) * -10000 +
                                  iVar139;
                        uVar120 = (uint)(iVar139 * 0x147b) >> 0x13;
                        uVar107 = (ulong)(pcVar117 < (char *)0x186a0);
                        *(undefined2 *)pcVar109 =
                             *(undefined2 *)
                              (digit_table +
                              uVar107 + ((ulong)((long)pcVar117 * 0x68db9) >> 0x20) * 2);
                        *(undefined2 *)(pcVar109 + (2 - uVar107)) =
                             *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                        *(undefined2 *)(pcVar109 + (4 - uVar107)) =
                             *(undefined2 *)(digit_table + (uVar120 * -100 + iVar139) * 2);
                        pcVar109 = pcVar109 + (6 - uVar107);
                      }
                    }
                    else {
                      auVar24._8_8_ = 0;
                      auVar24._0_8_ = pcVar117;
                      lVar153 = SUB168(auVar24 / ZEXT816(100000000),0);
                      iVar147 = SUB164(auVar24 / ZEXT816(100000000),0);
                      if (pcVar117 < (char *)0x2540be400) {
                        *(undefined2 *)pcVar109 =
                             *(undefined2 *)
                              (digit_table + (ulong)(pcVar117 < (char *)0x3b9aca00) + lVar153 * 2);
                        pcVar109 = pcVar109 + (2 - (ulong)(pcVar117 < (char *)0x3b9aca00));
                      }
                      else if (pcVar117 < (char *)0xe8d4a51000) {
                        uVar120 = (uint)(iVar147 * 0x147b) >> 0x13;
                        uVar107 = (ulong)((ulong)pcVar117 >> 0xb < 0x2e90edd);
                        *(undefined2 *)pcVar109 =
                             *(undefined2 *)(digit_table + uVar107 + (ulong)uVar120 * 2);
                        *(undefined2 *)(pcVar109 + (2 - uVar107)) =
                             *(undefined2 *)(digit_table + (uVar120 * -100 + iVar147) * 2);
                        pcVar109 = pcVar109 + (4 - uVar107);
                      }
                      else if (pcVar117 < (char *)0x5af3107a4000) {
                        iVar149 = (int)((ulong)(lVar153 * 0x68db9) >> 0x20) * -10000 + iVar147;
                        uVar120 = (uint)(iVar149 * 0x147b) >> 0x13;
                        uVar107 = (ulong)((ulong)pcVar117 >> 0xd < 0x48c27395);
                        *(undefined2 *)pcVar109 =
                             *(undefined2 *)
                              (digit_table + uVar107 + ((ulong)(lVar153 * 0x68db9) >> 0x20) * 2);
                        *(undefined2 *)(pcVar109 + (2 - uVar107)) =
                             *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                        *(undefined2 *)(pcVar109 + (4 - uVar107)) =
                             *(undefined2 *)(digit_table + (uVar120 * -100 + iVar149) * 2);
                        pcVar109 = pcVar109 + (6 - uVar107);
                      }
                      else {
                        uVar120 = (uint)((ulong)(lVar153 * 0x68db8bb) >> 0x20);
                        uVar133 = uVar120 >> 8;
                        iVar149 = uVar133 * -10000 + iVar147;
                        uVar133 = uVar133 * 0x147b >> 0x13;
                        uVar142 = (uint)(iVar149 * 0x147b) >> 0x13;
                        *(undefined2 *)((long)puVar130 + 1) =
                             *(undefined2 *)(digit_table + (ulong)uVar133 * 2 + 1);
                        *(undefined2 *)((long)puVar130 + 2) =
                             *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                        *(undefined2 *)((long)puVar130 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                        *(undefined2 *)((long)puVar130 + 6) =
                             *(undefined2 *)(digit_table + (uVar142 * -100 + iVar149) * 2);
                        pcVar109 = (char *)(puVar130 + 1);
                      }
                      uVar133 = iVar147 * -100000000 + iVar139;
                      uVar120 = (uint)((ulong)uVar133 * 0x68db8bb >> 0x20);
                      uVar142 = uVar120 >> 8;
                      iVar139 = uVar142 * -10000 + uVar133;
                      uVar133 = uVar142 * 0x147b >> 0x13;
                      uVar142 = (uint)(iVar139 * 0x147b) >> 0x13;
                      *(undefined2 *)pcVar109 = *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                      *(undefined2 *)(pcVar109 + 2) =
                           *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                      *(undefined2 *)(pcVar109 + 4) =
                           *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                      uVar111 = *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar139) * 2);
LAB_01f548c6:
                      *(undefined2 *)(pcVar109 + 6) = uVar111;
                      pcVar109 = pcVar109 + 8;
                    }
                  }
                  else {
                    auVar23._8_8_ = 0;
                    auVar23._0_8_ = pcVar117;
                    uVar107 = SUB168(auVar23 / ZEXT816(10000000000000000),0) * 0xfa0a1f00 +
                              (ulong)pcVar117 / 100000000;
                    *pcVar109 = SUB161(auVar23 / ZEXT816(10000000000000000),0) + '0';
                    pcVar109 = pcVar109 + ((char *)0x2386f26fc0ffff < pcVar117);
                    uVar120 = (uint)((uVar107 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar133 = uVar120 >> 8;
                    iVar139 = uVar133 * -10000 + (int)uVar107;
                    uVar133 = uVar133 * 0x147b >> 0x13;
                    uVar142 = (uint)(iVar139 * 0x147b) >> 0x13;
                    *(undefined2 *)pcVar109 = *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                    *(undefined2 *)(pcVar109 + 2) =
                         *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                    *(undefined2 *)(pcVar109 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                    *(undefined2 *)(pcVar109 + 6) =
                         *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar139) * 2);
                    uVar120 = (uint)(((ulong)(pcVar117 + ((ulong)pcVar117 / 100000000) * 0xfa0a1f00)
                                     & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar133 = uVar120 >> 8;
                    iVar139 = uVar133 * -10000 +
                              (int)(pcVar117 + ((ulong)pcVar117 / 100000000) * 0xfa0a1f00);
                    uVar133 = uVar133 * 0x147b >> 0x13;
                    uVar142 = (uint)(iVar139 * 0x147b) >> 0x13;
                    *(undefined2 *)(pcVar109 + 8) =
                         *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                    *(undefined2 *)(pcVar109 + 10) =
                         *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                    *(undefined2 *)(pcVar109 + 0xc) =
                         *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                    *(undefined2 *)(pcVar109 + 0xe) =
                         *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar139) * 2);
                    pcVar109 = pcVar109 + 0x10;
                  }
                  *(undefined1 *)puVar130 = *(undefined1 *)((long)puVar130 + 1);
                  *(undefined1 *)((long)puVar130 + 1) = 0x2e;
                  lVar153 = 0;
                  do {
                    lVar150 = lVar153 + -1;
                    lVar153 = lVar153 + -1;
                  } while (pcVar109[lVar150] == '0');
                  iVar141 = ((int)pcVar109 - (int)puVar130) + iVar141 + -2;
                  pcVar109 = pcVar109 + lVar153 + (ulong)(pcVar109[lVar150] != '.');
                  pcVar109[0] = 'e';
                  pcVar109[1] = '-';
                  uVar120 = iVar141 * -0x290;
                  pcVar109[2] = (char)(uVar120 >> 0x10) + '0';
                  *(undefined2 *)(pcVar109 + 3) =
                       *(undefined2 *)(digit_table + ((uVar120 >> 0x10) * 0x7fffff9c - iVar141) * 2)
                  ;
                  puVar124 = (uint *)(pcVar109 + 5);
                  goto LAB_01f53ed1;
                }
                uVar161 = uVar107 + 0x10000000000000;
                if (uVar120 - 0x3ff < 0x35) {
                  lVar150 = 0;
                  if (uVar161 != 0) {
                    for (; (uVar161 >> lVar150 & 1) == 0; lVar150 = lVar150 + 1) {
                    }
                  }
                  if ((uint)lVar150 < 0x433 - uVar120) goto LAB_01f524a0;
                  pcVar109 = (char *)(uVar161 >> ((byte)(0x433 - uVar120) & 0x3f));
                  iVar141 = (int)pcVar109;
                  if (pcVar109 < (char *)0x5f5e100) {
                    if (pcVar109 < (char *)0x64) {
                      *(undefined2 *)puVar130 =
                           *(undefined2 *)
                            (digit_table + (ulong)(pcVar109 < (char *)0xa) + (long)pcVar109 * 2);
                      puVar143 = (undefined2 *)
                                 ((long)puVar130 + (2 - (ulong)(pcVar109 < (char *)0xa)));
                    }
                    else if (pcVar109 < (char *)0x2710) {
                      uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                      uVar107 = (ulong)(pcVar109 < (char *)0x3e8);
                      *(undefined2 *)puVar130 =
                           *(undefined2 *)(digit_table + uVar107 + (ulong)uVar120 * 2);
                      *(undefined2 *)((long)puVar130 + (2 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                      puVar143 = (undefined2 *)((long)puVar130 + (4 - uVar107));
                    }
                    else if (pcVar109 < (char *)0xf4240) {
                      iVar141 = (int)((ulong)((long)pcVar109 * 0x68db9) >> 0x20) * -10000 + iVar141;
                      uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                      uVar107 = (ulong)(pcVar109 < (char *)0x186a0);
                      *(undefined2 *)puVar130 =
                           *(undefined2 *)
                            (digit_table + uVar107 + ((ulong)((long)pcVar109 * 0x68db9) >> 0x20) * 2
                            );
                      *(undefined2 *)((long)puVar130 + (2 - uVar107)) =
                           *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                      *(undefined2 *)((long)puVar130 + (4 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                      puVar143 = (undefined2 *)((long)puVar130 + (6 - uVar107));
                    }
                    else {
                      uVar120 = (uint)((ulong)((long)pcVar109 * 0x68db8bb) >> 0x20);
                      uVar133 = uVar120 >> 8;
                      iVar141 = uVar133 * -10000 + iVar141;
                      uVar133 = uVar133 * 0x147b >> 0x13;
                      uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
                      uVar107 = (ulong)(pcVar109 <
                                       "E_17_Hashtable_traitsILb1ELb0ELb1EEEE9_M_rehashEmRKm");
                      *(undefined2 *)puVar130 =
                           *(undefined2 *)(digit_table + uVar107 + (ulong)uVar133 * 2);
                      *(undefined2 *)((long)puVar130 + (2 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                      *(undefined2 *)((long)puVar130 + (4 - uVar107)) =
                           *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                      *(undefined2 *)((long)puVar130 + (6 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar142 * -100 + iVar141) * 2);
                      puVar143 = (undefined2 *)((long)puVar130 + (8 - uVar107));
                    }
                  }
                  else {
                    auVar22._8_8_ = 0;
                    auVar22._0_8_ = pcVar109;
                    lVar153 = SUB168(auVar22 / ZEXT816(100000000),0);
                    iVar139 = SUB164(auVar22 / ZEXT816(100000000),0);
                    if (pcVar109 < (char *)0x2540be400) {
                      *(undefined2 *)puVar130 =
                           *(undefined2 *)
                            (digit_table + (ulong)(pcVar109 < (char *)0x3b9aca00) + lVar153 * 2);
                      puVar143 = (undefined2 *)
                                 ((long)puVar130 + (2 - (ulong)(pcVar109 < (char *)0x3b9aca00)));
                    }
                    else if (pcVar109 < (char *)0xe8d4a51000) {
                      uVar120 = (uint)(iVar139 * 0x147b) >> 0x13;
                      uVar107 = (ulong)((ulong)pcVar109 >> 0xb < 0x2e90edd);
                      *(undefined2 *)puVar130 =
                           *(undefined2 *)(digit_table + uVar107 + (ulong)uVar120 * 2);
                      *(undefined2 *)((long)puVar130 + (2 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar120 * -100 + iVar139) * 2);
                      puVar143 = (undefined2 *)((long)puVar130 + (4 - uVar107));
                    }
                    else if (pcVar109 < (char *)0x5af3107a4000) {
                      iVar147 = (int)((ulong)(lVar153 * 0x68db9) >> 0x20) * -10000 + iVar139;
                      uVar120 = (uint)(iVar147 * 0x147b) >> 0x13;
                      uVar107 = (ulong)((ulong)pcVar109 >> 0xd < 0x48c27395);
                      *(undefined2 *)puVar130 =
                           *(undefined2 *)
                            (digit_table + uVar107 + ((ulong)(lVar153 * 0x68db9) >> 0x20) * 2);
                      *(undefined2 *)((long)puVar130 + (2 - uVar107)) =
                           *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                      *(undefined2 *)((long)puVar130 + (4 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar120 * -100 + iVar147) * 2);
                      puVar143 = (undefined2 *)((long)puVar130 + (6 - uVar107));
                    }
                    else {
                      uVar120 = (uint)((ulong)(lVar153 * 0x68db8bb) >> 0x20);
                      uVar133 = uVar120 >> 8;
                      iVar147 = uVar133 * -10000 + iVar139;
                      uVar133 = uVar133 * 0x147b >> 0x13;
                      uVar142 = (uint)(iVar147 * 0x147b) >> 0x13;
                      uVar107 = (ulong)(pcVar109 < (char *)0x38d7ea4c68000);
                      *(undefined2 *)puVar130 =
                           *(undefined2 *)(digit_table + uVar107 + (ulong)uVar133 * 2);
                      *(undefined2 *)((long)puVar130 + (2 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                      *(undefined2 *)((long)puVar130 + (4 - uVar107)) =
                           *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                      *(undefined2 *)((long)puVar130 + (6 - uVar107)) =
                           *(undefined2 *)(digit_table + (uVar142 * -100 + iVar147) * 2);
                      puVar143 = (undefined2 *)((long)puVar130 + (8 - uVar107));
                    }
                    uVar133 = iVar139 * -100000000 + iVar141;
                    uVar120 = (uint)((ulong)uVar133 * 0x68db8bb >> 0x20);
                    uVar142 = uVar120 >> 8;
                    iVar141 = uVar142 * -10000 + uVar133;
                    uVar133 = uVar142 * 0x147b >> 0x13;
                    uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
                    *puVar143 = *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                    puVar143[1] = *(undefined2 *)
                                   (digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                    puVar143[2] = *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                    puVar143[3] = *(undefined2 *)
                                   (digit_table + (uVar142 * 0x7fffff9c + iVar141) * 2);
                    puVar143 = puVar143 + 4;
                  }
                  *puVar143 = 0x302e;
                }
                else {
LAB_01f524a0:
                  uVar106 = (ulong)((uint)pcVar109 & 1);
                  iVar141 = uVar120 * 0x4d105 + -0x200a5;
                  if (uVar120 == 1 || uVar107 != 0) {
                    iVar141 = uVar120 * 0x4d105;
                  }
                  iVar141 = iVar141 + -0x1439b7ff >> 0x14;
                  uVar108 = *(ulong *)(pow10_sig_table + (ulong)(iVar141 * -2 + 0x2ae) * 8);
                  uVar123 = *(long *)(pow10_sig_table + (ulong)(iVar141 * -2 + 0x2af) * 8) +
                            (ulong)(iVar141 - 1U < 0xffffffc8);
                  bVar156 = ((char)((uint)(iVar141 * -0x3526b) >> 0x10) + (char)uVar120) - 0x32;
                  uVar107 = (ulong)(uVar120 != 1 && uVar107 == 0) + uVar161 * 4 + -2 <<
                            (bVar156 & 0x3f);
                  auVar43._8_8_ = 0;
                  auVar43._0_8_ = uVar123;
                  auVar73._8_8_ = 0;
                  auVar73._0_8_ = uVar107;
                  auVar91._8_8_ = 0;
                  auVar91._0_8_ = SUB168(auVar43 * auVar73,8);
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = uVar108;
                  auVar74._8_8_ = 0;
                  auVar74._0_8_ = uVar107;
                  auVar91 = auVar44 * auVar74 + auVar91;
                  uVar107 = uVar161 * 4 << (bVar156 & 0x3f);
                  auVar45._8_8_ = 0;
                  auVar45._0_8_ = uVar123;
                  auVar75._8_8_ = 0;
                  auVar75._0_8_ = uVar107;
                  auVar92._8_8_ = 0;
                  auVar92._0_8_ = SUB168(auVar45 * auVar75,8);
                  auVar46._8_8_ = 0;
                  auVar46._0_8_ = uVar108;
                  auVar76._8_8_ = 0;
                  auVar76._0_8_ = uVar107;
                  auVar92 = auVar46 * auVar76 + auVar92;
                  uVar107 = auVar92._8_8_;
                  uVar161 = uVar161 * 4 + 2 << (bVar156 & 0x3f);
                  auVar47._8_8_ = 0;
                  auVar47._0_8_ = uVar123;
                  auVar77._8_8_ = 0;
                  auVar77._0_8_ = uVar161;
                  auVar93._8_8_ = 0;
                  auVar93._0_8_ = SUB168(auVar47 * auVar77,8);
                  auVar48._8_8_ = 0;
                  auVar48._0_8_ = uVar108;
                  auVar78._8_8_ = 0;
                  auVar78._0_8_ = uVar161;
                  auVar93 = auVar48 * auVar78 + auVar93;
                  uVar161 = ((ulong)((auVar91 & (undefined1  [16])0xfffffffffffffffe) !=
                                    (undefined1  [16])0x0) | auVar91._8_8_) + uVar106;
                  uVar106 = ((ulong)((auVar93 & (undefined1  [16])0xfffffffffffffffe) !=
                                    (undefined1  [16])0x0) | auVar93._8_8_) - uVar106;
                  if (uVar107 < 0x28) {
LAB_01f525f3:
                    uVar123 = (auVar92 & (undefined1  [16])0xfffffffffffffffe) !=
                              (undefined1  [16])0x0 | uVar107;
                    uVar108 = uVar107 & 0xfffffffffffffffc;
                    bVar163 = true;
                    if (uVar123 <= uVar108 + 2) {
                      bVar163 = (bool)((byte)((uVar107 & 0xffffffff) >> 2) & 0x3f &
                                      uVar123 == uVar108 + 2);
                    }
                    bVar162 = uVar108 + 4 <= uVar106;
                    if (uVar108 < uVar161 == bVar162) {
                      bVar163 = bVar162;
                    }
                    uVar107 = (ulong)bVar163 + (uVar107 >> 2);
                  }
                  else {
                    uVar123 = (uVar107 / 0x28) * 0x28;
                    uVar108 = uVar123 + 0x28;
                    if (uVar123 < uVar161 != uVar108 <= uVar106) goto LAB_01f525f3;
                    uVar107 = (uVar107 / 0x28 + 1) - (ulong)(uVar106 < uVar108);
                    iVar141 = iVar141 + 1;
                  }
                  iVar139 = (0x11 - (uint)(uVar107 < 10000000000000000)) -
                            (uint)(uVar107 < 1000000000000000);
                  uVar120 = iVar139 + iVar141;
                  if (iVar139 + iVar141 + 5U < 0x1b) {
                    if ((int)uVar120 < 1) {
                      auVar21._8_8_ = 0;
                      auVar21._0_8_ = uVar107;
                      uVar106 = SUB168(auVar21 / ZEXT816(100000000),0);
                      uVar142 = SUB164(auVar21 / ZEXT816(100000000),0);
                      puVar143 = (undefined2 *)
                                 ((long)puVar130 +
                                 (((ulong)(2 - uVar120) + 1) - (ulong)(uVar142 < 100000000)));
                      uVar161 = (uVar106 & 0xffffffff) / 10000;
                      iVar147 = (int)(uVar161 * 0x28f5d >> 0x18);
                      uVar133 = (uint)(iVar147 * 0x29) >> 0xc;
                      *(char *)((long)puVar130 + (ulong)(2 - uVar120)) = (char)uVar133 + '0';
                      iVar141 = (int)uVar161;
                      iVar139 = iVar141 * -10000 + uVar142;
                      uVar107 = uVar106 * 0xfa0a1f00 + uVar107;
                      uVar148 = uVar133 * -100 + iVar147;
                      uVar133 = iVar147 * -100 + iVar141;
                      uVar161 = (ulong)(uVar148 < 10 && uVar142 < 100000000);
                      *puVar143 = *(undefined2 *)(digit_table + uVar161 + uVar148 * 2);
                      *(undefined2 *)((long)puVar143 + (2 - uVar161)) =
                           *(undefined2 *)(digit_table + uVar133 * 2);
                      iVar141 = (int)uVar107;
                      if (iVar141 == 0) {
                        if (iVar139 == 0) {
                          uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar148];
                          if (uVar133 != 0) {
                            uVar107 = 0;
                          }
                          uVar107 = uVar107 + (byte)dec_trailing_zero_table[uVar133];
                          lStack_120 = 4;
                        }
                        else {
                          uVar133 = (uint)(iVar139 * 0x147b) >> 0x13;
                          uVar142 = uVar133 * -100 + iVar139;
                          *(undefined2 *)((long)puVar143 + (4 - uVar161)) =
                               *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                          *(undefined2 *)((long)puVar143 + (6 - uVar161)) =
                               *(undefined2 *)(digit_table + uVar142 * 2);
                          uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar133] + 2;
                          if (uVar142 != 0) {
                            uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar142];
                          }
                          lStack_120 = 8;
                        }
                        uVar107 = lStack_120 - uVar107;
                      }
                      else {
                        uVar148 = (uint)(iVar139 * 0x147b) >> 0x13;
                        uVar133 = (uint)((uVar107 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar152 = uVar133 >> 8;
                        uVar142 = uVar152 * 0x147b >> 0x13;
                        uVar107 = (ulong)uVar142;
                        uVar133 = uVar142 * -100 + (uVar133 >> 8);
                        *(undefined2 *)((long)puVar143 + (4 - uVar161)) =
                             *(undefined2 *)(digit_table + (ulong)uVar148 * 2);
                        *(undefined2 *)((long)puVar143 + (6 - uVar161)) =
                             *(undefined2 *)(digit_table + (uVar148 * 0x7fffff9c + iVar139) * 2);
                        *(undefined2 *)((long)puVar143 + (8 - uVar161)) =
                             *(undefined2 *)(digit_table + uVar107 * 2);
                        *(undefined2 *)((long)puVar143 + (10 - uVar161)) =
                             *(undefined2 *)(digit_table + uVar133 * 2);
                        lVar153 = 0xc;
                        iVar141 = uVar152 * -10000 + iVar141;
                        if (iVar141 != 0) {
                          uVar133 = (uint)(iVar141 * 0x147b) >> 0x13;
                          uVar107 = (ulong)uVar133;
                          uVar133 = uVar133 * -100 + iVar141;
                          *(undefined2 *)((long)puVar143 + (0xc - uVar161)) =
                               *(undefined2 *)(digit_table + uVar107 * 2);
                          *(undefined2 *)((long)puVar143 + (0xe - uVar161)) =
                               *(undefined2 *)(digit_table + uVar133 * 2);
                          lVar153 = 0x10;
                        }
                        uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar107] + 2;
                        if (uVar133 != 0) {
                          uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar133];
                        }
                        uVar107 = lVar153 - uVar107;
                      }
                      *(undefined2 *)puVar130 = 0x2e30;
                      for (uVar106 = 0;
                          puVar124 = (uint *)((long)puVar143 + ((uVar107 & 0xffffffff) - uVar161)),
                          -uVar120 != uVar106; uVar106 = uVar106 + 1) {
                        *(undefined1 *)((long)puVar130 + uVar106 + 2) = 0x30;
                      }
                    }
                    else {
                      auVar19._8_8_ = 0;
                      auVar19._0_8_ = uVar107;
                      uVar106 = SUB168(auVar19 / ZEXT816(100000000),0);
                      uVar142 = SUB164(auVar19 / ZEXT816(100000000),0);
                      puVar143 = (undefined2 *)((long)puVar130 + (2 - (ulong)(uVar142 < 100000000)))
                      ;
                      uVar161 = (uVar106 & 0xffffffff) / 10000;
                      iVar141 = (int)uVar161;
                      iVar147 = iVar141 * -10000 + uVar142;
                      uVar107 = uVar106 * 0xfa0a1f00 + uVar107;
                      iVar139 = (int)(uVar161 * 0x28f5d >> 0x18);
                      uVar152 = (uint)(iVar139 * 0x29) >> 0xc;
                      uVar148 = uVar152 * -100 + iVar139;
                      uVar133 = iVar139 * -100 + iVar141;
                      *puVar130 = 0x3030303030303030;
                      puVar130[1] = 0x3030303030303030;
                      puVar130[2] = 0x3030303030303030;
                      *(char *)((long)puVar130 + 1) = (char)uVar152 + '0';
                      uVar161 = (ulong)(uVar148 < 10 && uVar142 < 100000000);
                      *puVar143 = *(undefined2 *)(digit_table + uVar161 + uVar148 * 2);
                      *(undefined2 *)((long)puVar143 + (2 - uVar161)) =
                           *(undefined2 *)(digit_table + uVar133 * 2);
                      iVar141 = (int)uVar107;
                      if (iVar141 == 0) {
                        if (iVar147 == 0) {
                          uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar148];
                          if (uVar133 != 0) {
                            uVar107 = 0;
                          }
                          uVar107 = uVar107 + (byte)dec_trailing_zero_table[uVar133];
                          lStack_120 = 4;
                        }
                        else {
                          uVar133 = (uint)(iVar147 * 0x147b) >> 0x13;
                          uVar142 = uVar133 * -100 + iVar147;
                          *(undefined2 *)((long)puVar143 + (4 - uVar161)) =
                               *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                          *(undefined2 *)((long)puVar143 + (6 - uVar161)) =
                               *(undefined2 *)(digit_table + uVar142 * 2);
                          uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar133] + 2;
                          if (uVar142 != 0) {
                            uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar142];
                          }
                          lStack_120 = 8;
                        }
                        uVar107 = lStack_120 - uVar107;
                      }
                      else {
                        uVar148 = (uint)(iVar147 * 0x147b) >> 0x13;
                        uVar133 = (uint)((uVar107 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar152 = uVar133 >> 8;
                        uVar142 = uVar152 * 0x147b >> 0x13;
                        uVar107 = (ulong)uVar142;
                        uVar133 = uVar142 * -100 + (uVar133 >> 8);
                        *(undefined2 *)((long)puVar143 + (4 - uVar161)) =
                             *(undefined2 *)(digit_table + (ulong)uVar148 * 2);
                        *(undefined2 *)((long)puVar143 + (6 - uVar161)) =
                             *(undefined2 *)(digit_table + (uVar148 * 0x7fffff9c + iVar147) * 2);
                        *(undefined2 *)((long)puVar143 + (8 - uVar161)) =
                             *(undefined2 *)(digit_table + uVar107 * 2);
                        *(undefined2 *)((long)puVar143 + (10 - uVar161)) =
                             *(undefined2 *)(digit_table + uVar133 * 2);
                        lVar150 = 0xc;
                        iVar141 = uVar152 * -10000 + iVar141;
                        if (iVar141 != 0) {
                          uVar133 = (uint)(iVar141 * 0x147b) >> 0x13;
                          uVar107 = (ulong)uVar133;
                          uVar133 = uVar133 * -100 + iVar141;
                          *(undefined2 *)((long)puVar143 + (0xc - uVar161)) =
                               *(undefined2 *)(digit_table + uVar107 * 2);
                          *(undefined2 *)((long)puVar143 + (0xe - uVar161)) =
                               *(undefined2 *)(digit_table + uVar133 * 2);
                          lVar150 = 0x10;
                        }
                        uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar107] + 2;
                        if (uVar133 != 0) {
                          uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar133];
                        }
                        uVar107 = lVar150 - uVar107;
                      }
                      puVar155 = (uint *)((long)puVar143 + ((uVar107 & 0xffffffff) - uVar161));
                      for (uVar107 = 0; uVar120 != uVar107; uVar107 = uVar107 + 1) {
                        *(byte *)((long)puVar124 + uVar107 + lVar153) =
                             *(byte *)((long)puVar124 + uVar107 + lVar153 + 1);
                      }
                      puVar132 = (undefined1 *)((ulong)uVar120 + (long)puVar130);
                      puVar124 = (uint *)(puVar132 + 2);
                      *puVar132 = 0x2e;
                      if (puVar124 < puVar155) {
                        puVar124 = puVar155;
                      }
                    }
                    goto LAB_01f53ed1;
                  }
                  auVar20._8_8_ = 0;
                  auVar20._0_8_ = uVar107;
                  uVar106 = SUB168(auVar20 / ZEXT816(100000000),0);
                  uVar142 = SUB164(auVar20 / ZEXT816(100000000),0);
                  lVar153 = 2 - (ulong)(uVar142 < 100000000);
                  uVar161 = (uVar106 & 0xffffffff) / 10000;
                  iVar141 = (int)uVar161;
                  iVar147 = iVar141 * -10000 + uVar142;
                  uVar107 = uVar106 * 0xfa0a1f00 + uVar107;
                  iVar139 = (int)(uVar161 * 0x28f5d >> 0x18);
                  uVar152 = (uint)(iVar139 * 0x29) >> 0xc;
                  uVar148 = uVar152 * -100 + iVar139;
                  uVar133 = iVar139 * -100 + iVar141;
                  *(char *)((long)puVar130 + 1) = (char)uVar152 + '0';
                  uVar161 = (ulong)(uVar148 < 10 && uVar142 < 100000000);
                  *(undefined2 *)((long)puVar130 + lVar153) =
                       *(undefined2 *)(digit_table + uVar161 + uVar148 * 2);
                  lVar153 = lVar153 - uVar161;
                  *(undefined2 *)((long)puVar130 + lVar153 + 2) =
                       *(undefined2 *)(digit_table + uVar133 * 2);
                  iVar141 = (int)uVar107;
                  if (iVar141 == 0) {
                    if (iVar147 == 0) {
                      uVar142 = (uint)(byte)dec_trailing_zero_table[uVar148];
                      if (uVar133 != 0) {
                        uVar142 = 0;
                      }
                      uVar142 = uVar142 + (byte)dec_trailing_zero_table[uVar133];
                      iVar141 = 4;
                    }
                    else {
                      uVar133 = (uint)(iVar147 * 0x147b) >> 0x13;
                      uVar148 = uVar133 * -100 + iVar147;
                      *(undefined2 *)((long)puVar130 + lVar153 + 4) =
                           *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                      *(undefined2 *)((long)puVar130 + lVar153 + 6) =
                           *(undefined2 *)(digit_table + uVar148 * 2);
                      uVar142 = (byte)dec_trailing_zero_table[uVar133] + 2;
                      if (uVar148 != 0) {
                        uVar142 = (uint)(byte)dec_trailing_zero_table[uVar148];
                      }
                      iVar141 = 8;
                    }
                    uVar142 = iVar141 - uVar142;
                  }
                  else {
                    uVar148 = (uint)(iVar147 * 0x147b) >> 0x13;
                    uVar133 = (uint)((uVar107 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar152 = uVar133 >> 8;
                    uVar142 = uVar152 * 0x147b >> 0x13;
                    uVar133 = uVar142 * -100 + (uVar133 >> 8);
                    *(undefined2 *)((long)puVar130 + lVar153 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar148 * 2);
                    *(undefined2 *)((long)puVar130 + lVar153 + 6) =
                         *(undefined2 *)(digit_table + (uVar148 * 0x7fffff9c + iVar147) * 2);
                    *(undefined2 *)((long)puVar130 + lVar153 + 8) =
                         *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                    *(undefined2 *)((long)puVar130 + lVar153 + 10) =
                         *(undefined2 *)(digit_table + uVar133 * 2);
                    iVar141 = uVar152 * -10000 + iVar141;
                    if (iVar141 == 0) {
                      uVar142 = (byte)dec_trailing_zero_table[uVar142] + 2;
                      if (uVar133 != 0) {
                        uVar142 = (uint)(byte)dec_trailing_zero_table[uVar133];
                      }
                      uVar142 = 0xc - uVar142;
                    }
                    else {
                      uVar133 = (uint)(iVar141 * 0x147b) >> 0x13;
                      uVar148 = uVar133 * -100 + iVar141;
                      *(undefined2 *)((long)puVar130 + lVar153 + 0xc) =
                           *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                      *(undefined2 *)((long)puVar130 + lVar153 + 0xe) =
                           *(undefined2 *)(digit_table + uVar148 * 2);
                      uVar142 = (byte)dec_trailing_zero_table[uVar133] + 2;
                      if (uVar148 != 0) {
                        uVar142 = (uint)(byte)dec_trailing_zero_table[uVar148];
                      }
                      uVar142 = 0x10 - uVar142;
                    }
                  }
                  puVar143 = (undefined2 *)
                             ((long)puVar130 +
                             (((ulong)uVar142 + lVar153) - (ulong)((ulong)uVar142 + lVar153 == 2)));
                  uVar120 = uVar120 - 1;
                  *(undefined1 *)puVar130 = *(undefined1 *)((long)puVar130 + 1);
                  *(undefined1 *)((long)puVar130 + 1) = 0x2e;
                  *puVar143 = 0x2d65;
                  puVar124 = (uint *)((long)puVar143 + (ulong)(uVar120 >> 0x1f) + 1);
                  uVar133 = -uVar120;
                  if (0 < (int)uVar120) {
                    uVar133 = uVar120;
                  }
                  if (99 < uVar133) {
                    *(byte *)puVar124 = (char)(uVar133 * 0x290 >> 0x10) + 0x30;
                    *(undefined2 *)((long)puVar143 + (ulong)(uVar120 >> 0x1f) + 2) =
                         *(undefined2 *)
                          (digit_table + ((uVar133 * 0x290 >> 0x10) * 0x7fffff9c + uVar133) * 2);
                    goto LAB_01f53aa6;
                  }
                  *(ushort *)puVar124 =
                       *(ushort *)(digit_table + (ulong)(uVar133 < 10) + (ulong)uVar133 * 2);
                  puVar143 = (undefined2 *)((long)puVar124 - (ulong)(uVar133 < 10));
                }
                puVar124 = (uint *)(puVar143 + 1);
              }
LAB_01f53ed1:
              *(byte *)puVar124 = 0x2c;
              puVar124 = (uint *)((long)puVar124 + 1);
            }
            else if (((uint)uVar107 & 7) == 5) {
              uVar161 = uVar107 >> 8;
              pbVar158 = (byte *)(pyVar137->uni).str;
              if (puVar155 <= (uint *)((long)puVar124 + uVar161 * 6 + 0x10)) {
                uVar108 = uVar161 * 6 + 0x10;
                uVar106 = local_f0 >> 1;
                if (local_f0 >> 1 <= uVar108) {
                  uVar106 = uVar108;
                }
                sVar135 = (uVar106 + 0xf & 0xfffffffffffffff0) + local_f0;
                pbVar112 = (byte *)(*p_Var7)(pvVar6,local_110,local_f0,sVar135);
                if (pbVar112 == (byte *)0x0) goto LAB_01f54af9;
                puVar113 = (uint *)(pbVar112 + (sVar135 - ((long)local_d0 - (long)puVar155)));
                memmove(puVar113,pbVar112 + ((long)puVar155 - (long)local_110),
                        (long)local_d0 - (long)puVar155);
                puVar124 = (uint *)(pbVar112 + ((long)puVar124 - (long)local_110));
                local_d0 = (uint *)(pbVar112 + sVar135);
                local_110 = (uint *)pbVar112;
                local_f0 = sVar135;
              }
              if ((puVar160 != enc_table_cpy) || ((pyVar137->tag & 0x18) == 0)) {
                puVar155 = (uint *)(pbVar158 + uVar161);
                *(byte *)puVar124 = 0x22;
LAB_01f52666:
                lVar150 = (long)puVar155 - (long)pbVar158;
                lVar153 = 0;
                while( true ) {
                  puVar127 = (uint *)(pbVar158 + lVar153);
                  puVar129 = (uint *)((long)puVar124 + lVar153 + 1);
                  if (lVar150 < 0x10) break;
                  bVar156 = (byte)*puVar127;
                  if (puVar160[bVar156] != '\0') {
                    puVar127 = (uint *)(pbVar158 + lVar153);
                    puVar129 = (uint *)((long)puVar124 + lVar153 + 1);
                    goto LAB_01f52a0d;
                  }
                  if (puVar160[pbVar158[lVar153 + 1]] != '\0') {
                    puVar127 = (uint *)(pbVar158 + lVar153);
                    puVar129 = (uint *)((long)puVar124 + lVar153 + 1);
                    goto LAB_01f529fc;
                  }
                  if (puVar160[pbVar158[lVar153 + 2]] != '\0') {
                    puVar127 = (uint *)(pbVar158 + lVar153);
                    puVar129 = (uint *)((long)puVar124 + lVar153 + 1);
                    goto LAB_01f52840;
                  }
                  if (puVar160[pbVar158[lVar153 + 3]] != '\0') {
                    puVar127 = (uint *)(pbVar158 + lVar153);
                    puVar129 = (uint *)((long)puVar124 + lVar153 + 1);
                    goto LAB_01f52860;
                  }
                  if (puVar160[pbVar158[lVar153 + 4]] != '\0') {
                    puVar127 = (uint *)(pbVar158 + lVar153 + 4);
                    puVar129 = (uint *)((long)puVar124 + lVar153 + 5);
                    *(undefined4 *)((long)puVar124 + lVar153 + 1) =
                         *(undefined4 *)(pbVar158 + lVar153);
                    goto LAB_01f52a0d;
                  }
                  if (puVar160[pbVar158[lVar153 + 5]] != '\0') {
                    pbVar158 = pbVar158 + lVar153;
                    puVar127 = (uint *)(pbVar158 + 5);
                    puVar129 = (uint *)((long)puVar124 + lVar153 + 6);
                    *(byte *)((long)puVar129 + -1) = pbVar158[4];
                    *(undefined4 *)((long)puVar129 + -5) = *(undefined4 *)pbVar158;
                    goto LAB_01f52a0d;
                  }
                  if (puVar160[pbVar158[lVar153 + 6]] != '\0') {
                    pbVar158 = pbVar158 + lVar153;
                    puVar127 = (uint *)(pbVar158 + 6);
                    puVar129 = (uint *)((long)puVar124 + lVar153 + 7);
                    *(ushort *)((long)puVar129 + -2) = *(ushort *)(pbVar158 + 4);
                    *(undefined4 *)((long)puVar129 + -6) = *(undefined4 *)pbVar158;
                    goto LAB_01f52a0d;
                  }
                  if (puVar160[pbVar158[lVar153 + 7]] != '\0') {
                    pbVar158 = pbVar158 + lVar153;
                    puVar127 = (uint *)(pbVar158 + 7);
                    uVar3 = *(undefined4 *)pbVar158;
                    puVar129 = (uint *)((long)puVar124 + lVar153 + 8);
                    *(undefined4 *)((long)puVar124 + lVar153 + 4) = *(undefined4 *)(pbVar158 + 3);
                    *(undefined4 *)((long)puVar124 + lVar153 + 1) = uVar3;
                    goto LAB_01f52a0d;
                  }
                  if (puVar160[pbVar158[lVar153 + 8]] != '\0') {
                    puVar127 = (uint *)(pbVar158 + lVar153 + 8);
                    puVar129 = (uint *)((long)puVar124 + lVar153 + 9);
                    *(undefined8 *)((long)puVar124 + lVar153 + 1) =
                         *(undefined8 *)(pbVar158 + lVar153);
                    goto LAB_01f52a0d;
                  }
                  if (puVar160[pbVar158[lVar153 + 9]] != '\0') {
                    pbVar158 = pbVar158 + lVar153;
                    puVar127 = (uint *)(pbVar158 + 9);
                    puVar129 = (uint *)((long)puVar124 + lVar153 + 10);
                    *(byte *)((long)puVar129 + -1) = pbVar158[8];
                    *(undefined8 *)((long)puVar129 + -9) = *(undefined8 *)pbVar158;
                    goto LAB_01f52a0d;
                  }
                  if (puVar160[pbVar158[lVar153 + 10]] != '\0') {
                    pbVar158 = pbVar158 + lVar153;
                    puVar127 = (uint *)(pbVar158 + 10);
                    puVar129 = (uint *)((long)puVar124 + lVar153 + 0xb);
                    *(ushort *)((long)puVar129 + -2) = *(ushort *)(pbVar158 + 8);
                    *(undefined8 *)((long)puVar129 + -10) = *(undefined8 *)pbVar158;
                    goto LAB_01f52a0d;
                  }
                  if (puVar160[pbVar158[lVar153 + 0xb]] != '\0') {
                    pbVar158 = pbVar158 + lVar153;
                    puVar127 = (uint *)(pbVar158 + 0xb);
                    puVar129 = (uint *)((long)puVar124 + lVar153 + 0xc);
                    puVar129[-1] = *(uint *)(pbVar158 + 7);
                    *(undefined8 *)((long)puVar129 + -0xb) = *(undefined8 *)pbVar158;
                    goto LAB_01f52a0d;
                  }
                  if (puVar160[pbVar158[lVar153 + 0xc]] != '\0') {
                    pbVar158 = pbVar158 + lVar153;
                    puVar127 = (uint *)(pbVar158 + 0xc);
                    puVar129 = (uint *)((long)puVar124 + lVar153 + 0xd);
                    puVar129[-1] = *(uint *)(pbVar158 + 8);
                    *(undefined8 *)(puVar129 + -3) = *(undefined8 *)pbVar158;
                    goto LAB_01f52a0d;
                  }
                  if (puVar160[pbVar158[lVar153 + 0xd]] != '\0') {
                    pbVar158 = pbVar158 + lVar153;
                    puVar127 = (uint *)(pbVar158 + 0xd);
                    uVar114 = *(undefined8 *)pbVar158;
                    puVar129 = (uint *)((long)puVar124 + lVar153 + 0xe);
                    *(undefined8 *)((long)puVar124 + lVar153 + 6) = *(undefined8 *)(pbVar158 + 5);
                    *(undefined8 *)((long)puVar124 + lVar153 + 1) = uVar114;
                    goto LAB_01f52a0d;
                  }
                  if (puVar160[pbVar158[lVar153 + 0xe]] != '\0') {
                    pbVar158 = pbVar158 + lVar153;
                    puVar127 = (uint *)(pbVar158 + 0xe);
                    uVar114 = *(undefined8 *)pbVar158;
                    puVar129 = (uint *)((long)puVar124 + lVar153 + 0xf);
                    *(undefined8 *)((long)puVar124 + lVar153 + 7) = *(undefined8 *)(pbVar158 + 6);
                    *(undefined8 *)((long)puVar124 + lVar153 + 1) = uVar114;
                    goto LAB_01f52a0d;
                  }
                  if (puVar160[pbVar158[lVar153 + 0xf]] != '\0') {
                    pbVar158 = pbVar158 + lVar153;
                    puVar127 = (uint *)(pbVar158 + 0xf);
                    uVar114 = *(undefined8 *)pbVar158;
                    puVar129 = (uint *)((long)puVar124 + lVar153 + 0x10);
                    *(undefined8 *)((long)puVar124 + lVar153 + 8) = *(undefined8 *)(pbVar158 + 7);
                    *(undefined8 *)((long)puVar124 + lVar153 + 1) = uVar114;
                    goto LAB_01f52a0d;
                  }
                  uVar114 = *(undefined8 *)(puVar127 + 2);
                  *(undefined8 *)puVar129 = *(undefined8 *)puVar127;
                  *(undefined8 *)((long)puVar124 + lVar153 + 9) = uVar114;
                  lVar153 = lVar153 + 0x10;
                  lVar150 = lVar150 + -0x10;
                }
LAB_01f527b4:
                if (3 < lVar150) {
                  if (puVar160[(byte)*puVar127] == '\0') {
                    if (puVar160[*(byte *)((long)puVar127 + 1)] == '\0') {
                      if (puVar160[*(byte *)((long)puVar127 + 2)] == '\0') {
                        if (puVar160[*(byte *)((long)puVar127 + 3)] == '\0') goto LAB_01f527a4;
LAB_01f52860:
                        *(byte *)((long)puVar129 + 2) = *(byte *)((long)puVar127 + 2);
                        *(ushort *)puVar129 = (ushort)*puVar127;
                        puVar129 = (uint *)((long)puVar129 + 3);
                        puVar127 = (uint *)((long)puVar127 + 3);
                      }
                      else {
LAB_01f52840:
                        *(ushort *)puVar129 = (ushort)*puVar127;
                        puVar129 = (uint *)((long)puVar129 + 2);
                        puVar127 = (uint *)((long)puVar127 + 2);
                      }
                    }
                    else {
                      bVar156 = (byte)*puVar127;
LAB_01f529fc:
                      *(byte *)puVar129 = bVar156;
                      puVar129 = (uint *)((long)puVar129 + 1);
                      puVar127 = (uint *)((long)puVar127 + 1);
                    }
                  }
                  goto LAB_01f52a0d;
                }
                goto LAB_01f527f7;
              }
              *(byte *)puVar124 = 0x22;
              pbVar112 = (byte *)((long)puVar124 + 1);
              for (uVar106 = uVar161; 0xf < uVar106; uVar106 = uVar106 - 0x10) {
                uVar114 = *(undefined8 *)(pbVar158 + 8);
                *(undefined8 *)pbVar112 = *(undefined8 *)pbVar158;
                *(undefined8 *)(pbVar112 + 8) = uVar114;
                pbVar112 = pbVar112 + 0x10;
                pbVar158 = pbVar158 + 0x10;
              }
              for (uVar161 = uVar161 - (uVar107 >> 8 & 0xfffffffffffff0); 3 < uVar161;
                  uVar161 = uVar161 - 4) {
                *(undefined4 *)pbVar112 = *(undefined4 *)pbVar158;
                pbVar112 = pbVar112 + 4;
                pbVar158 = pbVar158 + 4;
              }
              for (uVar107 = 0; uVar161 != uVar107; uVar107 = uVar107 + 1) {
                pbVar112[uVar107] = pbVar158[uVar107];
              }
              puVar129 = (uint *)(pbVar112 + uVar107);
switchD_01f52a3a_default:
              local_e0 = (uint)(local_c0 & 0xff);
              bVar156 = 0x3a;
              if ((~(uint)lVar151 & local_e0) == 0) {
                bVar156 = 0x2c;
              }
              *(byte *)puVar129 = 0x22;
              *(byte *)((long)puVar129 + 1) = bVar156;
              puVar124 = (uint *)((long)puVar129 + 2);
            }
            else if ((~(byte)uVar107 & 6) == 0) {
              if (puVar155 <= puVar124 + 4) {
                uVar161 = local_f0 >> 1;
                if (local_f0 >> 1 < 0x11) {
                  uVar161 = 0x10;
                }
                sVar135 = (uVar161 + 0xf & 0xfffffffffffffff0) + local_f0;
                pbVar158 = (byte *)(*p_Var7)(pvVar6,local_110,local_f0,sVar135);
                if (pbVar158 == (byte *)0x0) goto LAB_01f54af9;
                sVar125 = (long)local_d0 - (long)puVar155;
                memmove(pbVar158 + (sVar135 - sVar125),pbVar158 + ((long)puVar155 - (long)local_110)
                        ,sVar125);
                puVar124 = (uint *)(pbVar158 + ((long)puVar124 - (long)local_110));
                local_d0 = (uint *)(pbVar158 + sVar135);
                puVar113 = (uint *)(pbVar158 + (sVar135 - sVar125));
                local_f0 = sVar135;
                local_110 = (uint *)pbVar158;
              }
              if (0xff < uVar107) {
                lVar153 = (uVar107 >> 8) << (bVar156 == 7);
                puVar155 = puVar113 + -4;
                puVar127 = (uint *)((long)puVar124 + 1);
                *(ulong *)(puVar113 + -4) = (local_c0 & 0xff) + lVar151 * 2;
                *(yyjson_mut_val **)(puVar113 + -2) = val;
                *(byte *)puVar124 = (bVar156 == 7) << 5 | 0x5b;
                local_c0 = 0;
                pyVar136 = (yyjson_mut_val *)(pyVar137->uni).u64;
                val = pyVar137;
                lVar151 = lVar153;
                if (bVar156 == 7) {
                  pyVar136 = pyVar136->next;
                  local_c0 = 1;
                }
                goto LAB_01f521fc;
              }
              bVar156 = (bVar156 == 7) * ' ';
              *(byte *)puVar124 = bVar156 + 0x5b;
              *(byte *)((long)puVar124 + 1) = bVar156 | 0x5d;
              *(byte *)((long)puVar124 + 2) = 0x2c;
              puVar124 = (uint *)((long)puVar124 + 3);
            }
            else if (bVar156 == 1) {
              uVar107 = uVar107 >> 8;
              pvVar8 = (pyVar137->uni).ptr;
              if (puVar155 <= (uint *)((long)puVar124 + uVar107 + 2)) {
                uVar161 = local_f0 >> 1;
                if (local_f0 >> 1 <= uVar107 + 2) {
                  uVar161 = uVar107 + 2;
                }
                sVar135 = (uVar161 + 0xf & 0xfffffffffffffff0) + local_f0;
                pbVar158 = (byte *)(*p_Var7)(pvVar6,local_110,local_f0,sVar135);
                if (pbVar158 == (byte *)0x0) goto LAB_01f54af9;
                sVar125 = (long)local_d0 - (long)puVar155;
                memmove(pbVar158 + (sVar135 - sVar125),pbVar158 + ((long)puVar155 - (long)local_110)
                        ,sVar125);
                puVar124 = (uint *)(pbVar158 + ((long)puVar124 - (long)local_110));
                local_d0 = (uint *)(pbVar158 + sVar135);
                puVar113 = (uint *)(pbVar158 + (sVar135 - sVar125));
                local_110 = (uint *)pbVar158;
                local_f0 = sVar135;
              }
              switchD_01939fa4::default(puVar124,pvVar8,uVar107);
              pbVar158 = (byte *)((long)puVar124 + uVar107);
              puVar124 = (uint *)(pbVar158 + 1);
              *pbVar158 = 0x2c;
            }
            else {
              uVar120 = (uint)uVar107 & 7;
              if (uVar120 == 2) {
                if (puVar155 <= puVar124 + 4) {
                  uVar107 = local_f0 >> 1;
                  if (local_f0 >> 1 < 0x11) {
                    uVar107 = 0x10;
                  }
                  sVar135 = (uVar107 + 0xf & 0xfffffffffffffff0) + local_f0;
                  pbVar158 = (byte *)(*p_Var7)(pvVar6,local_110,local_f0,sVar135);
                  if (pbVar158 == (byte *)0x0) goto LAB_01f54af9;
                  puVar113 = (uint *)(pbVar158 + (sVar135 - ((long)local_d0 - (long)puVar155)));
                  memmove(puVar113,pbVar158 + ((long)puVar155 - (long)local_110),
                          (long)local_d0 - (long)puVar155);
                  puVar124 = (uint *)(pbVar158 + ((long)puVar124 - (long)local_110));
                  local_d0 = (uint *)(pbVar158 + sVar135);
                  local_110 = (uint *)pbVar158;
                  local_f0 = sVar135;
                }
                puVar124[0] = 0x6c6c756e;
                puVar124[1] = 0xa2c;
                puVar124 = (uint *)((long)puVar124 + 5);
              }
              else {
                if (uVar120 != 3) goto LAB_01f54b51;
                if (puVar155 <= puVar124 + 4) {
                  uVar107 = local_f0 >> 1;
                  if (local_f0 >> 1 < 0x11) {
                    uVar107 = 0x10;
                  }
                  sVar135 = (uVar107 + 0xf & 0xfffffffffffffff0) + local_f0;
                  pbVar158 = (byte *)(*p_Var7)(pvVar6,local_110,local_f0,sVar135);
                  if (pbVar158 == (byte *)0x0) goto LAB_01f54af9;
                  puVar113 = (uint *)(pbVar158 + (sVar135 - ((long)local_d0 - (long)puVar155)));
                  memmove(puVar113,pbVar158 + ((long)puVar155 - (long)local_110),
                          (long)local_d0 - (long)puVar155);
                  puVar124 = (uint *)(pbVar158 + ((long)puVar124 - (long)local_110));
                  local_d0 = (uint *)(pbVar158 + sVar135);
                  uVar107 = pyVar137->tag;
                  local_110 = (uint *)pbVar158;
                  local_f0 = sVar135;
                }
                bVar163 = (uVar107 & 0x18) != 0;
                uVar114 = 0xa2c65736c6166;
                if (bVar163) {
                  uVar114 = 0xa2c65757274;
                }
                *(undefined8 *)puVar124 = uVar114;
                puVar124 = (uint *)((long)puVar124 + (6 - (ulong)bVar163));
              }
            }
            lVar151 = lVar151 + -1;
            puVar155 = puVar113;
          } while (lVar151 != 0);
          pbVar158 = (byte *)((long)local_110 + ~(ulong)puVar124);
          lVar153 = 0;
          do {
            pyVar136 = val;
            *(byte *)((long)puVar124 + -1) = (char)local_c0 * ' ' + 0x5d;
            puVar127 = (uint *)((long)puVar124 + 1);
            *(byte *)puVar124 = 0x2c;
            if (local_d0 <= (uint *)((long)puVar113 + lVar153)) {
              if (local_fc < '\0') {
                if ((uint *)((long)puVar113 + lVar153) <= (uint *)((long)puVar124 + 3)) {
                  uVar107 = 2;
                  if (2 < local_f0 >> 1) {
                    uVar107 = local_f0 >> 1;
                  }
                  uVar107 = uVar107 + 0xf & 0xfffffffffffffff0;
                  pbVar112 = (byte *)(*p_Var7)(pvVar6,local_110,local_f0,uVar107 + local_f0);
                  if (pbVar112 == (byte *)0x0) goto LAB_01f54af9;
                  memmove(pbVar112 +
                          (long)((long)puVar113 + lVar153 + ((uVar107 + local_f0) - (long)local_d0))
                          ,(byte *)((long)puVar113 + (lVar153 - (long)local_110)) + (long)pbVar112,
                          (size_t)((long)local_d0 + (-lVar153 - (long)puVar113)));
                  puVar127 = (uint *)(pbVar112 + -(long)pbVar158);
                  local_110 = (uint *)pbVar112;
                }
                *(byte *)((long)puVar127 + -1) = 10;
                puVar124 = puVar127;
              }
              *(byte *)puVar124 = 0;
              if (dat_len != (usize *)0x0) {
                *dat_len = (long)puVar124 - (long)local_110;
              }
              goto LAB_01f56cca;
            }
            puVar128 = (ulong *)((long)puVar113 + lVar153);
            val = *(yyjson_mut_val **)((long)puVar113 + lVar153 + 8);
            local_c0 = *puVar128 & 0xffffffffffffff01;
            lVar153 = lVar153 + 0x10;
            pbVar158 = pbVar158 + -1;
            lVar151 = (*puVar128 >> 1) - 1;
            puVar124 = puVar127;
          } while (lVar151 == 0);
          puVar155 = (uint *)((long)puVar113 + lVar153);
        } while( true );
      }
    }
    else {
      puVar160 = enc_table_cpy;
      if ((flg & 2) == 0) {
        puVar132 = enc_table_cpy_slash;
      }
      else {
        puVar160 = enc_table_esc;
        puVar132 = enc_table_esc_slash;
      }
      if ((flg & 4) == 0) {
        puVar132 = puVar160;
      }
      sVar135 = estimated_val_num * 0x20 + 0x40;
      local_110 = (uint *)(*p_Var4)(pvVar6,sVar135);
      if (local_110 != (uint *)0x0) {
        uVar107 = (ulong)((flg & 0x40) == 0);
        uVar120 = (uint)val->tag & 7;
        bVar163 = uVar120 == 7;
        local_40 = (ulong)bVar163;
        lVar153 = (val->tag >> 8) << bVar163;
        lVar151 = uVar107 * 2 + 2;
        *(byte *)local_110 = bVar163 << 5 | 0x5b;
        *(byte *)((long)local_110 + 1) = 10;
        uVar105 = (val->uni).u64;
        if (uVar120 == 7) {
          uVar105 = *(uint64_t *)(uVar105 + 0x10);
        }
        lVar150 = 1;
        local_f8 = (ulong *)((long)local_110 + (estimated_val_num * 8 + 0x10) * 4);
        puVar155 = (uint *)((long)local_110 + 2);
        pyVar136 = *(yyjson_mut_val **)(uVar105 + 0x10);
        local_b0 = local_f8;
        local_80 = val;
LAB_01f4f090:
        uVar108 = local_40 & 0xff;
        uVar161 = lVar150 * 4 + 0x20;
        uVar106 = lVar150 * 4 + 0x10;
        pyVar137 = pyVar136;
LAB_01f4f0c6:
        uVar123 = pyVar137->tag;
        bVar156 = (byte)uVar123 & 7;
        uVar120 = (uint)uVar108;
        uVar133 = (uint)lVar153;
        if (bVar156 == 4) {
          uVar123 = 0x20;
          if ((uVar133 & uVar120) == 0) {
            uVar123 = uVar161;
          }
          if (local_f8 <= (ulong *)(uVar123 + (long)puVar155)) {
            uVar103 = sVar135 >> 1;
            if (sVar135 >> 1 <= uVar123) {
              uVar103 = uVar123;
            }
            sVar159 = (uVar103 + 0xf & 0xfffffffffffffff0) + sVar135;
            pbVar158 = (byte *)(*p_Var7)(pvVar6,local_110,sVar135,sVar159);
            if (pbVar158 == (byte *)0x0) goto LAB_01f54af9;
            sVar125 = (long)local_b0 - (long)local_f8;
            memmove(pbVar158 + (sVar159 - sVar125),pbVar158 + ((long)local_f8 - (long)local_110),
                    sVar125);
            puVar155 = (uint *)(pbVar158 + ((long)puVar155 - (long)local_110));
            local_b0 = (ulong *)(pbVar158 + sVar159);
            sVar135 = sVar159;
            local_110 = (uint *)pbVar158;
            local_f8 = (ulong *)(pbVar158 + (sVar159 - sVar125));
          }
          lVar138 = 0;
          if ((uVar133 & uVar120) == 0) {
            lVar138 = lVar150;
          }
          iVar139 = (int)puVar155;
          iVar141 = -2 - iVar139;
          puVar154 = (ushort *)((long)puVar155 + 2);
          lVar140 = 0;
          puVar127 = puVar155;
          while (bVar163 = lVar138 != 0, lVar138 = lVar138 + -1, bVar163) {
            pbVar158 = (byte *)((long)puVar155 + lVar140);
            pbVar158[0] = 0x20;
            pbVar158[1] = 0x20;
            pbVar158[2] = 0x20;
            pbVar158[3] = 0x20;
            lVar140 = lVar140 + lVar151;
            iVar141 = iVar141 - (int)lVar151;
            puVar127 = (uint *)((long)puVar127 + lVar151);
            puVar154 = puVar154 + uVar107 + 1;
          }
          pcVar109 = (char *)(pyVar137->uni).u64;
          uVar120 = (uint)((ulong)pcVar109 >> 0x20);
          if ((pyVar137->tag & 0x10) == 0) {
            uVar120 = uVar120 >> 0x1f & (uint)(pyVar137->tag >> 3);
            uVar123 = (ulong)uVar120;
            *(byte *)((long)puVar155 + lVar140) = 0x2d;
            pcVar117 = (char *)-(long)pcVar109;
            if (uVar120 == 0) {
              pcVar117 = pcVar109;
            }
            if (pcVar117 < (char *)0x5f5e100) {
              if (pcVar117 < (char *)0x64) {
                *(undefined2 *)((long)puVar155 + lVar140 + uVar123) =
                     *(undefined2 *)
                      (digit_table + (ulong)(pcVar117 < (char *)0xa) + (long)pcVar117 * 2);
                pbVar158 = (byte *)((long)puVar155 +
                                   lVar140 + (uVar123 - (pcVar117 < (char *)0xa)) + 2);
              }
              else {
                iVar141 = (int)pcVar117;
                if (pcVar117 < (char *)0x2710) {
                  uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                  *(undefined2 *)((long)puVar155 + lVar140 + uVar123) =
                       *(undefined2 *)
                        (digit_table + (ulong)(pcVar117 < (char *)0x3e8) + (ulong)uVar120 * 2);
                  lVar140 = lVar140 + (uVar123 - (pcVar117 < (char *)0x3e8));
                  pbVar158 = (byte *)((long)puVar155 + lVar140 + 4);
                  *(undefined2 *)((long)puVar155 + lVar140 + 2) =
                       *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                }
                else {
                  if (pcVar117 < (char *)0xf4240) {
                    iVar141 = (int)((ulong)((long)pcVar117 * 0x68db9) >> 0x20) * -10000 + iVar141;
                    uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                    *(undefined2 *)((long)puVar155 + lVar140 + uVar123) =
                         *(undefined2 *)
                          (digit_table +
                          (ulong)(pcVar117 < (char *)0x186a0) +
                          ((ulong)((long)pcVar117 * 0x68db9) >> 0x20) * 2);
                    lVar140 = lVar140 + (uVar123 - (pcVar117 < (char *)0x186a0));
                    lVar138 = lVar140 + 6;
                    *(undefined2 *)((long)puVar155 + lVar140 + 2) =
                         *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                    uVar111 = *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                  }
                  else {
                    uVar120 = (uint)((ulong)((long)pcVar117 * 0x68db8bb) >> 0x20);
                    uVar133 = uVar120 >> 8;
                    iVar141 = uVar133 * -10000 + iVar141;
                    uVar133 = uVar133 * 0x147b >> 0x13;
                    uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
                    *(undefined2 *)((long)puVar155 + lVar140 + uVar123) =
                         *(undefined2 *)
                          (digit_table +
                          (ulong)(pcVar117 < "E_17_Hashtable_traitsILb1ELb0ELb1EEEE9_M_rehashEmRKm")
                          + (ulong)uVar133 * 2);
                    lVar140 = lVar140 + (uVar123 -
                                        (pcVar117 <
                                        "E_17_Hashtable_traitsILb1ELb0ELb1EEEE9_M_rehashEmRKm"));
                    lVar138 = lVar140 + 8;
                    *(undefined2 *)((long)puVar155 + lVar140 + 2) =
                         *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                    *(undefined2 *)((long)puVar155 + lVar140 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                    uVar111 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar141) * 2);
                  }
                  *(undefined2 *)((byte *)((long)puVar155 + lVar138) + -2) = uVar111;
                  pbVar158 = (byte *)((long)puVar155 + lVar138);
                }
              }
            }
            else {
              auVar9._8_8_ = 0;
              auVar9._0_8_ = pcVar117;
              lVar138 = SUB168(auVar9 / ZEXT816(100000000),0);
              pcVar109 = pcVar117 + lVar138 * 0xfa0a1f00;
              iVar141 = SUB164(auVar9 / ZEXT816(100000000),0);
              if (pcVar117 < (char *)0x2386f26fc10000) {
                if (pcVar117 < (char *)0x2540be400) {
                  *(undefined2 *)((long)puVar155 + lVar140 + uVar123) =
                       *(undefined2 *)
                        (digit_table + (ulong)(pcVar117 < (char *)0x3b9aca00) + lVar138 * 2);
                  pbVar158 = (byte *)((long)puVar155 +
                                     lVar140 + (uVar123 - (pcVar117 < (char *)0x3b9aca00)) + 2);
                }
                else if (pcVar117 < (char *)0xe8d4a51000) {
                  uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                  uVar103 = (ulong)((ulong)pcVar117 >> 0xb < 0x2e90edd);
                  *(undefined2 *)((long)puVar155 + lVar140 + uVar123) =
                       *(undefined2 *)(digit_table + uVar103 + (ulong)uVar120 * 2);
                  lVar140 = lVar140 + (uVar123 - uVar103);
                  pbVar158 = (byte *)((long)puVar155 + lVar140 + 4);
                  *(undefined2 *)((long)puVar155 + lVar140 + 2) =
                       *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                }
                else {
                  if (pcVar117 < (char *)0x5af3107a4000) {
                    iVar141 = (int)((ulong)(lVar138 * 0x68db9) >> 0x20) * -10000 + iVar141;
                    uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                    uVar103 = (ulong)((ulong)pcVar117 >> 0xd < 0x48c27395);
                    *(undefined2 *)((long)puVar155 + lVar140 + uVar123) =
                         *(undefined2 *)
                          (digit_table + uVar103 + ((ulong)(lVar138 * 0x68db9) >> 0x20) * 2);
                    lVar140 = lVar140 + (uVar123 - uVar103);
                    lVar138 = lVar140 + 6;
                    *(undefined2 *)((long)puVar155 + lVar140 + 2) =
                         *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                    uVar111 = *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                  }
                  else {
                    uVar120 = (uint)((ulong)(lVar138 * 0x68db8bb) >> 0x20);
                    uVar133 = uVar120 >> 8;
                    iVar141 = uVar133 * -10000 + iVar141;
                    uVar133 = uVar133 * 0x147b >> 0x13;
                    uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
                    *(undefined2 *)((long)puVar155 + lVar140 + uVar123) =
                         *(undefined2 *)
                          (digit_table +
                          (ulong)(pcVar117 < (char *)0x38d7ea4c68000) + (ulong)uVar133 * 2);
                    lVar140 = lVar140 + (uVar123 - (pcVar117 < (char *)0x38d7ea4c68000));
                    lVar138 = lVar140 + 8;
                    *(undefined2 *)((long)puVar155 + lVar140 + 2) =
                         *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                    *(undefined2 *)((long)puVar155 + lVar140 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                    uVar111 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar141) * 2);
                  }
                  pbVar158 = (byte *)((long)puVar155 + lVar138);
                  *(undefined2 *)(pbVar158 + -2) = uVar111;
                }
                uVar120 = (uint)(((ulong)pcVar109 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar133 = uVar120 >> 8;
                iVar141 = uVar133 * -10000 + (int)pcVar109;
                uVar133 = uVar133 * 0x147b >> 0x13;
                uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
                *(undefined2 *)pbVar158 = *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                *(undefined2 *)(pbVar158 + 2) =
                     *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                *(undefined2 *)(pbVar158 + 4) = *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                *(undefined2 *)(pbVar158 + 6) =
                     *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar141) * 2);
                pbVar158 = pbVar158 + 8;
              }
              else {
                auVar10._8_8_ = 0;
                auVar10._0_8_ = pcVar117;
                lVar138 = SUB168(auVar10 / ZEXT816(1000000000000),0);
                iVar139 = SUB164(auVar10 / ZEXT816(1000000000000),0);
                if (pcVar117 < (char *)0xde0b6b3a7640000) {
                  uVar103 = lVar138 * 0x68db9;
                  iVar147 = (int)(uVar103 >> 0x20) * -10000 + iVar139;
                  uVar120 = (uint)(iVar147 * 0x147b) >> 0x13;
                  *(undefined2 *)((long)puVar155 + lVar140 + uVar123) =
                       *(undefined2 *)
                        (digit_table +
                        (ulong)(pcVar117 < (char *)0x16345785d8a0000) + (uVar103 >> 0x20) * 2);
                  lVar140 = lVar140 + (uVar123 - (pcVar117 < (char *)0x16345785d8a0000));
                  lVar138 = lVar140 + 6;
                  *(undefined2 *)((long)puVar155 + lVar140 + 2) =
                       *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                  uVar111 = *(undefined2 *)(digit_table + (uVar120 * -100 + iVar147) * 2);
                }
                else {
                  uVar120 = (uint)((ulong)(lVar138 * 0x68db8bb) >> 0x20);
                  uVar133 = uVar120 >> 8;
                  iVar147 = uVar133 * -10000 + iVar139;
                  uVar133 = uVar133 * 0x147b >> 0x13;
                  uVar142 = (uint)(iVar147 * 0x147b) >> 0x13;
                  *(undefined2 *)((long)puVar155 + lVar140 + uVar123) =
                       *(undefined2 *)
                        (digit_table +
                        (ulong)(pcVar117 < (char *)0x8ac7230489e80000) + (ulong)uVar133 * 2);
                  lVar140 = lVar140 + (uVar123 - (pcVar117 < (char *)0x8ac7230489e80000));
                  lVar138 = lVar140 + 8;
                  *(undefined2 *)((long)puVar155 + lVar140 + 2) =
                       *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                  *(undefined2 *)((long)puVar155 + lVar140 + 4) =
                       *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                  uVar111 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar147) * 2);
                }
                pbVar158 = (byte *)((long)puVar155 + lVar138);
                *(undefined2 *)(pbVar158 + -2) = uVar111;
                iVar141 = iVar141 + iVar139 * -10000;
                uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                *(undefined2 *)pbVar158 = *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                *(undefined2 *)(pbVar158 + 2) =
                     *(undefined2 *)(digit_table + (uVar120 * 0x7fffff9c + iVar141) * 2);
                uVar120 = (uint)(((ulong)pcVar109 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar133 = uVar120 >> 8;
                iVar141 = uVar133 * -10000 + (int)pcVar109;
                uVar133 = uVar133 * 0x147b >> 0x13;
                uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
                *(undefined2 *)(pbVar158 + 4) = *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                *(undefined2 *)(pbVar158 + 6) =
                     *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                *(undefined2 *)(pbVar158 + 8) = *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                *(undefined2 *)(pbVar158 + 10) =
                     *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar141) * 2);
                pbVar158 = pbVar158 + 0xc;
              }
            }
          }
          else {
            uVar123 = (ulong)pcVar109 & 0xfffffffffffff;
            uVar120 = uVar120 >> 0x14 & 0x7ff;
            if (uVar120 == 0x7ff) {
              if ((flg & 0x10) == 0) {
                if ((flg & 8) == 0) goto LAB_01f54b90;
                if (uVar123 == 0) {
                  *(byte *)((long)puVar155 + lVar140) = 0x2d;
                  pbVar112 = (byte *)((long)puVar155 + (lVar140 - ((long)pcVar109 >> 0x3f)));
                  pbVar158 = pbVar112 + 8;
                  pbVar112[0] = 0x49;
                  pbVar112[1] = 0x6e;
                  pbVar112[2] = 0x66;
                  pbVar112[3] = 0x69;
                  pbVar112[4] = 0x6e;
                  pbVar112[5] = 0x69;
                  pbVar112[6] = 0x74;
                  pbVar112[7] = 0x79;
                }
                else {
                  pbVar112 = (byte *)((long)puVar155 + lVar140);
                  pbVar158 = pbVar112 + 3;
                  pbVar112[0] = 0x4e;
                  pbVar112[1] = 0x61;
                  pbVar112[2] = 0x4e;
                  pbVar112[3] = 0;
                }
              }
              else {
                pbVar112 = (byte *)((long)puVar155 + lVar140);
                pbVar158 = pbVar112 + 4;
                pbVar112[0] = 0x6e;
                pbVar112[1] = 0x75;
                pbVar112[2] = 0x6c;
                pbVar112[3] = 0x6c;
              }
            }
            else {
              *(byte *)((long)puVar155 + lVar140) = 0x2d;
              lVar138 = -((long)pcVar109 >> 0x3f);
              pbVar158 = (byte *)((long)puVar155 + lVar138 + lVar140);
              if (((ulong)pcVar109 & 0x7fffffffffffffff) == 0) {
                pbVar158[0] = 0x30;
                pbVar158[1] = 0x2e;
                pbVar158[2] = 0x30;
                pbVar158[3] = 0;
                pbVar158 = (byte *)((long)puVar155 + lVar140 + lVar138 + 3);
              }
              else if (uVar120 == 0) {
                uVar103 = (ulong)((uint)pcVar109 & 1);
                uVar123 = uVar123 * 0x20;
                auVar37._8_8_ = 0;
                auVar37._0_8_ = uVar123 - 0x10;
                auVar88._8_8_ = 0;
                auVar88._0_8_ = SUB168(auVar37 * ZEXT816(0x6c07a2c26a8346d2),8);
                auVar38._8_8_ = 0;
                auVar38._0_8_ = uVar123 - 0x10;
                auVar88 = auVar38 * ZEXT816(0x9e19db92b4e31ba9) + auVar88;
                auVar39._8_8_ = 0;
                auVar39._0_8_ = uVar123;
                auVar89._8_8_ = 0;
                auVar89._0_8_ = SUB168(auVar39 * ZEXT816(0x6c07a2c26a8346d2),8);
                auVar40._8_8_ = 0;
                auVar40._0_8_ = uVar123;
                auVar89 = auVar40 * ZEXT816(0x9e19db92b4e31ba9) + auVar89;
                uVar126 = auVar89._8_8_;
                auVar41._8_8_ = 0;
                auVar41._0_8_ = uVar123 + 0x10;
                auVar90._8_8_ = 0;
                auVar90._0_8_ = SUB168(auVar41 * ZEXT816(0x6c07a2c26a8346d2),8);
                auVar42._8_8_ = 0;
                auVar42._0_8_ = uVar123 + 0x10;
                auVar90 = auVar42 * ZEXT816(0x9e19db92b4e31ba9) + auVar90;
                uVar123 = ((ulong)((auVar88 & (undefined1  [16])0xfffffffffffffffe) !=
                                  (undefined1  [16])0x0) | auVar88._8_8_) + uVar103;
                uVar103 = ((ulong)((auVar90 & (undefined1  [16])0xfffffffffffffffe) !=
                                  (undefined1  [16])0x0) | auVar90._8_8_) - uVar103;
                if (uVar126 < 0x28) {
LAB_01f515a1:
                  uVar104 = (auVar89 & (undefined1  [16])0xfffffffffffffffe) !=
                            (undefined1  [16])0x0 | uVar126;
                  uVar144 = uVar126 & 0x7ffffffffffffffc;
                  bVar163 = true;
                  if (uVar104 <= (uVar144 | 2)) {
                    bVar163 = (bool)((byte)((uVar126 & 0xffffffff) >> 2) & 0x3f &
                                    uVar104 == (uVar144 | 2));
                  }
                  uVar104 = uVar126 >> 2;
                  bVar162 = uVar144 + 4 <= uVar103;
                  if (uVar144 < uVar123 == bVar162) {
                    bVar163 = bVar162;
                  }
                  iVar147 = -0x144;
                }
                else {
                  uVar104 = uVar126 / 0x28;
                  bVar163 = uVar104 * 0x28 + 0x28 <= uVar103;
                  if (uVar104 * 0x28 < uVar123 != bVar163) goto LAB_01f515a1;
                  iVar147 = -0x143;
                }
                pcVar109 = (char *)(bVar163 + uVar104);
                if (pcVar109 < (char *)0x38d7ea4c68000) {
                  iVar149 = (int)pcVar109;
                  if (pcVar109 < (char *)0x5f5e100) {
                    if (pcVar109 < (char *)0x64) {
                      *(undefined2 *)((long)puVar155 + lVar140 + lVar138 + 1) =
                           *(undefined2 *)
                            (digit_table + (ulong)(pcVar109 < (char *)0xa) + (long)pcVar109 * 2);
                      pbVar112 = (byte *)((long)puVar155 +
                                         lVar140 + (lVar138 - (ulong)(pcVar109 < (char *)0xa)) + 3);
                    }
                    else {
                      if ((char *)0x270f < pcVar109) {
                        if (pcVar109 < (char *)0xf4240) {
                          iVar149 = (int)((ulong)((long)pcVar109 * 0x68db9) >> 0x20) * -10000 +
                                    iVar149;
                          uVar120 = (uint)(iVar149 * 0x147b) >> 0x13;
                          *(undefined2 *)((long)puVar155 + lVar140 + lVar138 + 1) =
                               *(undefined2 *)
                                (digit_table +
                                (ulong)(pcVar109 < (char *)0x186a0) +
                                ((ulong)((long)pcVar109 * 0x68db9) >> 0x20) * 2);
                          lVar115 = lVar140 + (lVar138 - (ulong)(pcVar109 < (char *)0x186a0));
                          pbVar112 = (byte *)((long)puVar155 + lVar115 + 7);
                          *(undefined2 *)((long)puVar155 + lVar115 + 3) =
                               *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                          uVar111 = *(undefined2 *)(digit_table + (uVar120 * -100 + iVar149) * 2);
                        }
                        else {
                          uVar120 = (uint)((ulong)((long)pcVar109 * 0x68db8bb) >> 0x20);
                          uVar133 = uVar120 >> 8;
                          iVar149 = uVar133 * -10000 + iVar149;
                          uVar133 = uVar133 * 0x147b >> 0x13;
                          uVar142 = (uint)(iVar149 * 0x147b) >> 0x13;
                          *(undefined2 *)((long)puVar155 + lVar140 + lVar138 + 1) =
                               *(undefined2 *)
                                (digit_table +
                                (ulong)(pcVar109 <
                                       "E_17_Hashtable_traitsILb1ELb0ELb1EEEE9_M_rehashEmRKm") +
                                (ulong)uVar133 * 2);
                          lVar115 = lVar140 + (lVar138 -
                                              (ulong)(pcVar109 <
                                                                                                          
                                                  "E_17_Hashtable_traitsILb1ELb0ELb1EEEE9_M_rehashEmRKm"
                                                  ));
                          pbVar112 = (byte *)((long)puVar155 + lVar115 + 9);
                          *(undefined2 *)((long)puVar155 + lVar115 + 3) =
                               *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                          *(undefined2 *)((long)puVar155 + lVar115 + 5) =
                               *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                          uVar111 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar149) * 2);
                        }
                        goto LAB_01f51944;
                      }
                      uVar120 = (uint)(iVar149 * 0x147b) >> 0x13;
                      *(undefined2 *)((long)puVar155 + lVar140 + lVar138 + 1) =
                           *(undefined2 *)
                            (digit_table + (ulong)(pcVar109 < (char *)0x3e8) + (ulong)uVar120 * 2);
                      lVar115 = lVar140 + (lVar138 - (ulong)(pcVar109 < (char *)0x3e8));
                      pbVar112 = (byte *)((long)puVar155 + lVar115 + 5);
                      *(undefined2 *)((long)puVar155 + lVar115 + 3) =
                           *(undefined2 *)(digit_table + (uVar120 * -100 + iVar149) * 2);
                    }
                  }
                  else {
                    auVar16._8_8_ = 0;
                    auVar16._0_8_ = pcVar109;
                    lVar115 = SUB168(auVar16 / ZEXT816(100000000),0);
                    iVar121 = SUB164(auVar16 / ZEXT816(100000000),0);
                    if (pcVar109 < (char *)0x2540be400) {
                      *(undefined2 *)((long)puVar155 + lVar140 + lVar138 + 1) =
                           *(undefined2 *)
                            (digit_table + (ulong)(pcVar109 < (char *)0x3b9aca00) + lVar115 * 2);
                      pbVar112 = (byte *)((long)puVar155 +
                                         lVar140 + (lVar138 - (ulong)(pcVar109 < (char *)0x3b9aca00)
                                                   ) + 3);
                    }
                    else {
                      if (pcVar109 < (char *)0xe8d4a51000) {
                        uVar120 = (uint)(iVar121 * 0x147b) >> 0x13;
                        uVar123 = (ulong)((ulong)pcVar109 >> 0xb < 0x2e90edd);
                        *(undefined2 *)((long)puVar155 + lVar140 + lVar138 + 1) =
                             *(undefined2 *)(digit_table + uVar123 + (ulong)uVar120 * 2);
                        uVar111 = *(undefined2 *)(digit_table + (uVar120 * -100 + iVar121) * 2);
                        pbVar112 = (byte *)((long)puVar155 + lVar140 + (lVar138 - uVar123) + 5);
                      }
                      else if (pcVar109 < (char *)0x5af3107a4000) {
                        iVar134 = (int)((ulong)(lVar115 * 0x68db9) >> 0x20) * -10000 + iVar121;
                        uVar120 = (uint)(iVar134 * 0x147b) >> 0x13;
                        uVar123 = (ulong)((ulong)pcVar109 >> 0xd < 0x48c27395);
                        *(undefined2 *)((long)puVar155 + lVar140 + lVar138 + 1) =
                             *(undefined2 *)
                              (digit_table + uVar123 + ((ulong)(lVar115 * 0x68db9) >> 0x20) * 2);
                        lVar115 = lVar140 + (lVar138 - uVar123);
                        pbVar112 = (byte *)((long)puVar155 + lVar115 + 7);
                        *(undefined2 *)((long)puVar155 + lVar115 + 3) =
                             *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                        uVar111 = *(undefined2 *)(digit_table + (uVar120 * -100 + iVar134) * 2);
                      }
                      else {
                        uVar120 = (uint)((ulong)(lVar115 * 0x68db8bb) >> 0x20);
                        uVar133 = uVar120 >> 8;
                        iVar134 = uVar133 * -10000 + iVar121;
                        uVar142 = uVar133 * 0x147b >> 0x13;
                        uVar133 = (uint)(iVar134 * 0x147b) >> 0x13;
                        *(undefined2 *)((long)puVar155 + lVar140 + lVar138 + 1) =
                             *(undefined2 *)(digit_table + (ulong)uVar142 * 2 + 1);
                        lVar115 = lVar140 + lVar138;
                        pbVar112 = (byte *)((long)puVar155 + lVar115 + 8);
                        *(undefined2 *)((long)puVar155 + lVar115 + 2) =
                             *(undefined2 *)(digit_table + (uVar142 * -100 + (uVar120 >> 8)) * 2);
                        *(undefined2 *)((long)puVar155 + lVar115 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                        uVar111 = *(undefined2 *)(digit_table + (uVar133 * -100 + iVar134) * 2);
                      }
                      *(undefined2 *)(pbVar112 + -2) = uVar111;
                    }
                    uVar133 = iVar121 * -100000000 + iVar149;
                    uVar120 = (uint)((ulong)uVar133 * 0x68db8bb >> 0x20);
                    uVar142 = uVar120 >> 8;
                    iVar149 = uVar142 * -10000 + uVar133;
                    uVar133 = uVar142 * 0x147b >> 0x13;
                    uVar142 = (uint)(iVar149 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar112 = *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                    *(undefined2 *)(pbVar112 + 2) =
                         *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                    *(undefined2 *)(pbVar112 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                    *(undefined2 *)(pbVar112 + 6) =
                         *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar149) * 2);
                    pbVar112 = pbVar112 + 8;
                  }
                }
                else {
                  auVar15._8_8_ = 0;
                  auVar15._0_8_ = pcVar109;
                  uVar123 = SUB168(auVar15 / ZEXT816(10000000000000000),0) * 0xfa0a1f00 +
                            (ulong)pcVar109 / 100000000;
                  *(byte *)((long)puVar155 + lVar140 + lVar138 + 1) =
                       SUB161(auVar15 / ZEXT816(10000000000000000),0) + 0x30;
                  uVar120 = (uint)((uVar123 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar133 = uVar120 >> 8;
                  iVar149 = uVar133 * -10000 + (int)uVar123;
                  uVar133 = uVar133 * 0x147b >> 0x13;
                  uVar142 = (uint)(iVar149 * 0x147b) >> 0x13;
                  lVar115 = lVar140 + lVar138 + (ulong)((char *)0x2386f26fc0ffff < pcVar109);
                  pbVar112 = (byte *)((long)puVar155 + lVar115 + 0x11);
                  *(undefined2 *)((long)puVar155 + lVar115 + 1) =
                       *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                  *(undefined2 *)((long)puVar155 + lVar115 + 3) =
                       *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                  *(undefined2 *)((long)puVar155 + lVar115 + 5) =
                       *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                  *(undefined2 *)((long)puVar155 + lVar115 + 7) =
                       *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar149) * 2);
                  uVar120 = (uint)(((ulong)(pcVar109 + ((ulong)pcVar109 / 100000000) * 0xfa0a1f00) &
                                   0xffffffff) * 0x68db8bb >> 0x20);
                  uVar133 = uVar120 >> 8;
                  iVar149 = uVar133 * -10000 +
                            (int)(pcVar109 + ((ulong)pcVar109 / 100000000) * 0xfa0a1f00);
                  uVar133 = uVar133 * 0x147b >> 0x13;
                  uVar142 = (uint)(iVar149 * 0x147b) >> 0x13;
                  *(undefined2 *)((long)puVar155 + lVar115 + 9) =
                       *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                  *(undefined2 *)((long)puVar155 + lVar115 + 0xb) =
                       *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                  *(undefined2 *)((long)puVar155 + lVar115 + 0xd) =
                       *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                  uVar111 = *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar149) * 2);
LAB_01f51944:
                  *(undefined2 *)(pbVar112 + -2) = uVar111;
                }
                *pbVar158 = *(byte *)((long)puVar155 + lVar140 + lVar138 + 1);
                *(byte *)((long)puVar155 + lVar140 + lVar138 + 1) = 0x2e;
                pbVar158 = pbVar112 + 5;
                do {
                  pbVar110 = pbVar158;
                  pbVar158 = pbVar110 + -1;
                } while (pbVar110[-6] == 0x30);
                iVar149 = (iVar147 + (int)pbVar112) - (int)lVar138;
                uVar123 = (ulong)(pbVar110[-6] != 0x2e);
                (pbVar110 + (uVar123 - 6))[0] = 0x65;
                (pbVar110 + (uVar123 - 6))[1] = 0x2d;
                pbVar110[uVar123 - 4] =
                     (char)((uint)(((iVar149 - iVar139) - (int)lVar140) * -0x290 + 0x520) >> 0x10) +
                     0x30;
                *(undefined2 *)(pbVar110 + (uVar123 - 3)) =
                     *(undefined2 *)
                      (digit_table +
                      (((((int)lVar138 - iVar147) - (int)pbVar112) + iVar139 + (int)lVar140 +
                       ((uint)((iVar149 + iVar141) * -0x290) >> 0x10) * 0x7fffff9c) * 2 + 4));
                pbVar158 = pbVar110 + -1 + uVar123;
              }
              else {
                uVar103 = uVar123 + 0x10000000000000;
                if (uVar120 - 0x3ff < 0x35) {
                  lVar115 = 0;
                  if (uVar103 != 0) {
                    for (; (uVar103 >> lVar115 & 1) == 0; lVar115 = lVar115 + 1) {
                    }
                  }
                  if (0x433 - uVar120 <= (uint)lVar115) {
                    pcVar109 = (char *)(uVar103 >> ((byte)(0x433 - uVar120) & 0x3f));
                    iVar141 = (int)pcVar109;
                    if (pcVar109 < (char *)0x5f5e100) {
                      if (pcVar109 < (char *)0x64) {
                        *(undefined2 *)pbVar158 =
                             *(undefined2 *)
                              (digit_table + (ulong)(pcVar109 < (char *)0xa) + (long)pcVar109 * 2);
                        pbVar158 = (byte *)((long)puVar155 +
                                           lVar140 + (lVar138 - (ulong)(pcVar109 < (char *)0xa)) + 2
                                           );
                      }
                      else if (pcVar109 < (char *)0x2710) {
                        uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                        *(undefined2 *)pbVar158 =
                             *(undefined2 *)
                              (digit_table + (ulong)(pcVar109 < (char *)0x3e8) + (ulong)uVar120 * 2)
                        ;
                        lVar140 = lVar140 + (lVar138 - (ulong)(pcVar109 < (char *)0x3e8));
                        pbVar158 = (byte *)((long)puVar155 + lVar140 + 4);
                        *(undefined2 *)((long)puVar155 + lVar140 + 2) =
                             *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                      }
                      else {
                        if (pcVar109 < (char *)0xf4240) {
                          iVar141 = (int)((ulong)((long)pcVar109 * 0x68db9) >> 0x20) * -10000 +
                                    iVar141;
                          uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                          *(undefined2 *)pbVar158 =
                               *(undefined2 *)
                                (digit_table +
                                (ulong)(pcVar109 < (char *)0x186a0) +
                                ((ulong)((long)pcVar109 * 0x68db9) >> 0x20) * 2);
                          lVar140 = lVar140 + (lVar138 - (ulong)(pcVar109 < (char *)0x186a0));
                          lVar138 = lVar140 + 6;
                          *(undefined2 *)((long)puVar155 + lVar140 + 2) =
                               *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                          uVar111 = *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                        }
                        else {
                          uVar120 = (uint)((ulong)((long)pcVar109 * 0x68db8bb) >> 0x20);
                          uVar133 = uVar120 >> 8;
                          iVar141 = uVar133 * -10000 + iVar141;
                          uVar133 = uVar133 * 0x147b >> 0x13;
                          uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
                          *(undefined2 *)pbVar158 =
                               *(undefined2 *)
                                (digit_table +
                                (ulong)(pcVar109 <
                                       "E_17_Hashtable_traitsILb1ELb0ELb1EEEE9_M_rehashEmRKm") +
                                (ulong)uVar133 * 2);
                          lVar140 = lVar140 + (lVar138 -
                                              (ulong)(pcVar109 <
                                                                                                          
                                                  "E_17_Hashtable_traitsILb1ELb0ELb1EEEE9_M_rehashEmRKm"
                                                  ));
                          lVar138 = lVar140 + 8;
                          *(undefined2 *)((long)puVar155 + lVar140 + 2) =
                               *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                          *(undefined2 *)((long)puVar155 + lVar140 + 4) =
                               *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                          uVar111 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar141) * 2);
                        }
                        pbVar158 = (byte *)((long)puVar155 + lVar138);
                        *(undefined2 *)(pbVar158 + -2) = uVar111;
                      }
                    }
                    else {
                      auVar14._8_8_ = 0;
                      auVar14._0_8_ = pcVar109;
                      lVar115 = SUB168(auVar14 / ZEXT816(100000000),0);
                      iVar139 = SUB164(auVar14 / ZEXT816(100000000),0);
                      if (pcVar109 < (char *)0x2540be400) {
                        *(undefined2 *)pbVar158 =
                             *(undefined2 *)
                              (digit_table + (ulong)(pcVar109 < (char *)0x3b9aca00) + lVar115 * 2);
                        pbVar158 = (byte *)((long)puVar155 +
                                           lVar140 + (lVar138 -
                                                     (ulong)(pcVar109 < (char *)0x3b9aca00)) + 2);
                      }
                      else {
                        if (pcVar109 < (char *)0xe8d4a51000) {
                          uVar120 = (uint)(iVar139 * 0x147b) >> 0x13;
                          uVar123 = (ulong)((ulong)pcVar109 >> 0xb < 0x2e90edd);
                          *(undefined2 *)pbVar158 =
                               *(undefined2 *)(digit_table + uVar123 + (ulong)uVar120 * 2);
                          uVar111 = *(undefined2 *)(digit_table + (uVar120 * -100 + iVar139) * 2);
                          pbVar158 = (byte *)((long)puVar155 + lVar140 + (lVar138 - uVar123) + 4);
                        }
                        else if (pcVar109 < (char *)0x5af3107a4000) {
                          iVar147 = (int)((ulong)(lVar115 * 0x68db9) >> 0x20) * -10000 + iVar139;
                          uVar120 = (uint)(iVar147 * 0x147b) >> 0x13;
                          uVar123 = (ulong)((ulong)pcVar109 >> 0xd < 0x48c27395);
                          *(undefined2 *)pbVar158 =
                               *(undefined2 *)
                                (digit_table + uVar123 + ((ulong)(lVar115 * 0x68db9) >> 0x20) * 2);
                          lVar140 = lVar140 + (lVar138 - uVar123);
                          pbVar158 = (byte *)((long)puVar155 + lVar140 + 6);
                          *(undefined2 *)((long)puVar155 + lVar140 + 2) =
                               *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                          uVar111 = *(undefined2 *)(digit_table + (uVar120 * -100 + iVar147) * 2);
                        }
                        else {
                          uVar120 = (uint)((ulong)(lVar115 * 0x68db8bb) >> 0x20);
                          uVar133 = uVar120 >> 8;
                          iVar147 = uVar133 * -10000 + iVar139;
                          uVar133 = uVar133 * 0x147b >> 0x13;
                          uVar142 = (uint)(iVar147 * 0x147b) >> 0x13;
                          *(undefined2 *)pbVar158 =
                               *(undefined2 *)
                                (digit_table +
                                (ulong)(pcVar109 < (char *)0x38d7ea4c68000) + (ulong)uVar133 * 2);
                          lVar140 = lVar140 + (lVar138 - (ulong)(pcVar109 < (char *)0x38d7ea4c68000)
                                              );
                          pbVar158 = (byte *)((long)puVar155 + lVar140 + 8);
                          *(undefined2 *)((long)puVar155 + lVar140 + 2) =
                               *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                          *(undefined2 *)((long)puVar155 + lVar140 + 4) =
                               *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                          uVar111 = *(undefined2 *)(digit_table + (uVar142 * -100 + iVar147) * 2);
                        }
                        *(undefined2 *)(pbVar158 + -2) = uVar111;
                      }
                      uVar133 = iVar139 * -100000000 + iVar141;
                      uVar120 = (uint)((ulong)uVar133 * 0x68db8bb >> 0x20);
                      uVar142 = uVar120 >> 8;
                      iVar141 = uVar142 * -10000 + uVar133;
                      uVar133 = uVar142 * 0x147b >> 0x13;
                      uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
                      *(undefined2 *)pbVar158 = *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                      *(undefined2 *)(pbVar158 + 2) =
                           *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                      *(undefined2 *)(pbVar158 + 4) =
                           *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                      *(undefined2 *)(pbVar158 + 6) =
                           *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar141) * 2);
                      pbVar158 = pbVar158 + 8;
                    }
                    pbVar158[0] = 0x2e;
                    pbVar158[1] = 0x30;
                    pbVar158 = pbVar158 + 2;
                    goto LAB_01f50f67;
                  }
                }
                uVar126 = (ulong)((uint)pcVar109 & 1);
                iVar141 = uVar120 * 0x4d105 + -0x200a5;
                if (uVar120 == 1 || uVar123 != 0) {
                  iVar141 = uVar120 * 0x4d105;
                }
                iVar141 = iVar141 + -0x1439b7ff >> 0x14;
                uVar104 = *(ulong *)(pow10_sig_table + (ulong)(iVar141 * -2 + 0x2ae) * 8);
                uVar144 = *(long *)(pow10_sig_table + (ulong)(iVar141 * -2 + 0x2af) * 8) +
                          (ulong)(iVar141 - 1U < 0xffffffc8);
                bVar156 = ((char)((uint)(iVar141 * -0x3526b) >> 0x10) + (char)uVar120) - 0x32;
                uVar123 = (ulong)(uVar120 != 1 && uVar123 == 0) + uVar103 * 4 + -2 <<
                          (bVar156 & 0x3f);
                auVar31._8_8_ = 0;
                auVar31._0_8_ = uVar144;
                auVar67._8_8_ = 0;
                auVar67._0_8_ = uVar123;
                auVar85._8_8_ = 0;
                auVar85._0_8_ = SUB168(auVar31 * auVar67,8);
                auVar32._8_8_ = 0;
                auVar32._0_8_ = uVar104;
                auVar68._8_8_ = 0;
                auVar68._0_8_ = uVar123;
                auVar85 = auVar32 * auVar68 + auVar85;
                uVar123 = uVar103 * 4 << (bVar156 & 0x3f);
                auVar33._8_8_ = 0;
                auVar33._0_8_ = uVar144;
                auVar69._8_8_ = 0;
                auVar69._0_8_ = uVar123;
                auVar86._8_8_ = 0;
                auVar86._0_8_ = SUB168(auVar33 * auVar69,8);
                auVar34._8_8_ = 0;
                auVar34._0_8_ = uVar104;
                auVar70._8_8_ = 0;
                auVar70._0_8_ = uVar123;
                auVar86 = auVar34 * auVar70 + auVar86;
                uVar123 = auVar86._8_8_;
                uVar103 = uVar103 * 4 + 2 << (bVar156 & 0x3f);
                auVar35._8_8_ = 0;
                auVar35._0_8_ = uVar144;
                auVar71._8_8_ = 0;
                auVar71._0_8_ = uVar103;
                auVar87._8_8_ = 0;
                auVar87._0_8_ = SUB168(auVar35 * auVar71,8);
                auVar36._8_8_ = 0;
                auVar36._0_8_ = uVar104;
                auVar72._8_8_ = 0;
                auVar72._0_8_ = uVar103;
                auVar87 = auVar36 * auVar72 + auVar87;
                uVar103 = ((ulong)((auVar85 & (undefined1  [16])0xfffffffffffffffe) !=
                                  (undefined1  [16])0x0) | auVar85._8_8_) + uVar126;
                uVar126 = ((ulong)((auVar87 & (undefined1  [16])0xfffffffffffffffe) !=
                                  (undefined1  [16])0x0) | auVar87._8_8_) - uVar126;
                if (uVar123 < 0x28) {
LAB_01f4f5ad:
                  uVar144 = (auVar86 & (undefined1  [16])0xfffffffffffffffe) !=
                            (undefined1  [16])0x0 | uVar123;
                  uVar104 = uVar123 & 0xfffffffffffffffc;
                  bVar163 = true;
                  if (uVar144 <= uVar104 + 2) {
                    bVar163 = (bool)((byte)((uVar123 & 0xffffffff) >> 2) & 0x3f &
                                    uVar144 == uVar104 + 2);
                  }
                  bVar162 = uVar104 + 4 <= uVar126;
                  if (uVar104 < uVar103 == bVar162) {
                    bVar163 = bVar162;
                  }
                  uVar123 = (ulong)bVar163 + (uVar123 >> 2);
                }
                else {
                  uVar144 = (uVar123 / 0x28) * 0x28;
                  uVar104 = uVar144 + 0x28;
                  if (uVar144 < uVar103 != uVar104 <= uVar126) goto LAB_01f4f5ad;
                  uVar123 = (uVar123 / 0x28 + 1) - (ulong)(uVar126 < uVar104);
                  iVar141 = iVar141 + 1;
                }
                iVar139 = (0x11 - (uint)(uVar123 < 10000000000000000)) -
                          (uint)(uVar123 < 1000000000000000);
                uVar120 = iVar139 + iVar141;
                if (iVar139 + iVar141 + 5U < 0x1b) {
                  if ((int)uVar120 < 1) {
                    uVar104 = (ulong)(2 - uVar120);
                    auVar13._8_8_ = 0;
                    auVar13._0_8_ = uVar123;
                    uVar103 = SUB168(auVar13 / ZEXT816(100000000),0);
                    uVar123 = uVar103 * 0xfa0a1f00 + uVar123;
                    uVar142 = SUB164(auVar13 / ZEXT816(100000000),0);
                    uVar103 = (uVar103 & 0xffffffff) / 10000;
                    iVar141 = (int)uVar103;
                    iVar139 = iVar141 * -10000 + uVar142;
                    iVar147 = (int)(uVar103 * 0x28f5d >> 0x18);
                    uVar148 = (uint)(iVar147 * 0x29) >> 0xc;
                    uVar152 = uVar148 * -100 + iVar147;
                    uVar133 = iVar147 * -100 + iVar141;
                    *(byte *)((long)puVar155 + lVar140 + uVar104 + lVar138) = (char)uVar148 + 0x30;
                    uVar126 = (ulong)(uVar142 >= 100000000);
                    uVar103 = (ulong)(uVar152 < 10 && uVar142 < 100000000);
                    *(undefined2 *)((long)puVar155 + lVar140 + lVar138 + uVar126 + uVar104) =
                         *(undefined2 *)(digit_table + uVar103 + uVar152 * 2);
                    *(undefined2 *)
                     ((long)puVar155 + lVar140 + 2 + ((lVar138 + uVar126) - uVar103) + uVar104) =
                         *(undefined2 *)(digit_table + uVar133 * 2);
                    lVar115 = -uVar103;
                    iVar141 = (int)uVar123;
                    if (iVar141 == 0) {
                      if (iVar139 == 0) {
                        uVar123 = (ulong)(byte)dec_trailing_zero_table[uVar152];
                        if (uVar133 != 0) {
                          uVar123 = 0;
                        }
                        uVar123 = 4 - (uVar123 + (byte)dec_trailing_zero_table[uVar133]);
                      }
                      else {
                        uVar133 = (uint)(iVar139 * 0x147b) >> 0x13;
                        uVar142 = uVar133 * -100 + iVar139;
                        lVar145 = lVar138 + lVar115 + uVar126 + uVar104;
                        *(undefined2 *)((long)puVar155 + lVar140 + 4 + lVar145) =
                             *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                        *(undefined2 *)((long)puVar155 + lVar140 + 6 + lVar145) =
                             *(undefined2 *)(digit_table + uVar142 * 2);
                        uVar123 = (ulong)(byte)dec_trailing_zero_table[uVar133] + 2;
                        if (uVar142 != 0) {
                          uVar123 = (ulong)(byte)dec_trailing_zero_table[uVar142];
                        }
                        uVar123 = 8 - uVar123;
                      }
                    }
                    else {
                      uVar152 = (uint)(iVar139 * 0x147b) >> 0x13;
                      lVar146 = lVar138 + lVar115 + uVar104 + uVar126;
                      uVar133 = (uint)((uVar123 & 0xffffffff) * 0x68db8bb >> 0x20);
                      uVar142 = uVar133 >> 8;
                      uVar148 = uVar142 * 0x147b >> 0x13;
                      uVar123 = (ulong)uVar148;
                      *(undefined2 *)((long)puVar155 + lVar140 + 4 + lVar146) =
                           *(undefined2 *)(digit_table + (ulong)uVar152 * 2);
                      uVar142 = uVar148 * -100 + uVar142;
                      *(undefined2 *)((long)puVar155 + lVar140 + 6 + lVar146) =
                           *(undefined2 *)(digit_table + (uVar152 * 0x7fffff9c + iVar139) * 2);
                      *(undefined2 *)((long)puVar155 + lVar140 + 8 + lVar146) =
                           *(undefined2 *)(digit_table + uVar123 * 2);
                      *(undefined2 *)((long)puVar155 + lVar140 + 10 + lVar146) =
                           *(undefined2 *)(digit_table + uVar142 * 2);
                      lVar145 = 0xc;
                      iVar141 = (uVar133 >> 8) * -10000 + iVar141;
                      if (iVar141 != 0) {
                        uVar133 = (uint)(iVar141 * 0x147b) >> 0x13;
                        uVar123 = (ulong)uVar133;
                        uVar142 = uVar133 * -100 + iVar141;
                        *(undefined2 *)((long)puVar155 + lVar140 + 0xc + lVar146) =
                             *(undefined2 *)(digit_table + uVar123 * 2);
                        *(undefined2 *)((long)puVar155 + lVar140 + 0xe + lVar146) =
                             *(undefined2 *)(digit_table + uVar142 * 2);
                        lVar145 = 0x10;
                      }
                      uVar123 = (ulong)(byte)dec_trailing_zero_table[uVar123] + 2;
                      if (uVar142 != 0) {
                        uVar123 = (ulong)(byte)dec_trailing_zero_table[uVar142];
                      }
                      uVar123 = lVar145 - uVar123;
                    }
                    *pbVar158 = 0x30;
                    *(byte *)((long)puVar155 + lVar140 + 1 + lVar138) = 0x2e;
                    for (uVar103 = 0;
                        pbVar158 = (byte *)((long)puVar155 +
                                           (uVar123 & 0xffffffff) +
                                           lVar140 + uVar126 + uVar104 + lVar115 + lVar138),
                        -uVar120 != uVar103; uVar103 = uVar103 + 1) {
                      *(byte *)((long)puVar154 + uVar103 + lVar138) = 0x30;
                    }
                  }
                  else {
                    auVar11._8_8_ = 0;
                    auVar11._0_8_ = uVar123;
                    uVar103 = SUB168(auVar11 / ZEXT816(100000000),0);
                    uVar123 = uVar103 * 0xfa0a1f00 + uVar123;
                    uVar133 = SUB164(auVar11 / ZEXT816(100000000),0);
                    uVar103 = (uVar103 & 0xffffffff) / 10000;
                    iVar141 = (int)uVar103;
                    iVar147 = iVar141 * -10000 + uVar133;
                    iVar139 = (int)(uVar103 * 0x28f5d >> 0x18);
                    uVar152 = (uint)(iVar139 * 0x29) >> 0xc;
                    uVar148 = uVar152 * -100 + iVar139;
                    uVar142 = iVar139 * -100 + iVar141;
                    pbVar158[0x10] = 0x30;
                    pbVar158[0x11] = 0x30;
                    pbVar158[0x12] = 0x30;
                    pbVar158[0x13] = 0x30;
                    pbVar158[0x14] = 0x30;
                    pbVar158[0x15] = 0x30;
                    pbVar158[0x16] = 0x30;
                    pbVar158[0x17] = 0x30;
                    pbVar158[0] = 0x30;
                    pbVar158[1] = 0x30;
                    pbVar158[2] = 0x30;
                    pbVar158[3] = 0x30;
                    pbVar158[4] = 0x30;
                    pbVar158[5] = 0x30;
                    pbVar158[6] = 0x30;
                    pbVar158[7] = 0x30;
                    pbVar158[8] = 0x30;
                    pbVar158[9] = 0x30;
                    pbVar158[10] = 0x30;
                    pbVar158[0xb] = 0x30;
                    pbVar158[0xc] = 0x30;
                    pbVar158[0xd] = 0x30;
                    pbVar158[0xe] = 0x30;
                    pbVar158[0xf] = 0x30;
                    *(byte *)((long)puVar155 + lVar140 + 1 + lVar138) = (char)uVar152 + 0x30;
                    uVar103 = (ulong)(uVar133 >= 100000000);
                    uVar126 = (ulong)(uVar148 < 10 && uVar133 < 100000000);
                    *(undefined2 *)((long)puVar155 + lVar140 + 1 + lVar138 + uVar103) =
                         *(undefined2 *)(digit_table + uVar126 + uVar148 * 2);
                    *(undefined2 *)((long)puVar155 + lVar140 + 3 + ((lVar138 + uVar103) - uVar126))
                         = *(undefined2 *)(digit_table + uVar142 * 2);
                    lVar115 = -uVar126;
                    iVar141 = (int)uVar123;
                    if (iVar141 == 0) {
                      if (iVar147 == 0) {
                        uVar123 = (ulong)(byte)dec_trailing_zero_table[uVar148];
                        if (uVar142 != 0) {
                          uVar123 = 0;
                        }
                        uVar123 = uVar123 + (byte)dec_trailing_zero_table[uVar142];
                        lStack_120 = 4;
                        goto LAB_01f504f4;
                      }
                      uVar133 = (uint)(iVar147 * 0x147b) >> 0x13;
                      uVar142 = uVar133 * -100 + iVar147;
                      lVar145 = uVar103 + lVar138 + lVar115;
                      *(undefined2 *)((long)puVar155 + lVar140 + 5 + lVar145) =
                           *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                      *(undefined2 *)((long)puVar155 + lVar140 + 7 + lVar145) =
                           *(undefined2 *)(digit_table + uVar142 * 2);
                      uVar123 = (ulong)(byte)dec_trailing_zero_table[uVar133] + 2;
                      if (uVar142 != 0) {
                        uVar123 = (ulong)(byte)dec_trailing_zero_table[uVar142];
                      }
                      uVar123 = 8 - uVar123;
                    }
                    else {
                      uVar142 = (uint)(iVar147 * 0x147b) >> 0x13;
                      uVar133 = (uint)((uVar123 & 0xffffffff) * 0x68db8bb >> 0x20);
                      uVar152 = uVar133 >> 8;
                      uVar148 = uVar152 * 0x147b >> 0x13;
                      uVar123 = (ulong)uVar148;
                      uVar133 = uVar148 * -100 + (uVar133 >> 8);
                      lVar145 = uVar103 + lVar138 + lVar115;
                      *(undefined2 *)((long)puVar155 + lVar140 + 5 + lVar145) =
                           *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                      *(undefined2 *)((long)puVar155 + lVar140 + 7 + lVar145) =
                           *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar147) * 2);
                      *(undefined2 *)((long)puVar155 + lVar140 + 9 + lVar145) =
                           *(undefined2 *)(digit_table + uVar123 * 2);
                      *(undefined2 *)((long)puVar155 + lVar140 + 0xb + lVar145) =
                           *(undefined2 *)(digit_table + uVar133 * 2);
                      lStack_120 = 0xc;
                      iVar141 = uVar152 * -10000 + iVar141;
                      if (iVar141 != 0) {
                        uVar133 = (uint)(iVar141 * 0x147b) >> 0x13;
                        uVar123 = (ulong)uVar133;
                        uVar133 = uVar133 * -100 + iVar141;
                        *(undefined2 *)((long)puVar155 + lVar140 + 0xd + lVar145) =
                             *(undefined2 *)(digit_table + uVar123 * 2);
                        *(undefined2 *)((long)puVar155 + lVar140 + 0xf + lVar145) =
                             *(undefined2 *)(digit_table + uVar133 * 2);
                        lStack_120 = 0x10;
                      }
                      uVar123 = (ulong)(byte)dec_trailing_zero_table[uVar123] + 2;
                      if (uVar133 != 0) {
                        uVar123 = (ulong)(byte)dec_trailing_zero_table[uVar133];
                      }
LAB_01f504f4:
                      uVar123 = lStack_120 - uVar123;
                    }
                    pbVar112 = (byte *)((long)puVar155 +
                                       lVar140 + (uVar123 & 0xffffffff) +
                                                 lVar115 + lVar138 + uVar103 + 1);
                    for (uVar123 = 0; uVar120 != uVar123; uVar123 = uVar123 + 1) {
                      *(byte *)((long)puVar127 + uVar123 + lVar138) =
                           *(byte *)((long)puVar127 + uVar123 + lVar138 + 1);
                    }
                    pbVar110 = (byte *)((long)puVar155 + lVar140 + lVar138 + (ulong)uVar120);
                    pbVar158 = pbVar110 + 2;
                    *pbVar110 = 0x2e;
                    if (pbVar158 < pbVar112) {
                      pbVar158 = pbVar112;
                    }
                  }
                }
                else {
                  auVar12._8_8_ = 0;
                  auVar12._0_8_ = uVar123;
                  uVar126 = SUB168(auVar12 / ZEXT816(100000000),0);
                  uVar148 = SUB164(auVar12 / ZEXT816(100000000),0);
                  lVar115 = 2 - (ulong)(uVar148 < 100000000);
                  uVar103 = (uVar126 & 0xffffffff) / 10000;
                  iVar141 = (int)uVar103;
                  iVar147 = iVar141 * -10000 + uVar148;
                  uVar123 = uVar126 * 0xfa0a1f00 + uVar123;
                  iVar139 = (int)(uVar103 * 0x28f5d >> 0x18);
                  uVar133 = (uint)(iVar139 * 0x29) >> 0xc;
                  uVar152 = uVar133 * -100 + iVar139;
                  uVar142 = iVar139 * -100 + iVar141;
                  *(byte *)((long)puVar155 + lVar140 + 1 + lVar138) = (char)uVar133 + 0x30;
                  lVar145 = lVar138 + lVar115;
                  uVar103 = (ulong)(uVar152 < 10 && uVar148 < 100000000);
                  *(undefined2 *)((long)puVar155 + lVar140 + lVar145) =
                       *(undefined2 *)(digit_table + uVar103 + uVar152 * 2);
                  *(undefined2 *)((long)puVar155 + lVar140 + 2 + (lVar145 - uVar103)) =
                       *(undefined2 *)(digit_table + uVar142 * 2);
                  lVar146 = -uVar103;
                  iVar141 = (int)uVar123;
                  if (iVar141 == 0) {
                    if (iVar147 == 0) {
                      uVar133 = (uint)(byte)dec_trailing_zero_table[uVar152];
                      if (uVar142 != 0) {
                        uVar133 = 0;
                      }
                      uVar133 = uVar133 + (byte)dec_trailing_zero_table[uVar142];
                      iVar141 = 4;
                    }
                    else {
                      uVar133 = (uint)(iVar147 * 0x147b) >> 0x13;
                      uVar142 = uVar133 * -100 + iVar147;
                      *(undefined2 *)((long)puVar155 + lVar140 + 4 + lVar146 + lVar145) =
                           *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                      *(undefined2 *)((long)puVar155 + lVar140 + 6 + lVar146 + lVar145) =
                           *(undefined2 *)(digit_table + uVar142 * 2);
                      uVar133 = (byte)dec_trailing_zero_table[uVar133] + 2;
                      if (uVar142 != 0) {
                        uVar133 = (uint)(byte)dec_trailing_zero_table[uVar142];
                      }
                      iVar141 = 8;
                    }
                    uVar133 = iVar141 - uVar133;
                  }
                  else {
                    uVar152 = (uint)(iVar147 * 0x147b) >> 0x13;
                    uVar133 = (uint)((uVar123 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar142 = uVar133 >> 8;
                    uVar157 = uVar142 * 0x147b >> 0x13;
                    uVar148 = uVar157 * -100 + (uVar133 >> 8);
                    lVar116 = lVar146 + lVar145;
                    *(undefined2 *)((long)puVar155 + lVar140 + 4 + lVar116) =
                         *(undefined2 *)(digit_table + (ulong)uVar152 * 2);
                    *(undefined2 *)((long)puVar155 + lVar140 + 6 + lVar116) =
                         *(undefined2 *)(digit_table + (uVar152 * 0x7fffff9c + iVar147) * 2);
                    *(undefined2 *)((long)puVar155 + lVar140 + 8 + lVar116) =
                         *(undefined2 *)(digit_table + (ulong)uVar157 * 2);
                    *(undefined2 *)((long)puVar155 + lVar140 + 10 + lVar116) =
                         *(undefined2 *)(digit_table + uVar148 * 2);
                    iVar141 = uVar142 * -10000 + iVar141;
                    if (iVar141 == 0) {
                      uVar133 = (byte)dec_trailing_zero_table[uVar157] + 2;
                      if (uVar148 != 0) {
                        uVar133 = (uint)(byte)dec_trailing_zero_table[uVar148];
                      }
                      iVar141 = 0xc;
                    }
                    else {
                      uVar133 = (uint)(iVar141 * 0x147b) >> 0x13;
                      uVar142 = uVar133 * -100 + iVar141;
                      *(undefined2 *)((long)puVar155 + lVar140 + 0xc + lVar116) =
                           *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
                      *(undefined2 *)((long)puVar155 + lVar140 + 0xe + lVar116) =
                           *(undefined2 *)(digit_table + uVar142 * 2);
                      uVar133 = (byte)dec_trailing_zero_table[uVar133] + 2;
                      if (uVar142 != 0) {
                        uVar133 = (uint)(byte)dec_trailing_zero_table[uVar142];
                      }
                      iVar141 = 0x10;
                    }
                    uVar133 = iVar141 - uVar133;
                  }
                  uVar126 = (ulong)uVar133;
                  uVar123 = (ulong)((lVar115 - uVar103) + uVar126 == 2);
                  lVar116 = -uVar123;
                  lVar115 = (lVar145 - uVar123) + lVar146 + uVar126;
                  uVar120 = uVar120 - 1;
                  *pbVar158 = *(byte *)((long)puVar155 + lVar140 + lVar138 + 1);
                  *(byte *)((long)puVar155 + lVar140 + lVar138 + 1) = 0x2e;
                  pbVar158 = (byte *)((long)puVar155 + lVar140 + lVar115);
                  pbVar158[0] = 0x65;
                  pbVar158[1] = 0x2d;
                  uVar123 = (ulong)(uVar120 >> 0x1f);
                  lVar115 = uVar123 + lVar115;
                  uVar133 = -uVar120;
                  if (0 < (int)uVar120) {
                    uVar133 = uVar120;
                  }
                  if (uVar133 < 100) {
                    *(undefined2 *)((long)puVar155 + lVar140 + lVar115 + 1) =
                         *(undefined2 *)(digit_table + (ulong)(uVar133 < 10) + (ulong)uVar133 * 2);
                    pbVar158 = (byte *)((long)puVar155 +
                                       lVar140 + ((lVar145 + uVar123 + lVar116) -
                                                 (ulong)(uVar133 < 10)) + lVar146 + uVar126 + 3);
                  }
                  else {
                    *(byte *)((long)puVar155 + lVar140 + lVar115 + 1) =
                         (char)(uVar133 * 0x290 >> 0x10) + 0x30;
                    lVar140 = lVar140 + lVar116 + lVar145 + uVar123 + lVar146 + uVar126;
                    pbVar158 = (byte *)((long)puVar155 + lVar140 + 4);
                    *(undefined2 *)((long)puVar155 + lVar140 + 2) =
                         *(undefined2 *)
                          (digit_table + ((uVar133 * 0x290 >> 0x10) * 0x7fffff9c + uVar133) * 2);
                  }
                }
              }
            }
          }
LAB_01f50f67:
          pbVar158[0] = 0x2c;
          pbVar158[1] = 10;
          puVar155 = (uint *)(pbVar158 + 2);
        }
        else if (((uint)uVar123 & 7) == 5) {
          uVar126 = uVar123 >> 8;
          uVar103 = 0x10;
          if ((uVar133 & uVar120) == 0) {
            uVar103 = uVar106;
          }
          pbVar158 = (byte *)(pyVar137->uni).str;
          uVar103 = uVar103 + uVar126 * 6;
          if (local_f8 <= (ulong *)(uVar103 + (long)puVar155)) {
            uVar104 = sVar135 >> 1;
            if (sVar135 >> 1 <= uVar103) {
              uVar104 = uVar103;
            }
            sVar159 = (uVar104 + 0xf & 0xfffffffffffffff0) + sVar135;
            pbVar112 = (byte *)(*p_Var7)(pvVar6,local_110,sVar135,sVar159);
            if (pbVar112 == (byte *)0x0) goto LAB_01f54af9;
            sVar125 = (long)local_b0 - (long)local_f8;
            memmove(pbVar112 + (sVar159 - sVar125),pbVar112 + ((long)local_f8 - (long)local_110),
                    sVar125);
            puVar155 = (uint *)(pbVar112 + ((long)puVar155 - (long)local_110));
            local_b0 = (ulong *)(pbVar112 + sVar159);
            sVar135 = sVar159;
            local_110 = (uint *)pbVar112;
            local_f8 = (ulong *)(pbVar112 + (sVar159 - sVar125));
          }
          lVar138 = 0;
          if ((uVar133 & uVar120) == 0) {
            lVar138 = lVar150;
          }
          while (lVar138 != 0) {
            *puVar155 = 0x20202020;
            puVar155 = (uint *)((long)puVar155 + lVar151);
            lVar138 = lVar138 + -1;
          }
          if ((puVar132 != enc_table_cpy) || ((pyVar137->tag & 0x18) == 0)) {
            puVar127 = (uint *)(pbVar158 + uVar126);
            *(byte *)puVar155 = 0x22;
LAB_01f4f616:
            lVar140 = (long)puVar127 - (long)pbVar158;
            lVar138 = 0;
            while( true ) {
              puVar124 = (uint *)(pbVar158 + lVar138);
              puVar113 = (uint *)((long)puVar155 + lVar138 + 1);
              if (lVar140 < 0x10) break;
              bVar156 = (byte)*puVar124;
              if (puVar132[bVar156] != '\0') {
                puVar124 = (uint *)(pbVar158 + lVar138);
                puVar113 = (uint *)((long)puVar155 + lVar138 + 1);
                goto LAB_01f4fa54;
              }
              if (puVar132[pbVar158[lVar138 + 1]] != '\0') {
                puVar124 = (uint *)(pbVar158 + lVar138);
                puVar113 = (uint *)((long)puVar155 + lVar138 + 1);
                goto LAB_01f4fa06;
              }
              if (puVar132[pbVar158[lVar138 + 2]] != '\0') {
                puVar124 = (uint *)(pbVar158 + lVar138);
                puVar113 = (uint *)((long)puVar155 + lVar138 + 1);
                goto LAB_01f4fa17;
              }
              if (puVar132[pbVar158[lVar138 + 3]] != '\0') {
                puVar124 = (uint *)(pbVar158 + lVar138);
                puVar113 = (uint *)((long)puVar155 + lVar138 + 1);
                goto LAB_01f4fa2e;
              }
              if (puVar132[pbVar158[lVar138 + 4]] != '\0') {
                puVar124 = (uint *)(pbVar158 + lVar138 + 4);
                puVar113 = (uint *)((long)puVar155 + lVar138 + 5);
                *(undefined4 *)((long)puVar155 + lVar138 + 1) = *(undefined4 *)(pbVar158 + lVar138);
                goto LAB_01f4fa54;
              }
              if (puVar132[pbVar158[lVar138 + 5]] != '\0') {
                pbVar158 = pbVar158 + lVar138;
                puVar124 = (uint *)(pbVar158 + 5);
                puVar113 = (uint *)((long)puVar155 + lVar138 + 6);
                *(byte *)((long)puVar113 + -1) = pbVar158[4];
                *(undefined4 *)((long)puVar113 + -5) = *(undefined4 *)pbVar158;
                goto LAB_01f4fa54;
              }
              if (puVar132[pbVar158[lVar138 + 6]] != '\0') {
                pbVar158 = pbVar158 + lVar138;
                puVar124 = (uint *)(pbVar158 + 6);
                puVar113 = (uint *)((long)puVar155 + lVar138 + 7);
                *(ushort *)((long)puVar113 + -2) = *(ushort *)(pbVar158 + 4);
                *(undefined4 *)((long)puVar113 + -6) = *(undefined4 *)pbVar158;
                goto LAB_01f4fa54;
              }
              if (puVar132[pbVar158[lVar138 + 7]] != '\0') {
                pbVar158 = pbVar158 + lVar138;
                puVar124 = (uint *)(pbVar158 + 7);
                uVar3 = *(undefined4 *)pbVar158;
                puVar113 = (uint *)((long)puVar155 + lVar138 + 8);
                *(undefined4 *)((long)puVar155 + lVar138 + 4) = *(undefined4 *)(pbVar158 + 3);
                *(undefined4 *)((long)puVar155 + lVar138 + 1) = uVar3;
                goto LAB_01f4fa54;
              }
              if (puVar132[pbVar158[lVar138 + 8]] != '\0') {
                puVar124 = (uint *)(pbVar158 + lVar138 + 8);
                puVar113 = (uint *)((long)puVar155 + lVar138 + 9);
                *(undefined8 *)((long)puVar155 + lVar138 + 1) = *(undefined8 *)(pbVar158 + lVar138);
                goto LAB_01f4fa54;
              }
              if (puVar132[pbVar158[lVar138 + 9]] != '\0') {
                pbVar158 = pbVar158 + lVar138;
                puVar124 = (uint *)(pbVar158 + 9);
                puVar113 = (uint *)((long)puVar155 + lVar138 + 10);
                *(byte *)((long)puVar113 + -1) = pbVar158[8];
                *(undefined8 *)((long)puVar113 + -9) = *(undefined8 *)pbVar158;
                goto LAB_01f4fa54;
              }
              if (puVar132[pbVar158[lVar138 + 10]] != '\0') {
                pbVar158 = pbVar158 + lVar138;
                puVar124 = (uint *)(pbVar158 + 10);
                puVar113 = (uint *)((long)puVar155 + lVar138 + 0xb);
                *(ushort *)((long)puVar113 + -2) = *(ushort *)(pbVar158 + 8);
                *(undefined8 *)((long)puVar113 + -10) = *(undefined8 *)pbVar158;
                goto LAB_01f4fa54;
              }
              if (puVar132[pbVar158[lVar138 + 0xb]] != '\0') {
                pbVar158 = pbVar158 + lVar138;
                puVar124 = (uint *)(pbVar158 + 0xb);
                puVar113 = (uint *)((long)puVar155 + lVar138 + 0xc);
                puVar113[-1] = *(uint *)(pbVar158 + 7);
                *(undefined8 *)((long)puVar113 + -0xb) = *(undefined8 *)pbVar158;
                goto LAB_01f4fa54;
              }
              if (puVar132[pbVar158[lVar138 + 0xc]] != '\0') {
                pbVar158 = pbVar158 + lVar138;
                puVar124 = (uint *)(pbVar158 + 0xc);
                puVar113 = (uint *)((long)puVar155 + lVar138 + 0xd);
                puVar113[-1] = *(uint *)(pbVar158 + 8);
                *(undefined8 *)(puVar113 + -3) = *(undefined8 *)pbVar158;
                goto LAB_01f4fa54;
              }
              if (puVar132[pbVar158[lVar138 + 0xd]] != '\0') {
                pbVar158 = pbVar158 + lVar138;
                puVar124 = (uint *)(pbVar158 + 0xd);
                uVar114 = *(undefined8 *)pbVar158;
                puVar113 = (uint *)((long)puVar155 + lVar138 + 0xe);
                *(undefined8 *)((long)puVar155 + lVar138 + 6) = *(undefined8 *)(pbVar158 + 5);
                *(undefined8 *)((long)puVar155 + lVar138 + 1) = uVar114;
                goto LAB_01f4fa54;
              }
              if (puVar132[pbVar158[lVar138 + 0xe]] != '\0') {
                pbVar158 = pbVar158 + lVar138;
                puVar124 = (uint *)(pbVar158 + 0xe);
                uVar114 = *(undefined8 *)pbVar158;
                puVar113 = (uint *)((long)puVar155 + lVar138 + 0xf);
                *(undefined8 *)((long)puVar155 + lVar138 + 7) = *(undefined8 *)(pbVar158 + 6);
                *(undefined8 *)((long)puVar155 + lVar138 + 1) = uVar114;
                goto LAB_01f4fa54;
              }
              if (puVar132[pbVar158[lVar138 + 0xf]] != '\0') {
                pbVar158 = pbVar158 + lVar138;
                puVar124 = (uint *)(pbVar158 + 0xf);
                uVar114 = *(undefined8 *)pbVar158;
                puVar113 = (uint *)((long)puVar155 + lVar138 + 0x10);
                *(undefined8 *)((long)puVar155 + lVar138 + 8) = *(undefined8 *)(pbVar158 + 7);
                *(undefined8 *)((long)puVar155 + lVar138 + 1) = uVar114;
                goto LAB_01f4fa54;
              }
              uVar114 = *(undefined8 *)(puVar124 + 2);
              *(undefined8 *)puVar113 = *(undefined8 *)puVar124;
              *(undefined8 *)((long)puVar155 + lVar138 + 9) = uVar114;
              lVar138 = lVar138 + 0x10;
              lVar140 = lVar140 + -0x10;
            }
LAB_01f4f75a:
            if (3 < lVar140) {
              if (puVar132[(byte)*puVar124] == '\0') {
                if (puVar132[*(byte *)((long)puVar124 + 1)] == '\0') {
                  if (puVar132[*(byte *)((long)puVar124 + 2)] == '\0') {
                    if (puVar132[*(byte *)((long)puVar124 + 3)] == '\0') goto code_r0x01f4f797;
LAB_01f4fa2e:
                    *(byte *)((long)puVar113 + 2) = *(byte *)((long)puVar124 + 2);
                    *(ushort *)puVar113 = (ushort)*puVar124;
                    puVar113 = (uint *)((long)puVar113 + 3);
                    puVar124 = (uint *)((long)puVar124 + 3);
                  }
                  else {
LAB_01f4fa17:
                    *(ushort *)puVar113 = (ushort)*puVar124;
                    puVar113 = (uint *)((long)puVar113 + 2);
                    puVar124 = (uint *)((long)puVar124 + 2);
                  }
                }
                else {
                  bVar156 = (byte)*puVar124;
LAB_01f4fa06:
                  *(byte *)puVar113 = bVar156;
                  puVar113 = (uint *)((long)puVar113 + 1);
                  puVar124 = (uint *)((long)puVar124 + 1);
                }
              }
              goto LAB_01f4fa54;
            }
            goto LAB_01f4f7b0;
          }
          *(byte *)puVar155 = 0x22;
          pbVar112 = (byte *)((long)puVar155 + 1);
          for (uVar103 = uVar126; 0xf < uVar103; uVar103 = uVar103 - 0x10) {
            uVar114 = *(undefined8 *)(pbVar158 + 8);
            *(undefined8 *)pbVar112 = *(undefined8 *)pbVar158;
            *(undefined8 *)(pbVar112 + 8) = uVar114;
            pbVar112 = pbVar112 + 0x10;
            pbVar158 = pbVar158 + 0x10;
          }
          for (uVar126 = uVar126 - (uVar123 >> 8 & 0xfffffffffffff0); 3 < uVar126;
              uVar126 = uVar126 - 4) {
            *(undefined4 *)pbVar112 = *(undefined4 *)pbVar158;
            pbVar112 = pbVar112 + 4;
            pbVar158 = pbVar158 + 4;
          }
          for (uVar123 = 0; uVar126 != uVar123; uVar123 = uVar123 + 1) {
            pbVar112[uVar123] = pbVar158[uVar123];
          }
          puVar113 = (uint *)(pbVar112 + uVar123);
switchD_01f4fa83_default:
          bVar163 = (~uVar133 & uVar120) == 0;
          *(byte *)puVar113 = 0x22;
          bVar156 = 0x3a;
          if (bVar163) {
            bVar156 = 0x2c;
          }
          *(byte *)((long)puVar113 + 1) = bVar156;
          bVar156 = 0x20;
          if (bVar163) {
            bVar156 = 10;
          }
          *(byte *)((long)puVar113 + 2) = bVar156;
          puVar155 = (uint *)((long)puVar113 + 3);
        }
        else if ((~(byte)uVar123 & 6) == 0) {
          if (0xff < uVar123) {
            local_40 = (ulong)(bVar156 == 7);
            if ((uVar133 & uVar120) != 0) {
              uVar161 = 0x20;
            }
            if (local_f8 <= (ulong *)(uVar161 + (long)puVar155)) {
              uVar106 = sVar135 >> 1;
              if (sVar135 >> 1 <= uVar161) {
                uVar106 = uVar161;
              }
              sVar159 = (uVar106 + 0xf & 0xfffffffffffffff0) + sVar135;
              pbVar158 = (byte *)(*p_Var7)(pvVar6,local_110,sVar135,sVar159);
              if (pbVar158 == (byte *)0x0) goto LAB_01f54af9;
              sVar125 = (long)local_b0 - (long)local_f8;
              memmove(pbVar158 + (sVar159 - sVar125),pbVar158 + ((long)local_f8 - (long)local_110),
                      sVar125);
              puVar155 = (uint *)(pbVar158 + ((long)puVar155 - (long)local_110));
              local_b0 = (ulong *)(pbVar158 + sVar159);
              sVar135 = sVar159;
              local_f8 = (ulong *)(pbVar158 + (sVar159 - sVar125));
              local_110 = (uint *)pbVar158;
            }
            local_f8[-2] = uVar108 + lVar153 * 2;
            local_f8[-1] = (ulong)local_80;
            local_f8 = local_f8 + -2;
            lVar153 = 0;
            if ((uVar133 & uVar120) == 0) {
              lVar153 = lVar150;
            }
            puVar155 = (uint *)((long)puVar155 + 2);
            while (bVar163 = lVar153 != 0, lVar153 = lVar153 + -1, bVar163) {
              ((ushort *)((long)puVar155 + -2))[0] = 0x2020;
              ((ushort *)((long)puVar155 + -2))[1] = 0x2020;
              puVar155 = (uint *)((long)puVar155 + lVar151);
            }
            lVar153 = (uVar123 >> 8) << (bVar156 == 7);
            *(byte *)((long)puVar155 + -2) = (bVar156 == 7) << 5 | 0x5b;
            *(byte *)((long)puVar155 + -1) = 10;
            uVar105 = (pyVar137->uni).u64;
            if (bVar156 == 7) {
              uVar105 = *(uint64_t *)(uVar105 + 0x10);
            }
            lVar150 = lVar150 + 1;
            pyVar136 = *(yyjson_mut_val **)(uVar105 + 0x10);
            local_80 = pyVar137;
            goto LAB_01f4f090;
          }
          uVar123 = 0x10;
          if ((uVar133 & uVar120) == 0) {
            uVar123 = uVar106;
          }
          if (local_f8 <= (ulong *)(uVar123 + (long)puVar155)) {
            uVar103 = sVar135 >> 1;
            if (sVar135 >> 1 <= uVar123) {
              uVar103 = uVar123;
            }
            sVar159 = (uVar103 + 0xf & 0xfffffffffffffff0) + sVar135;
            pbVar158 = (byte *)(*p_Var7)(pvVar6,local_110,sVar135,sVar159);
            if (pbVar158 == (byte *)0x0) goto LAB_01f54af9;
            sVar125 = (long)local_b0 - (long)local_f8;
            memmove(pbVar158 + (sVar159 - sVar125),pbVar158 + ((long)local_f8 - (long)local_110),
                    sVar125);
            puVar155 = (uint *)(pbVar158 + ((long)puVar155 - (long)local_110));
            local_b0 = (ulong *)(pbVar158 + sVar159);
            sVar135 = sVar159;
            local_f8 = (ulong *)(pbVar158 + (sVar159 - sVar125));
            local_110 = (uint *)pbVar158;
          }
          lVar138 = 0;
          if ((uVar133 & uVar120) == 0) {
            lVar138 = lVar150;
          }
          puVar155 = puVar155 + 1;
          while (bVar163 = lVar138 != 0, lVar138 = lVar138 + -1, bVar163) {
            puVar155[-1] = 0x20202020;
            puVar155 = (uint *)((long)puVar155 + lVar151);
          }
          bVar156 = (bVar156 == 7) * ' ';
          *(byte *)(puVar155 + -1) = bVar156 + 0x5b;
          *(byte *)((long)puVar155 + -3) = bVar156 | 0x5d;
          *(ushort *)((long)puVar155 + -2) = 0xa2c;
        }
        else if (bVar156 == 1) {
          uVar123 = uVar123 >> 8;
          pvVar8 = (pyVar137->uni).ptr;
          if (local_f8 <= (ulong *)((long)puVar155 + uVar123 + 3)) {
            uVar103 = sVar135 >> 1;
            if (sVar135 >> 1 <= uVar123 + 3) {
              uVar103 = uVar123 + 3;
            }
            sVar159 = (uVar103 + 0xf & 0xfffffffffffffff0) + sVar135;
            pbVar158 = (byte *)(*p_Var7)(pvVar6,local_110,sVar135,sVar159);
            if (pbVar158 == (byte *)0x0) goto LAB_01f54af9;
            sVar125 = (long)local_b0 - (long)local_f8;
            memmove(pbVar158 + (sVar159 - sVar125),pbVar158 + ((long)local_f8 - (long)local_110),
                    sVar125);
            puVar155 = (uint *)(pbVar158 + ((long)puVar155 - (long)local_110));
            local_b0 = (ulong *)(pbVar158 + sVar159);
            local_f8 = (ulong *)(pbVar158 + (sVar159 - sVar125));
            sVar135 = sVar159;
            local_110 = (uint *)pbVar158;
          }
          switchD_01939fa4::default(puVar155,pvVar8,uVar123);
          pbVar158 = (byte *)((long)puVar155 + uVar123);
          puVar155 = (uint *)(pbVar158 + 2);
          pbVar158[0] = 0x2c;
          pbVar158[1] = 10;
        }
        else if (bVar156 == 2) {
          uVar123 = 0x10;
          if ((uVar133 & uVar120) == 0) {
            uVar123 = uVar106;
          }
          if (local_f8 <= (ulong *)(uVar123 + (long)puVar155)) {
            uVar103 = sVar135 >> 1;
            if (sVar135 >> 1 <= uVar123) {
              uVar103 = uVar123;
            }
            sVar159 = (uVar103 + 0xf & 0xfffffffffffffff0) + sVar135;
            pbVar158 = (byte *)(*p_Var7)(pvVar6,local_110,sVar135,sVar159);
            if (pbVar158 == (byte *)0x0) goto LAB_01f54af9;
            sVar125 = (long)local_b0 - (long)local_f8;
            memmove(pbVar158 + (sVar159 - sVar125),pbVar158 + ((long)local_f8 - (long)local_110),
                    sVar125);
            puVar155 = (uint *)(pbVar158 + ((long)puVar155 - (long)local_110));
            local_b0 = (ulong *)(pbVar158 + sVar159);
            sVar135 = sVar159;
            local_f8 = (ulong *)(pbVar158 + (sVar159 - sVar125));
            local_110 = (uint *)pbVar158;
          }
          lVar138 = 0;
          if ((uVar133 & uVar120) == 0) {
            lVar138 = lVar150;
          }
          puVar155 = (uint *)((long)puVar155 + 6);
          while (bVar163 = lVar138 != 0, lVar138 = lVar138 + -1, bVar163) {
            ((ushort *)((long)puVar155 + -6))[0] = 0x2020;
            ((ushort *)((long)puVar155 + -6))[1] = 0x2020;
            puVar155 = (uint *)((long)puVar155 + lVar151);
          }
          puVar154 = (ushort *)((long)puVar155 + -6);
          puVar154[0] = 0x756e;
          puVar154[1] = 0x6c6c;
          puVar154[2] = 0xa2c;
          puVar154[3] = 0;
        }
        else {
          if (bVar156 != 3) goto LAB_01f54b51;
          uVar123 = 0x10;
          if ((uVar133 & uVar120) == 0) {
            uVar123 = uVar106;
          }
          if (local_f8 <= (ulong *)(uVar123 + (long)puVar155)) {
            uVar103 = sVar135 >> 1;
            if (sVar135 >> 1 <= uVar123) {
              uVar103 = uVar123;
            }
            sVar159 = (uVar103 + 0xf & 0xfffffffffffffff0) + sVar135;
            pbVar158 = (byte *)(*p_Var7)(pvVar6,local_110,sVar135,sVar159);
            if (pbVar158 == (byte *)0x0) goto LAB_01f54af9;
            sVar125 = (long)local_b0 - (long)local_f8;
            memmove(pbVar158 + (sVar159 - sVar125),pbVar158 + ((long)local_f8 - (long)local_110),
                    sVar125);
            puVar155 = (uint *)(pbVar158 + ((long)puVar155 - (long)local_110));
            local_b0 = (ulong *)(pbVar158 + sVar159);
            sVar135 = sVar159;
            local_f8 = (ulong *)(pbVar158 + (sVar159 - sVar125));
            local_110 = (uint *)pbVar158;
          }
          lVar138 = 0;
          if ((uVar133 & uVar120) == 0) {
            lVar138 = lVar150;
          }
          pbVar158 = (byte *)((long)puVar155 + 7);
          while (bVar163 = lVar138 != 0, lVar138 = lVar138 + -1, bVar163) {
            pbVar158[-7] = 0x20;
            pbVar158[-6] = 0x20;
            pbVar158[-5] = 0x20;
            pbVar158[-4] = 0x20;
            pbVar158 = pbVar158 + lVar151;
          }
          bVar163 = (pyVar137->tag & 0x18) != 0;
          uVar114 = 0xa2c65736c6166;
          if (bVar163) {
            uVar114 = 0xa2c65757274;
          }
          *(undefined8 *)(pbVar158 + -7) = uVar114;
          puVar155 = (uint *)(pbVar158 + -(ulong)bVar163);
        }
        lVar153 = lVar153 + -1;
        sVar159 = sVar135;
        lVar138 = lVar150;
        if (lVar153 == 0) goto LAB_01f51f77;
        pyVar137 = pyVar137->next;
        goto LAB_01f4f0c6;
      }
    }
    local_110 = (uint *)0x0;
LAB_01f54af9:
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar118 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar118 = err;
    }
    pyVar119->code = 2;
    pyVar118->msg = "memory allocation failed";
    goto LAB_01f54b37;
  }
  if ((flg & 2) == 0) {
    puVar160 = enc_table_cpy_slash;
    if ((flg & 4) == 0) {
      puVar160 = enc_table_cpy;
    }
    switch(bVar156 & 7) {
    case 0:
      goto switchD_01f4ef76_caseD_0;
    case 1:
switchD_01f4ef76_caseD_1:
      uVar107 = uVar107 >> 8;
      pvVar8 = (val->uni).ptr;
      local_110 = (uint *)(*p_Var4)(pvVar6,uVar107 + 2);
      if (local_110 != (uint *)0x0) {
        switchD_01939fa4::default(local_110,pvVar8,uVar107);
        puVar155 = (uint *)((long)local_110 + uVar107);
        goto LAB_01f565ec;
      }
      break;
    case 2:
switchD_01f4ef76_caseD_2:
      puVar155 = (uint *)(*p_Var4)(pvVar6,8);
      if (puVar155 != (uint *)0x0) {
        puVar155[0] = 0x6c6c756e;
        puVar155[1] = 0xa2c;
        local_110 = puVar155;
LAB_01f54d2f:
        puVar155 = puVar155 + 1;
        goto LAB_01f565ec;
      }
      break;
    case 3:
switchD_01f4ef76_caseD_3:
      local_110 = (uint *)(*p_Var4)(pvVar6,8);
      if (local_110 != (uint *)0x0) {
        bVar163 = (val->tag & 0x18) != 0;
        uVar114 = 0xa2c65736c6166;
        if (bVar163) {
          uVar114 = 0xa2c65757274;
        }
        *(undefined8 *)local_110 = uVar114;
        puVar155 = (uint *)((long)local_110 + (5 - (ulong)bVar163));
        goto LAB_01f565ec;
      }
      break;
    case 4:
switchD_01f4ef76_caseD_4:
      local_110 = (uint *)(*p_Var4)(pvVar6,0x22);
      if (local_110 != (uint *)0x0) {
        pcVar109 = (char *)(val->uni).u64;
        uVar120 = (uint)((ulong)pcVar109 >> 0x20);
        if ((val->tag & 0x10) == 0) {
          uVar120 = uVar120 >> 0x1f & (uint)(val->tag >> 3);
          pcVar117 = (char *)-(long)pcVar109;
          if (uVar120 == 0) {
            pcVar117 = pcVar109;
          }
          *(byte *)local_110 = 0x2d;
          pbVar158 = (byte *)((long)local_110 + (ulong)uVar120);
          if ((char *)0x5f5e0ff < pcVar117) {
            auVar25._8_8_ = 0;
            auVar25._0_8_ = pcVar117;
            lVar151 = SUB168(auVar25 / ZEXT816(100000000),0);
            pcVar109 = pcVar117 + lVar151 * 0xfa0a1f00;
            iVar141 = SUB164(auVar25 / ZEXT816(100000000),0);
            if ((char *)0x2386f26fc0ffff < pcVar117) {
              auVar26._8_8_ = 0;
              auVar26._0_8_ = pcVar117;
              lVar151 = SUB168(auVar26 / ZEXT816(1000000000000),0);
              iVar139 = SUB164(auVar26 / ZEXT816(1000000000000),0);
              iVar141 = iVar141 + iVar139 * -10000;
              if (pcVar117 < (char *)0xde0b6b3a7640000) {
                uVar107 = lVar151 * 0x68db9;
                iVar139 = (int)(uVar107 >> 0x20) * -10000 + iVar139;
                uVar120 = (uint)(iVar139 * 0x147b) >> 0x13;
                uVar161 = (ulong)(pcVar117 < (char *)0x16345785d8a0000);
                *(undefined2 *)pbVar158 =
                     *(undefined2 *)(digit_table + uVar161 + (uVar107 >> 0x20) * 2);
                *(undefined2 *)(pbVar158 + (2 - uVar161)) =
                     *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                *(undefined2 *)(pbVar158 + (4 - uVar161)) =
                     *(undefined2 *)(digit_table + (uVar120 * -100 + iVar139) * 2);
                lVar151 = 6 - uVar161;
              }
              else {
                uVar120 = (uint)((ulong)(lVar151 * 0x68db8bb) >> 0x20);
                uVar133 = uVar120 >> 8;
                iVar139 = uVar133 * -10000 + iVar139;
                uVar133 = uVar133 * 0x147b >> 0x13;
                uVar142 = (uint)(iVar139 * 0x147b) >> 0x13;
                uVar107 = (ulong)(pcVar117 < (char *)0x8ac7230489e80000);
                *(undefined2 *)pbVar158 =
                     *(undefined2 *)(digit_table + uVar107 + (ulong)uVar133 * 2);
                *(undefined2 *)(pbVar158 + (2 - uVar107)) =
                     *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                *(undefined2 *)(pbVar158 + (4 - uVar107)) =
                     *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                *(undefined2 *)(pbVar158 + (6 - uVar107)) =
                     *(undefined2 *)(digit_table + (uVar142 * -100 + iVar139) * 2);
                lVar151 = 8 - uVar107;
              }
              pbVar158 = pbVar158 + lVar151;
              uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
              *(undefined2 *)pbVar158 = *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
              *(undefined2 *)(pbVar158 + 2) =
                   *(undefined2 *)(digit_table + (uVar120 * 0x7fffff9c + iVar141) * 2);
              uVar120 = (uint)(((ulong)pcVar109 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar133 = uVar120 >> 8;
              iVar141 = uVar133 * -10000 + (int)pcVar109;
              uVar133 = uVar133 * 0x147b >> 0x13;
              uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
              *(undefined2 *)(pbVar158 + 4) = *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
              *(undefined2 *)(pbVar158 + 6) =
                   *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
              *(undefined2 *)(pbVar158 + 8) = *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
              *(undefined2 *)(pbVar158 + 10) =
                   *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar141) * 2);
              puVar155 = (uint *)(pbVar158 + 0xc);
              goto LAB_01f565ec;
            }
            if ("sertIJEEEvN9__gnu_cxx17__normal_iteratorIPS1_S3_EEDpOT_" <
                (char *)((ulong)pcVar117 >> 10)) {
              if ((ulong)pcVar117 >> 0xc < 0xe8d4a51) {
                uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                uVar107 = (ulong)((ulong)pcVar117 >> 0xb < 0x2e90edd);
                *(undefined2 *)pbVar158 =
                     *(undefined2 *)(digit_table + uVar107 + (ulong)uVar120 * 2);
                *(undefined2 *)(pbVar158 + (2 - uVar107)) =
                     *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                pbVar158 = pbVar158 + (4 - uVar107);
              }
              else if (pcVar117 < (char *)0x5af3107a4000) {
                iVar141 = (int)((ulong)(lVar151 * 0x68db9) >> 0x20) * -10000 + iVar141;
                uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                uVar107 = (ulong)((ulong)pcVar117 >> 0xd < 0x48c27395);
                *(undefined2 *)pbVar158 =
                     *(undefined2 *)
                      (digit_table + uVar107 + ((ulong)(lVar151 * 0x68db9) >> 0x20) * 2);
                *(undefined2 *)(pbVar158 + (2 - uVar107)) =
                     *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                *(undefined2 *)(pbVar158 + (4 - uVar107)) =
                     *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                pbVar158 = pbVar158 + (6 - uVar107);
              }
              else {
                uVar120 = (uint)((ulong)(lVar151 * 0x68db8bb) >> 0x20);
                uVar133 = uVar120 >> 8;
                iVar141 = uVar133 * -10000 + iVar141;
                uVar133 = uVar133 * 0x147b >> 0x13;
                uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
                uVar107 = (ulong)(pcVar117 < (char *)0x38d7ea4c68000);
                *(undefined2 *)pbVar158 =
                     *(undefined2 *)(digit_table + uVar107 + (ulong)uVar133 * 2);
                *(undefined2 *)(pbVar158 + (2 - uVar107)) =
                     *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                *(undefined2 *)(pbVar158 + (4 - uVar107)) =
                     *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                *(undefined2 *)(pbVar158 + (6 - uVar107)) =
                     *(undefined2 *)(digit_table + (uVar142 * -100 + iVar141) * 2);
                pbVar158 = pbVar158 + (8 - uVar107);
              }
            }
            else {
              *(undefined2 *)pbVar158 =
                   *(undefined2 *)
                    (digit_table + (ulong)(pcVar117 < (char *)0x3b9aca00) + lVar151 * 2);
              pbVar158 = pbVar158 + (2 - (ulong)(pcVar117 < (char *)0x3b9aca00));
            }
            uVar120 = (uint)(((ulong)pcVar109 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar133 = uVar120 >> 8;
            iVar141 = uVar133 * -10000 + (int)pcVar109;
            uVar133 = uVar133 * 0x147b >> 0x13;
            uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
            iVar141 = uVar142 * 0x7fffff9c + iVar141;
            *(undefined2 *)pbVar158 = *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
            *(undefined2 *)(pbVar158 + 2) =
                 *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
            uVar111 = *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
LAB_01f5653e:
            *(undefined2 *)(pbVar158 + 4) = uVar111;
            *(undefined2 *)(pbVar158 + 6) = *(undefined2 *)(digit_table + (uint)(iVar141 * 2));
            puVar155 = (uint *)(pbVar158 + 8);
            goto LAB_01f565ec;
          }
          if (pcVar117 < (char *)0x64) {
            *(undefined2 *)pbVar158 =
                 *(undefined2 *)(digit_table + (ulong)(pcVar117 < (char *)0xa) + (long)pcVar117 * 2)
            ;
            puVar155 = (uint *)(pbVar158 + -(ulong)(pcVar117 < (char *)0xa));
            goto LAB_01f54e3e;
          }
          iVar141 = (int)pcVar117;
          if ((char *)0x270f < pcVar117) {
            if (pcVar117 < (char *)0xf4240) {
              iVar141 = (int)((ulong)((long)pcVar117 * 0x68db9) >> 0x20) * -10000 + iVar141;
              uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
              uVar107 = (ulong)(pcVar117 < (char *)0x186a0);
              *(undefined2 *)pbVar158 =
                   *(undefined2 *)
                    (digit_table + uVar107 + ((ulong)((long)pcVar117 * 0x68db9) >> 0x20) * 2);
              *(undefined2 *)(pbVar158 + (2 - uVar107)) =
                   *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
              *(undefined2 *)(pbVar158 + (4 - uVar107)) =
                   *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
              puVar155 = (uint *)(pbVar158 + (6 - uVar107));
              goto LAB_01f565ec;
            }
            uVar120 = (uint)((ulong)((long)pcVar117 * 0x68db8bb) >> 0x20);
            uVar133 = uVar120 >> 8;
            iVar141 = uVar133 * -10000 + iVar141;
            uVar133 = uVar133 * 0x147b >> 0x13;
            uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
            iVar141 = uVar142 * -100 + iVar141;
            *(undefined2 *)pbVar158 =
                 *(undefined2 *)
                  (digit_table +
                  (ulong)(pcVar117 < "E_17_Hashtable_traitsILb1ELb0ELb1EEEE9_M_rehashEmRKm") +
                  (ulong)uVar133 * 2);
            pbVar158 = pbVar158 +
                       -(ulong)(pcVar117 < "E_17_Hashtable_traitsILb1ELb0ELb1EEEE9_M_rehashEmRKm");
            *(undefined2 *)(pbVar158 + 2) =
                 *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
            uVar111 = *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
            goto LAB_01f5653e;
          }
          uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
          *(undefined2 *)pbVar158 =
               *(undefined2 *)(digit_table + (ulong)(pcVar117 < (char *)0x3e8) + (ulong)uVar120 * 2)
          ;
          puVar155 = (uint *)(pbVar158 + -(ulong)(pcVar117 < (char *)0x3e8));
          *(ushort *)((long)puVar155 + 2) =
               *(ushort *)(digit_table + (uVar120 * -100 + iVar141) * 2);
          goto LAB_01f54d2f;
        }
        uVar107 = (ulong)pcVar109 & 0xfffffffffffff;
        uVar120 = uVar120 >> 0x14 & 0x7ff;
        if (uVar120 == 0x7ff) {
          if ((flg & 0x10) != 0) {
            *local_110 = 0x6c6c756e;
            puVar155 = local_110 + 1;
            goto LAB_01f565ec;
          }
          if ((flg & 8) != 0) {
            if (uVar107 == 0) {
              *(byte *)local_110 = 0x2d;
              lVar151 = -((long)pcVar109 >> 0x3f);
              *(undefined8 *)((long)local_110 + lVar151) = 0x7974696e69666e49;
              puVar155 = (uint *)((long)local_110 + lVar151 + 8);
            }
            else {
              *local_110 = 0x4e614e;
              puVar155 = (uint *)((long)local_110 + 3);
            }
            goto LAB_01f565ec;
          }
          (*p_Var5)(pvVar6,local_110);
          if (dat_len != (usize *)0x0) {
            *dat_len = 0;
          }
          pyVar118 = &dummy_err;
          if (err != (yyjson_write_err *)0x0) {
            pyVar118 = err;
          }
          pyVar119->code = 4;
          pcVar109 = "nan or inf number is not allowed";
          goto LAB_01f54e81;
        }
        *(byte *)local_110 = 0x2d;
        lVar151 = -((long)pcVar109 >> 0x3f);
        puVar130 = (undefined8 *)((long)local_110 + lVar151);
        if (((ulong)pcVar109 & 0x7fffffffffffffff) == 0) {
          *(undefined4 *)puVar130 = 0x302e30;
          puVar155 = (uint *)((long)puVar130 + 3);
          goto LAB_01f565ec;
        }
        if (uVar120 == 0) {
          uVar161 = (ulong)((uint)pcVar109 & 1);
          uVar107 = uVar107 * 0x20;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = uVar107 - 0x10;
          auVar100._8_8_ = 0;
          auVar100._0_8_ = SUB168(auVar61 * ZEXT816(0x6c07a2c26a8346d2),8);
          auVar62._8_8_ = 0;
          auVar62._0_8_ = uVar107 - 0x10;
          auVar100 = auVar62 * ZEXT816(0x9e19db92b4e31ba9) + auVar100;
          auVar63._8_8_ = 0;
          auVar63._0_8_ = uVar107;
          auVar101._8_8_ = 0;
          auVar101._0_8_ = SUB168(auVar63 * ZEXT816(0x6c07a2c26a8346d2),8);
          auVar64._8_8_ = 0;
          auVar64._0_8_ = uVar107;
          auVar101 = auVar64 * ZEXT816(0x9e19db92b4e31ba9) + auVar101;
          uVar106 = auVar101._8_8_;
          auVar65._8_8_ = 0;
          auVar65._0_8_ = uVar107 + 0x10;
          auVar102._8_8_ = 0;
          auVar102._0_8_ = SUB168(auVar65 * ZEXT816(0x6c07a2c26a8346d2),8);
          auVar66._8_8_ = 0;
          auVar66._0_8_ = uVar107 + 0x10;
          auVar102 = auVar66 * ZEXT816(0x9e19db92b4e31ba9) + auVar102;
          uVar107 = ((ulong)((auVar100 & (undefined1  [16])0xfffffffffffffffe) !=
                            (undefined1  [16])0x0) | auVar100._8_8_) + uVar161;
          uVar161 = ((ulong)((auVar102 & (undefined1  [16])0xfffffffffffffffe) !=
                            (undefined1  [16])0x0) | auVar102._8_8_) - uVar161;
          if (uVar106 < 0x28) {
LAB_01f56a2d:
            uVar108 = (auVar101 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0 |
                      uVar106;
            uVar123 = uVar106 & 0x7ffffffffffffffc;
            bVar163 = true;
            if (uVar108 <= (uVar123 | 2)) {
              bVar163 = (bool)((byte)((uVar106 & 0xffffffff) >> 2) & 0x3f & uVar108 == (uVar123 | 2)
                              );
            }
            uVar108 = uVar106 >> 2;
            bVar162 = uVar123 + 4 <= uVar161;
            if (uVar123 < uVar107 == bVar162) {
              bVar163 = bVar162;
            }
            iVar141 = -0x144;
          }
          else {
            uVar108 = uVar106 / 0x28;
            bVar163 = uVar108 * 0x28 + 0x28 <= uVar161;
            if (uVar108 * 0x28 < uVar107 != bVar163) goto LAB_01f56a2d;
            iVar141 = -0x143;
          }
          pcVar117 = (char *)(bVar163 + uVar108);
          pcVar109 = (char *)((long)puVar130 + 1);
          if (pcVar117 < (char *)0x38d7ea4c68000) {
            if (pcVar117 < (char *)0x5f5e100) {
              if (pcVar117 < (char *)0x64) {
                *(undefined2 *)pcVar109 =
                     *(undefined2 *)
                      (digit_table + (ulong)(pcVar117 < (char *)0xa) + (long)pcVar117 * 2);
                pcVar109 = pcVar109 + (2 - (ulong)(pcVar117 < (char *)0xa));
              }
              else {
                iVar139 = (int)pcVar117;
                if (pcVar117 < (char *)0x2710) {
                  uVar120 = (uint)(iVar139 * 0x147b) >> 0x13;
                  uVar107 = (ulong)(pcVar117 < (char *)0x3e8);
                  *(undefined2 *)pcVar109 =
                       *(undefined2 *)(digit_table + uVar107 + (ulong)uVar120 * 2);
                  *(undefined2 *)(pcVar109 + (2 - uVar107)) =
                       *(undefined2 *)(digit_table + (uVar120 * -100 + iVar139) * 2);
                  pcVar109 = pcVar109 + (4 - uVar107);
                }
                else {
                  if ((char *)0xf423f < pcVar117) {
                    uVar120 = (uint)((ulong)((long)pcVar117 * 0x68db8bb) >> 0x20);
                    uVar133 = uVar120 >> 8;
                    iVar139 = uVar133 * -10000 + iVar139;
                    uVar133 = uVar133 * 0x147b >> 0x13;
                    uVar142 = (uint)(iVar139 * 0x147b) >> 0x13;
                    iVar139 = uVar142 * -100 + iVar139;
                    *(undefined2 *)pcVar109 =
                         *(undefined2 *)
                          (digit_table +
                          (ulong)(pcVar117 < "E_17_Hashtable_traitsILb1ELb0ELb1EEEE9_M_rehashEmRKm")
                          + (ulong)uVar133 * 2);
                    pcVar109 = pcVar109 +
                               -(ulong)(pcVar117 <
                                       "E_17_Hashtable_traitsILb1ELb0ELb1EEEE9_M_rehashEmRKm");
                    *(undefined2 *)(pcVar109 + 2) =
                         *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                    uVar111 = *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                    goto LAB_01f56f71;
                  }
                  iVar139 = (int)((ulong)((long)pcVar117 * 0x68db9) >> 0x20) * -10000 + iVar139;
                  uVar120 = (uint)(iVar139 * 0x147b) >> 0x13;
                  uVar107 = (ulong)(pcVar117 < (char *)0x186a0);
                  *(undefined2 *)pcVar109 =
                       *(undefined2 *)
                        (digit_table + uVar107 + ((ulong)((long)pcVar117 * 0x68db9) >> 0x20) * 2);
                  *(undefined2 *)(pcVar109 + (2 - uVar107)) =
                       *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                  *(undefined2 *)(pcVar109 + (4 - uVar107)) =
                       *(undefined2 *)(digit_table + (uVar120 * -100 + iVar139) * 2);
                  pcVar109 = pcVar109 + (6 - uVar107);
                }
              }
            }
            else {
              auVar30._8_8_ = 0;
              auVar30._0_8_ = pcVar117;
              lVar151 = SUB168(auVar30 / ZEXT816(100000000),0);
              if ("sertIJEEEvN9__gnu_cxx17__normal_iteratorIPS1_S3_EEDpOT_" <
                  (char *)((ulong)pcVar117 >> 10)) {
                iVar139 = SUB164(auVar30 / ZEXT816(100000000),0);
                if ((ulong)pcVar117 >> 0xc < 0xe8d4a51) {
                  uVar120 = (uint)(iVar139 * 0x147b) >> 0x13;
                  uVar107 = (ulong)((ulong)pcVar117 >> 0xb < 0x2e90edd);
                  *(undefined2 *)pcVar109 =
                       *(undefined2 *)(digit_table + uVar107 + (ulong)uVar120 * 2);
                  *(undefined2 *)(pcVar109 + (2 - uVar107)) =
                       *(undefined2 *)(digit_table + (uVar120 * -100 + iVar139) * 2);
                  pcVar109 = pcVar109 + (4 - uVar107);
                }
                else if (pcVar117 < (char *)0x5af3107a4000) {
                  iVar139 = (int)((ulong)(lVar151 * 0x68db9) >> 0x20) * -10000 + iVar139;
                  uVar120 = (uint)(iVar139 * 0x147b) >> 0x13;
                  uVar107 = (ulong)((ulong)pcVar117 >> 0xd < 0x48c27395);
                  *(undefined2 *)pcVar109 =
                       *(undefined2 *)
                        (digit_table + uVar107 + ((ulong)(lVar151 * 0x68db9) >> 0x20) * 2);
                  *(undefined2 *)(pcVar109 + (2 - uVar107)) =
                       *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                  *(undefined2 *)(pcVar109 + (4 - uVar107)) =
                       *(undefined2 *)(digit_table + (uVar120 * -100 + iVar139) * 2);
                  pcVar109 = pcVar109 + (6 - uVar107);
                }
                else {
                  uVar120 = (uint)((ulong)(lVar151 * 0x68db8bb) >> 0x20);
                  uVar133 = uVar120 >> 8;
                  iVar139 = uVar133 * -10000 + iVar139;
                  uVar133 = uVar133 * 0x147b >> 0x13;
                  uVar142 = (uint)(iVar139 * 0x147b) >> 0x13;
                  *(undefined2 *)((long)puVar130 + 1) =
                       *(undefined2 *)(digit_table + (ulong)uVar133 * 2 + 1);
                  *(undefined2 *)((long)puVar130 + 2) =
                       *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                  *(undefined2 *)((long)puVar130 + 4) =
                       *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                  *(undefined2 *)((long)puVar130 + 6) =
                       *(undefined2 *)(digit_table + (uVar142 * -100 + iVar139) * 2);
                  pcVar109 = (char *)(puVar130 + 1);
                }
              }
              else {
                *(undefined2 *)pcVar109 =
                     *(undefined2 *)
                      (digit_table + (ulong)(pcVar117 < (char *)0x3b9aca00) + lVar151 * 2);
                pcVar109 = pcVar109 + (2 - (ulong)(pcVar117 < (char *)0x3b9aca00));
              }
              uVar120 = (uint)(((ulong)(pcVar117 + lVar151 * 0xfa0a1f00) & 0xffffffff) * 0x68db8bb
                              >> 0x20);
              uVar133 = uVar120 >> 8;
              iVar139 = uVar133 * -10000 + (int)(pcVar117 + lVar151 * 0xfa0a1f00);
              uVar133 = uVar133 * 0x147b >> 0x13;
              uVar142 = (uint)(iVar139 * 0x147b) >> 0x13;
              iVar139 = uVar142 * 0x7fffff9c + iVar139;
              *(undefined2 *)pcVar109 = *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
              *(undefined2 *)(pcVar109 + 2) =
                   *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
              uVar111 = *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
LAB_01f56f71:
              *(undefined2 *)(pcVar109 + 4) = uVar111;
              *(undefined2 *)(pcVar109 + 6) = *(undefined2 *)(digit_table + (uint)(iVar139 * 2));
              pcVar109 = pcVar109 + 8;
            }
          }
          else {
            auVar29._8_8_ = 0;
            auVar29._0_8_ = pcVar117;
            uVar107 = SUB168(auVar29 / ZEXT816(10000000000000000),0) * 0xfa0a1f00 +
                      (ulong)pcVar117 / 100000000;
            *pcVar109 = SUB161(auVar29 / ZEXT816(10000000000000000),0) + '0';
            pcVar109 = pcVar109 + ((char *)0x2386f26fc0ffff < pcVar117);
            uVar120 = (uint)((uVar107 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar133 = uVar120 >> 8;
            iVar139 = uVar133 * -10000 + (int)uVar107;
            uVar133 = uVar133 * 0x147b >> 0x13;
            uVar142 = (uint)(iVar139 * 0x147b) >> 0x13;
            *(undefined2 *)pcVar109 = *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
            *(undefined2 *)(pcVar109 + 2) =
                 *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
            *(undefined2 *)(pcVar109 + 4) = *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
            *(undefined2 *)(pcVar109 + 6) =
                 *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar139) * 2);
            uVar120 = (uint)(((ulong)(pcVar117 + ((ulong)pcVar117 / 100000000) * 0xfa0a1f00) &
                             0xffffffff) * 0x68db8bb >> 0x20);
            uVar133 = uVar120 >> 8;
            iVar139 = uVar133 * -10000 +
                      (int)(pcVar117 + ((ulong)pcVar117 / 100000000) * 0xfa0a1f00);
            uVar133 = uVar133 * 0x147b >> 0x13;
            uVar142 = (uint)(iVar139 * 0x147b) >> 0x13;
            *(undefined2 *)(pcVar109 + 8) = *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
            *(undefined2 *)(pcVar109 + 10) =
                 *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
            *(undefined2 *)(pcVar109 + 0xc) = *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
            *(undefined2 *)(pcVar109 + 0xe) =
                 *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar139) * 2);
            pcVar109 = pcVar109 + 0x10;
          }
          *(undefined1 *)puVar130 = *(undefined1 *)((long)puVar130 + 1);
          *(undefined1 *)((long)puVar130 + 1) = 0x2e;
          lVar151 = 0;
          do {
            lVar153 = lVar151 + -1;
            lVar151 = lVar151 + -1;
          } while (pcVar109[lVar153] == '0');
          iVar141 = ((int)pcVar109 - (int)puVar130) + iVar141 + -2;
          pcVar109 = pcVar109 + lVar151 + (ulong)(pcVar109[lVar153] != '.');
          puVar155 = (uint *)(pcVar109 + 5);
          pcVar109[0] = 'e';
          pcVar109[1] = '-';
          uVar120 = iVar141 * -0x290;
          pcVar109[2] = (char)(uVar120 >> 0x10) + '0';
          *(undefined2 *)(pcVar109 + 3) =
               *(undefined2 *)(digit_table + ((uVar120 >> 0x10) * 0x7fffff9c - iVar141) * 2);
          goto LAB_01f565ec;
        }
        uVar161 = uVar107 + 0x10000000000000;
        if (uVar120 - 0x3ff < 0x35) {
          lVar153 = 0;
          if (uVar161 != 0) {
            for (; (uVar161 >> lVar153 & 1) == 0; lVar153 = lVar153 + 1) {
            }
          }
          if (0x433 - uVar120 <= (uint)lVar153) {
            pcVar109 = (char *)(uVar161 >> ((byte)(0x433 - uVar120) & 0x3f));
            if (pcVar109 < (char *)0x5f5e100) {
              if (pcVar109 < (char *)0x64) {
                *(undefined2 *)puVar130 =
                     *(undefined2 *)
                      (digit_table + (ulong)(pcVar109 < (char *)0xa) + (long)pcVar109 * 2);
                puVar155 = (uint *)((long)puVar130 + (2 - (ulong)(pcVar109 < (char *)0xa)));
              }
              else {
                iVar141 = (int)pcVar109;
                if (pcVar109 < (char *)0x2710) {
                  uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                  uVar107 = (ulong)(pcVar109 < (char *)0x3e8);
                  *(undefined2 *)puVar130 =
                       *(undefined2 *)(digit_table + uVar107 + (ulong)uVar120 * 2);
                  *(undefined2 *)((long)puVar130 + (2 - uVar107)) =
                       *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                  puVar155 = (uint *)((long)puVar130 + (4 - uVar107));
                }
                else if (pcVar109 < (char *)0xf4240) {
                  iVar141 = (int)((ulong)((long)pcVar109 * 0x68db9) >> 0x20) * -10000 + iVar141;
                  uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                  uVar107 = (ulong)(pcVar109 < (char *)0x186a0);
                  *(undefined2 *)puVar130 =
                       *(undefined2 *)
                        (digit_table + uVar107 + ((ulong)((long)pcVar109 * 0x68db9) >> 0x20) * 2);
                  *(undefined2 *)((long)puVar130 + (2 - uVar107)) =
                       *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                  *(undefined2 *)((long)puVar130 + (4 - uVar107)) =
                       *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                  puVar155 = (uint *)((long)puVar130 + (6 - uVar107));
                }
                else {
                  uVar120 = (uint)((ulong)((long)pcVar109 * 0x68db8bb) >> 0x20);
                  uVar133 = uVar120 >> 8;
                  iVar141 = uVar133 * -10000 + iVar141;
                  uVar133 = uVar133 * 0x147b >> 0x13;
                  uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
                  uVar107 = (ulong)(pcVar109 <
                                   "E_17_Hashtable_traitsILb1ELb0ELb1EEEE9_M_rehashEmRKm");
                  *(undefined2 *)puVar130 =
                       *(undefined2 *)(digit_table + uVar107 + (ulong)uVar133 * 2);
                  *(undefined2 *)((long)puVar130 + (2 - uVar107)) =
                       *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                  *(undefined2 *)((long)puVar130 + (4 - uVar107)) =
                       *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                  *(undefined2 *)((long)puVar130 + (6 - uVar107)) =
                       *(undefined2 *)(digit_table + (uVar142 * -100 + iVar141) * 2);
                  puVar155 = (uint *)((long)puVar130 + (8 - uVar107));
                }
              }
            }
            else {
              auVar28._8_8_ = 0;
              auVar28._0_8_ = pcVar109;
              lVar151 = SUB168(auVar28 / ZEXT816(100000000),0);
              if ("sertIJEEEvN9__gnu_cxx17__normal_iteratorIPS1_S3_EEDpOT_" <
                  (char *)((ulong)pcVar109 >> 10)) {
                iVar141 = SUB164(auVar28 / ZEXT816(100000000),0);
                if ((ulong)pcVar109 >> 0xc < 0xe8d4a51) {
                  uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                  uVar107 = (ulong)((ulong)pcVar109 >> 0xb < 0x2e90edd);
                  *(undefined2 *)puVar130 =
                       *(undefined2 *)(digit_table + uVar107 + (ulong)uVar120 * 2);
                  *(undefined2 *)((long)puVar130 + (2 - uVar107)) =
                       *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                  puVar143 = (undefined2 *)((long)puVar130 + (4 - uVar107));
                }
                else if (pcVar109 < (char *)0x5af3107a4000) {
                  iVar141 = (int)((ulong)(lVar151 * 0x68db9) >> 0x20) * -10000 + iVar141;
                  uVar120 = (uint)(iVar141 * 0x147b) >> 0x13;
                  uVar107 = (ulong)((ulong)pcVar109 >> 0xd < 0x48c27395);
                  *(undefined2 *)puVar130 =
                       *(undefined2 *)
                        (digit_table + uVar107 + ((ulong)(lVar151 * 0x68db9) >> 0x20) * 2);
                  *(undefined2 *)((long)puVar130 + (2 - uVar107)) =
                       *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                  *(undefined2 *)((long)puVar130 + (4 - uVar107)) =
                       *(undefined2 *)(digit_table + (uVar120 * -100 + iVar141) * 2);
                  puVar143 = (undefined2 *)((long)puVar130 + (6 - uVar107));
                }
                else {
                  uVar120 = (uint)((ulong)(lVar151 * 0x68db8bb) >> 0x20);
                  uVar133 = uVar120 >> 8;
                  iVar141 = uVar133 * -10000 + iVar141;
                  uVar133 = uVar133 * 0x147b >> 0x13;
                  uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
                  uVar107 = (ulong)(pcVar109 < (char *)0x38d7ea4c68000);
                  *(undefined2 *)puVar130 =
                       *(undefined2 *)(digit_table + uVar107 + (ulong)uVar133 * 2);
                  *(undefined2 *)((long)puVar130 + (2 - uVar107)) =
                       *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
                  *(undefined2 *)((long)puVar130 + (4 - uVar107)) =
                       *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
                  *(undefined2 *)((long)puVar130 + (6 - uVar107)) =
                       *(undefined2 *)(digit_table + (uVar142 * -100 + iVar141) * 2);
                  puVar143 = (undefined2 *)((long)puVar130 + (8 - uVar107));
                }
              }
              else {
                *(undefined2 *)puVar130 =
                     *(undefined2 *)
                      (digit_table + (ulong)(pcVar109 < (char *)0x3b9aca00) + lVar151 * 2);
                puVar143 = (undefined2 *)
                           ((long)puVar130 + (2 - (ulong)(pcVar109 < (char *)0x3b9aca00)));
              }
              uVar120 = (uint)(((ulong)(pcVar109 + lVar151 * 0xfa0a1f00) & 0xffffffff) * 0x68db8bb
                              >> 0x20);
              uVar133 = uVar120 >> 8;
              iVar141 = uVar133 * -10000 + (int)(pcVar109 + lVar151 * 0xfa0a1f00);
              uVar133 = uVar133 * 0x147b >> 0x13;
              uVar142 = (uint)(iVar141 * 0x147b) >> 0x13;
              *puVar143 = *(undefined2 *)(digit_table + (ulong)uVar133 * 2);
              puVar143[1] = *(undefined2 *)(digit_table + (uVar133 * -100 + (uVar120 >> 8)) * 2);
              puVar143[2] = *(undefined2 *)(digit_table + (ulong)uVar142 * 2);
              puVar143[3] = *(undefined2 *)(digit_table + (uVar142 * 0x7fffff9c + iVar141) * 2);
              puVar155 = (uint *)(puVar143 + 4);
            }
            *(ushort *)puVar155 = 0x302e;
            goto LAB_01f54e3e;
          }
        }
        uVar106 = (ulong)((uint)pcVar109 & 1);
        iVar141 = uVar120 * 0x4d105 + -0x200a5;
        if (uVar120 == 1 || uVar107 != 0) {
          iVar141 = uVar120 * 0x4d105;
        }
        iVar141 = iVar141 + -0x1439b7ff >> 0x14;
        uVar108 = *(ulong *)(pow10_sig_table + (ulong)(iVar141 * -2 + 0x2ae) * 8);
        uVar123 = *(long *)(pow10_sig_table + (ulong)(iVar141 * -2 + 0x2af) * 8) +
                  (ulong)(iVar141 - 1U < 0xffffffc8);
        bVar156 = ((char)((uint)(iVar141 * -0x3526b) >> 0x10) + (char)uVar120) - 0x32;
        uVar107 = (ulong)(uVar120 != 1 && uVar107 == 0) + uVar161 * 4 + -2 << (bVar156 & 0x3f);
        auVar55._8_8_ = 0;
        auVar55._0_8_ = uVar123;
        auVar79._8_8_ = 0;
        auVar79._0_8_ = uVar107;
        auVar97._8_8_ = 0;
        auVar97._0_8_ = SUB168(auVar55 * auVar79,8);
        auVar56._8_8_ = 0;
        auVar56._0_8_ = uVar108;
        auVar80._8_8_ = 0;
        auVar80._0_8_ = uVar107;
        auVar97 = auVar56 * auVar80 + auVar97;
        uVar107 = uVar161 * 4 << (bVar156 & 0x3f);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = uVar123;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = uVar107;
        auVar98._8_8_ = 0;
        auVar98._0_8_ = SUB168(auVar57 * auVar81,8);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = uVar108;
        auVar82._8_8_ = 0;
        auVar82._0_8_ = uVar107;
        auVar98 = auVar58 * auVar82 + auVar98;
        uVar107 = auVar98._8_8_;
        uVar161 = uVar161 * 4 + 2 << (bVar156 & 0x3f);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = uVar123;
        auVar83._8_8_ = 0;
        auVar83._0_8_ = uVar161;
        auVar99._8_8_ = 0;
        auVar99._0_8_ = SUB168(auVar59 * auVar83,8);
        auVar60._8_8_ = 0;
        auVar60._0_8_ = uVar108;
        auVar84._8_8_ = 0;
        auVar84._0_8_ = uVar161;
        auVar99 = auVar60 * auVar84 + auVar99;
        uVar161 = ((ulong)((auVar97 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0
                          ) | auVar97._8_8_) + uVar106;
        uVar106 = ((ulong)((auVar99 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0
                          ) | auVar99._8_8_) - uVar106;
        if (uVar107 < 0x28) {
LAB_01f5508d:
          uVar123 = (auVar98 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0 |
                    uVar107;
          uVar108 = uVar107 & 0xfffffffffffffffc;
          bVar163 = true;
          if (uVar123 <= uVar108 + 2) {
            bVar163 = (bool)((byte)(uVar107 >> 2) & 0x3f & uVar123 == uVar108 + 2);
          }
          bVar162 = uVar108 + 4 <= uVar106;
          if (uVar108 < uVar161 == bVar162) {
            bVar163 = bVar162;
          }
          uVar107 = (uVar107 >> 2) + (ulong)bVar163;
        }
        else {
          uVar123 = (uVar107 / 0x28) * 0x28;
          uVar108 = uVar123 + 0x28;
          if (uVar123 < uVar161 != uVar108 <= uVar106) goto LAB_01f5508d;
          uVar107 = (uVar107 / 0x28 + 1) - (ulong)(uVar106 < uVar108);
          iVar141 = iVar141 + 1;
        }
        iVar149 = (0x11 - (uint)(uVar107 < 10000000000000000)) - (uint)(uVar107 < 1000000000000000);
        uVar142 = iVar149 + iVar141;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = uVar107;
        uVar161 = SUB168(auVar27 / ZEXT816(100000000),0);
        uVar107 = uVar161 * 0xfa0a1f00 + uVar107;
        uVar161 = (uVar161 & 0xffffffff) / 10000;
        iVar139 = (int)uVar161;
        uVar133 = SUB164(auVar27 / ZEXT816(100000000),0);
        iVar121 = iVar139 * -10000 + uVar133;
        iVar147 = (int)(uVar161 * 0x28f5d >> 0x18);
        uVar120 = (uint)(iVar147 * 0x29) >> 0xc;
        uVar152 = uVar120 * -100 + iVar147;
        uVar148 = iVar147 * -100 + iVar139;
        cVar131 = (char)uVar120 + '0';
        iVar139 = (int)uVar107;
        if (iVar149 + iVar141 + 5U < 0x1b) {
          if ((int)uVar142 < 1) {
            puVar143 = (undefined2 *)
                       ((long)puVar130 + (((ulong)(2 - uVar142) + 1) - (ulong)(uVar133 < 100000000))
                       );
            *(char *)((long)puVar130 + (ulong)(2 - uVar142)) = cVar131;
            uVar161 = (ulong)(uVar152 < 10 && uVar133 < 100000000);
            *puVar143 = *(undefined2 *)(digit_table + uVar161 + uVar152 * 2);
            *(undefined2 *)((long)puVar143 + (2 - uVar161)) =
                 *(undefined2 *)(digit_table + uVar148 * 2);
            if (iVar139 == 0) {
              if (iVar121 == 0) {
                uVar107 = 0;
                if (uVar148 == 0) {
                  uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar152];
                }
                uVar107 = 4 - (uVar107 + (byte)dec_trailing_zero_table[uVar148]);
              }
              else {
                uVar120 = (uint)(iVar121 * 0x147b) >> 0x13;
                uVar133 = uVar120 * -100 + iVar121;
                *(undefined2 *)((long)puVar143 + (4 - uVar161)) =
                     *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                *(undefined2 *)((long)puVar143 + (6 - uVar161)) =
                     *(undefined2 *)(digit_table + uVar133 * 2);
                uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar120] + 2;
                if (uVar133 != 0) {
                  uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar133];
                }
                uVar107 = 8 - uVar107;
              }
            }
            else {
              uVar148 = (uint)(iVar121 * 0x147b) >> 0x13;
              uVar120 = (uint)((uVar107 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar152 = uVar120 >> 8;
              uVar133 = uVar152 * 0x147b >> 0x13;
              uVar107 = (ulong)uVar133;
              uVar120 = uVar133 * -100 + (uVar120 >> 8);
              *(undefined2 *)((long)puVar143 + (4 - uVar161)) =
                   *(undefined2 *)(digit_table + (ulong)uVar148 * 2);
              *(undefined2 *)((long)puVar143 + (6 - uVar161)) =
                   *(undefined2 *)(digit_table + (uVar148 * 0x7fffff9c + iVar121) * 2);
              *(undefined2 *)((long)puVar143 + (8 - uVar161)) =
                   *(undefined2 *)(digit_table + uVar107 * 2);
              *(undefined2 *)((long)puVar143 + (10 - uVar161)) =
                   *(undefined2 *)(digit_table + uVar120 * 2);
              iVar139 = uVar152 * -10000 + iVar139;
              if (iVar139 == 0) {
                lStack_120 = 0xc;
              }
              else {
                uVar120 = (uint)(iVar139 * 0x147b) >> 0x13;
                uVar107 = (ulong)uVar120;
                uVar120 = uVar120 * -100 + iVar139;
                *(undefined2 *)((long)puVar143 + (0xc - uVar161)) =
                     *(undefined2 *)(digit_table + uVar107 * 2);
                *(undefined2 *)((long)puVar143 + (0xe - uVar161)) =
                     *(undefined2 *)(digit_table + uVar120 * 2);
                lStack_120 = 0x10;
              }
              uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar107] + 2;
              if (uVar120 != 0) {
                uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar120];
              }
              uVar107 = lStack_120 - uVar107;
            }
            puVar155 = (uint *)((long)puVar143 + ((uVar107 & 0xffffffff) - uVar161));
            *(undefined2 *)puVar130 = 0x2e30;
            for (uVar107 = 0; -uVar142 != uVar107; uVar107 = uVar107 + 1) {
              *(undefined1 *)((long)puVar130 + uVar107 + 2) = 0x30;
            }
          }
          else {
            puVar143 = (undefined2 *)((long)puVar130 + (2 - (ulong)(uVar133 < 100000000)));
            *puVar130 = 0x3030303030303030;
            puVar130[1] = 0x3030303030303030;
            puVar130[2] = 0x3030303030303030;
            *(char *)((long)puVar130 + 1) = cVar131;
            uVar161 = (ulong)(uVar152 < 10 && uVar133 < 100000000);
            *puVar143 = *(undefined2 *)(digit_table + uVar161 + uVar152 * 2);
            *(undefined2 *)((long)puVar143 + (2 - uVar161)) =
                 *(undefined2 *)(digit_table + uVar148 * 2);
            if (iVar139 == 0) {
              if (iVar121 == 0) {
                uVar107 = 0;
                if (uVar148 == 0) {
                  uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar152];
                }
                uVar107 = 4 - (uVar107 + (byte)dec_trailing_zero_table[uVar148]);
              }
              else {
                uVar120 = (uint)(iVar121 * 0x147b) >> 0x13;
                uVar133 = uVar120 * -100 + iVar121;
                *(undefined2 *)((long)puVar143 + (4 - uVar161)) =
                     *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
                *(undefined2 *)((long)puVar143 + (6 - uVar161)) =
                     *(undefined2 *)(digit_table + uVar133 * 2);
                uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar120] + 2;
                if (uVar133 != 0) {
                  uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar133];
                }
                uVar107 = 8 - uVar107;
              }
            }
            else {
              uVar148 = (uint)(iVar121 * 0x147b) >> 0x13;
              uVar120 = (uint)((uVar107 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar152 = uVar120 >> 8;
              uVar133 = uVar152 * 0x147b >> 0x13;
              uVar107 = (ulong)uVar133;
              uVar120 = uVar133 * -100 + (uVar120 >> 8);
              *(undefined2 *)((long)puVar143 + (4 - uVar161)) =
                   *(undefined2 *)(digit_table + (ulong)uVar148 * 2);
              *(undefined2 *)((long)puVar143 + (6 - uVar161)) =
                   *(undefined2 *)(digit_table + (uVar148 * 0x7fffff9c + iVar121) * 2);
              *(undefined2 *)((long)puVar143 + (8 - uVar161)) =
                   *(undefined2 *)(digit_table + uVar107 * 2);
              *(undefined2 *)((long)puVar143 + (10 - uVar161)) =
                   *(undefined2 *)(digit_table + uVar120 * 2);
              iVar139 = uVar152 * -10000 + iVar139;
              if (iVar139 == 0) {
                lStack_120 = 0xc;
              }
              else {
                uVar120 = (uint)(iVar139 * 0x147b) >> 0x13;
                uVar107 = (ulong)uVar120;
                uVar120 = uVar120 * -100 + iVar139;
                *(undefined2 *)((long)puVar143 + (0xc - uVar161)) =
                     *(undefined2 *)(digit_table + uVar107 * 2);
                *(undefined2 *)((long)puVar143 + (0xe - uVar161)) =
                     *(undefined2 *)(digit_table + uVar120 * 2);
                lStack_120 = 0x10;
              }
              uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar107] + 2;
              if (uVar120 != 0) {
                uVar107 = (ulong)(byte)dec_trailing_zero_table[uVar120];
              }
              uVar107 = lStack_120 - uVar107;
            }
            puVar127 = (uint *)((long)puVar143 + ((uVar107 & 0xffffffff) - uVar161));
            for (uVar107 = 0; uVar142 != uVar107; uVar107 = uVar107 + 1) {
              *(byte *)((long)local_110 + uVar107 + lVar151) =
                   *(byte *)((long)local_110 + uVar107 + lVar151 + 1);
            }
            puVar160 = (undefined1 *)((long)puVar130 + (ulong)uVar142);
            puVar155 = (uint *)(puVar160 + 2);
            *puVar160 = 0x2e;
            if (puVar155 < puVar127) {
              puVar155 = puVar127;
            }
          }
          goto LAB_01f565ec;
        }
        lVar151 = 2 - (ulong)(uVar133 < 100000000);
        *(char *)((long)puVar130 + 1) = cVar131;
        uVar161 = (ulong)(uVar152 < 10 && uVar133 < 100000000);
        *(undefined2 *)((long)puVar130 + lVar151) =
             *(undefined2 *)(digit_table + uVar161 + uVar152 * 2);
        lVar151 = lVar151 - uVar161;
        *(undefined2 *)((long)puVar130 + lVar151 + 2) = *(undefined2 *)(digit_table + uVar148 * 2);
        if (iVar139 == 0) {
          if (iVar121 != 0) {
            uVar120 = (uint)(iVar121 * 0x147b) >> 0x13;
            uVar133 = uVar120 * -100 + iVar121;
            *(undefined2 *)((long)puVar130 + lVar151 + 4) =
                 *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
            *(undefined2 *)((long)puVar130 + lVar151 + 6) =
                 *(undefined2 *)(digit_table + uVar133 * 2);
            uVar120 = (byte)dec_trailing_zero_table[uVar120] + 2;
            if (uVar133 != 0) {
              uVar120 = (uint)(byte)dec_trailing_zero_table[uVar133];
            }
            iVar141 = 8;
            goto LAB_01f560c3;
          }
          uVar120 = 0;
          if (uVar148 == 0) {
            uVar120 = (uint)(byte)dec_trailing_zero_table[uVar152];
          }
          uVar120 = uVar120 + (byte)dec_trailing_zero_table[uVar148];
          iVar141 = 4;
LAB_01f563d6:
          uVar120 = iVar141 - uVar120;
        }
        else {
          uVar152 = (uint)(iVar121 * 0x147b) >> 0x13;
          uVar120 = (uint)((uVar107 & 0xffffffff) * 0x68db8bb >> 0x20);
          uVar157 = uVar120 >> 8;
          uVar148 = uVar157 * 0x147b >> 0x13;
          uVar133 = uVar148 * -100 + (uVar120 >> 8);
          *(undefined2 *)((long)puVar130 + lVar151 + 4) =
               *(undefined2 *)(digit_table + (ulong)uVar152 * 2);
          *(undefined2 *)((long)puVar130 + lVar151 + 6) =
               *(undefined2 *)(digit_table + (uVar152 * 0x7fffff9c + iVar121) * 2);
          *(undefined2 *)((long)puVar130 + lVar151 + 8) =
               *(undefined2 *)(digit_table + (ulong)uVar148 * 2);
          *(undefined2 *)((long)puVar130 + lVar151 + 10) =
               *(undefined2 *)(digit_table + uVar133 * 2);
          iVar139 = uVar157 * -10000 + iVar139;
          if (iVar139 == 0) {
            uVar120 = (byte)dec_trailing_zero_table[uVar148] + 2;
            if (uVar133 != 0) {
              uVar120 = (uint)(byte)dec_trailing_zero_table[uVar133];
            }
            iVar141 = 0xc;
            goto LAB_01f563d6;
          }
          uVar120 = (uint)(iVar139 * 0x147b) >> 0x13;
          uVar133 = uVar120 * -100 + iVar139;
          *(undefined2 *)((long)puVar130 + lVar151 + 0xc) =
               *(undefined2 *)(digit_table + (ulong)uVar120 * 2);
          *(undefined2 *)((long)puVar130 + lVar151 + 0xe) =
               *(undefined2 *)(digit_table + uVar133 * 2);
          uVar120 = (byte)dec_trailing_zero_table[uVar120] + 2;
          if (uVar133 != 0) {
            uVar120 = (uint)(byte)dec_trailing_zero_table[uVar133];
          }
          iVar141 = 0x10;
LAB_01f560c3:
          uVar120 = iVar141 - uVar120;
        }
        puVar143 = (undefined2 *)
                   ((long)puVar130 +
                   (((ulong)uVar120 + lVar151) - (ulong)((ulong)uVar120 + lVar151 == 2)));
        uVar142 = uVar142 - 1;
        *(undefined1 *)puVar130 = *(undefined1 *)((long)puVar130 + 1);
        *(undefined1 *)((long)puVar130 + 1) = 0x2e;
        *puVar143 = 0x2d65;
        uVar133 = uVar142 >> 0x1f;
        pcVar109 = (char *)((long)puVar143 + (ulong)uVar133 + 1);
        uVar120 = -uVar142;
        if (0 < (int)uVar142) {
          uVar120 = uVar142;
        }
        if (99 < uVar120) {
          *pcVar109 = (char)(uVar120 * 0x290 >> 0x10) + '0';
          *(undefined2 *)((long)puVar143 + (ulong)uVar133 + 2) =
               *(undefined2 *)(digit_table + ((uVar120 * 0x290 >> 0x10) * 0x7fffff9c + uVar120) * 2)
          ;
          puVar155 = (uint *)((long)puVar143 + (ulong)uVar133 + 4);
          goto LAB_01f565ec;
        }
        *(undefined2 *)pcVar109 =
             *(undefined2 *)(digit_table + (ulong)(uVar120 < 10) + (ulong)uVar120 * 2);
        puVar155 = (uint *)(pcVar109 + -(ulong)(uVar120 < 10));
LAB_01f54e3e:
        puVar155 = (uint *)((long)puVar155 + 2);
LAB_01f565ec:
        if (local_fc < '\0') {
          *(byte *)puVar155 = 10;
          puVar155 = (uint *)((long)puVar155 + 1);
        }
        *(byte *)puVar155 = 0;
        if (dat_len != (usize *)0x0) {
          *dat_len = (long)puVar155 - (long)local_110;
        }
        *(undefined8 *)pyVar119 = 0;
        pyVar119->msg = (char *)0x0;
        return (char *)local_110;
      }
      break;
    case 5:
switchD_01f4ef76_caseD_5:
      uVar161 = uVar107 >> 8;
      pbVar158 = (byte *)(val->uni).str;
      local_110 = (uint *)(*p_Var4)(pvVar6,uVar161 * 6 + 4);
      if (local_110 != (uint *)0x0) {
        if ((puVar160 != enc_table_cpy) || ((val->tag & 0x18) == 0)) {
          puVar127 = (uint *)(pbVar158 + uVar161);
          *(byte *)local_110 = 0x22;
          puVar155 = local_110;
LAB_01f55108:
          lVar153 = (long)puVar127 - (long)pbVar158;
          lVar151 = 0;
          while( true ) {
            puVar124 = (uint *)(pbVar158 + lVar151);
            puVar113 = (uint *)((long)puVar155 + lVar151 + 1);
            if (lVar153 < 0x10) break;
            bVar156 = (byte)*puVar124;
            if (puVar160[bVar156] != '\0') {
              puVar124 = (uint *)(pbVar158 + lVar151);
              puVar113 = (uint *)((long)puVar155 + lVar151 + 1);
              goto LAB_01f554dc;
            }
            if (puVar160[pbVar158[lVar151 + 1]] != '\0') {
              puVar124 = (uint *)(pbVar158 + lVar151);
              puVar113 = (uint *)((long)puVar155 + lVar151 + 1);
              goto LAB_01f554d0;
            }
            if (puVar160[pbVar158[lVar151 + 2]] != '\0') {
              puVar124 = (uint *)(pbVar158 + lVar151);
              puVar113 = (uint *)((long)puVar155 + lVar151 + 1);
              goto LAB_01f552fc;
            }
            if (puVar160[pbVar158[lVar151 + 3]] != '\0') {
              puVar124 = (uint *)(pbVar158 + lVar151);
              puVar113 = (uint *)((long)puVar155 + lVar151 + 1);
              goto LAB_01f5531e;
            }
            if (puVar160[pbVar158[lVar151 + 4]] != '\0') {
              puVar124 = (uint *)(pbVar158 + lVar151 + 4);
              puVar113 = (uint *)((long)puVar155 + lVar151 + 5);
              *(undefined4 *)((long)puVar155 + lVar151 + 1) = *(undefined4 *)(pbVar158 + lVar151);
              goto LAB_01f554dc;
            }
            if (puVar160[pbVar158[lVar151 + 5]] != '\0') {
              pbVar158 = pbVar158 + lVar151;
              puVar124 = (uint *)(pbVar158 + 5);
              puVar113 = (uint *)((long)puVar155 + lVar151 + 6);
              *(byte *)((long)puVar113 + -1) = pbVar158[4];
              *(undefined4 *)((long)puVar113 + -5) = *(undefined4 *)pbVar158;
              goto LAB_01f554dc;
            }
            if (puVar160[pbVar158[lVar151 + 6]] != '\0') {
              pbVar158 = pbVar158 + lVar151;
              puVar124 = (uint *)(pbVar158 + 6);
              puVar113 = (uint *)((long)puVar155 + lVar151 + 7);
              *(ushort *)((long)puVar113 + -2) = *(ushort *)(pbVar158 + 4);
              *(undefined4 *)((long)puVar113 + -6) = *(undefined4 *)pbVar158;
              goto LAB_01f554dc;
            }
            if (puVar160[pbVar158[lVar151 + 7]] != '\0') {
              pbVar158 = pbVar158 + lVar151;
              puVar124 = (uint *)(pbVar158 + 7);
              uVar3 = *(undefined4 *)pbVar158;
              puVar113 = (uint *)((long)puVar155 + lVar151 + 8);
              *(undefined4 *)((long)puVar155 + lVar151 + 4) = *(undefined4 *)(pbVar158 + 3);
              *(undefined4 *)((long)puVar155 + lVar151 + 1) = uVar3;
              goto LAB_01f554dc;
            }
            if (puVar160[pbVar158[lVar151 + 8]] != '\0') {
              puVar124 = (uint *)(pbVar158 + lVar151 + 8);
              puVar113 = (uint *)((long)puVar155 + lVar151 + 9);
              *(undefined8 *)((long)puVar155 + lVar151 + 1) = *(undefined8 *)(pbVar158 + lVar151);
              goto LAB_01f554dc;
            }
            if (puVar160[pbVar158[lVar151 + 9]] != '\0') {
              pbVar158 = pbVar158 + lVar151;
              puVar124 = (uint *)(pbVar158 + 9);
              puVar113 = (uint *)((long)puVar155 + lVar151 + 10);
              *(byte *)((long)puVar113 + -1) = pbVar158[8];
              *(undefined8 *)((long)puVar113 + -9) = *(undefined8 *)pbVar158;
              goto LAB_01f554dc;
            }
            if (puVar160[pbVar158[lVar151 + 10]] != '\0') {
              pbVar158 = pbVar158 + lVar151;
              puVar124 = (uint *)(pbVar158 + 10);
              puVar113 = (uint *)((long)puVar155 + lVar151 + 0xb);
              *(ushort *)((long)puVar113 + -2) = *(ushort *)(pbVar158 + 8);
              *(undefined8 *)((long)puVar113 + -10) = *(undefined8 *)pbVar158;
              goto LAB_01f554dc;
            }
            if (puVar160[pbVar158[lVar151 + 0xb]] != '\0') {
              pbVar158 = pbVar158 + lVar151;
              puVar124 = (uint *)(pbVar158 + 0xb);
              puVar113 = (uint *)((long)puVar155 + lVar151 + 0xc);
              puVar113[-1] = *(uint *)(pbVar158 + 7);
              *(undefined8 *)((long)puVar113 + -0xb) = *(undefined8 *)pbVar158;
              goto LAB_01f554dc;
            }
            if (puVar160[pbVar158[lVar151 + 0xc]] != '\0') {
              pbVar158 = pbVar158 + lVar151;
              puVar124 = (uint *)(pbVar158 + 0xc);
              puVar113 = (uint *)((long)puVar155 + lVar151 + 0xd);
              puVar113[-1] = *(uint *)(pbVar158 + 8);
              *(undefined8 *)(puVar113 + -3) = *(undefined8 *)pbVar158;
              goto LAB_01f554dc;
            }
            if (puVar160[pbVar158[lVar151 + 0xd]] != '\0') {
              pbVar158 = pbVar158 + lVar151;
              puVar124 = (uint *)(pbVar158 + 0xd);
              uVar114 = *(undefined8 *)pbVar158;
              puVar113 = (uint *)((long)puVar155 + lVar151 + 0xe);
              *(undefined8 *)((long)puVar155 + lVar151 + 6) = *(undefined8 *)(pbVar158 + 5);
              *(undefined8 *)((long)puVar155 + lVar151 + 1) = uVar114;
              goto LAB_01f554dc;
            }
            if (puVar160[pbVar158[lVar151 + 0xe]] != '\0') {
              pbVar158 = pbVar158 + lVar151;
              puVar124 = (uint *)(pbVar158 + 0xe);
              uVar114 = *(undefined8 *)pbVar158;
              puVar113 = (uint *)((long)puVar155 + lVar151 + 0xf);
              *(undefined8 *)((long)puVar155 + lVar151 + 7) = *(undefined8 *)(pbVar158 + 6);
              *(undefined8 *)((long)puVar155 + lVar151 + 1) = uVar114;
              goto LAB_01f554dc;
            }
            if (puVar160[pbVar158[lVar151 + 0xf]] != '\0') {
              pbVar158 = pbVar158 + lVar151;
              puVar124 = (uint *)(pbVar158 + 0xf);
              uVar114 = *(undefined8 *)pbVar158;
              puVar113 = (uint *)((long)puVar155 + lVar151 + 0x10);
              *(undefined8 *)((long)puVar155 + lVar151 + 8) = *(undefined8 *)(pbVar158 + 7);
              *(undefined8 *)((long)puVar155 + lVar151 + 1) = uVar114;
              goto LAB_01f554dc;
            }
            uVar120 = puVar124[1];
            uVar133 = puVar124[2];
            uVar142 = puVar124[3];
            *puVar113 = *puVar124;
            *(uint *)((long)puVar155 + lVar151 + 5) = uVar120;
            *(uint *)((long)puVar155 + lVar151 + 9) = uVar133;
            *(uint *)((long)puVar155 + lVar151 + 0xd) = uVar142;
            lVar151 = lVar151 + 0x10;
            lVar153 = lVar153 + -0x10;
          }
LAB_01f55260:
          if (3 < lVar153) {
            if (puVar160[(byte)*puVar124] == '\0') {
              if (puVar160[*(byte *)((long)puVar124 + 1)] == '\0') {
                if (puVar160[*(byte *)((long)puVar124 + 2)] == '\0') {
                  if (puVar160[*(byte *)((long)puVar124 + 3)] == '\0') goto LAB_01f5524e;
LAB_01f5531e:
                  *(byte *)((long)puVar113 + 2) = *(byte *)((long)puVar124 + 2);
                  *(ushort *)puVar113 = (ushort)*puVar124;
                  puVar113 = (uint *)((long)puVar113 + 3);
                  puVar124 = (uint *)((long)puVar124 + 3);
                }
                else {
LAB_01f552fc:
                  *(ushort *)puVar113 = (ushort)*puVar124;
                  puVar113 = (uint *)((long)puVar113 + 2);
                  puVar124 = (uint *)((long)puVar124 + 2);
                }
              }
              else {
                bVar156 = (byte)*puVar124;
LAB_01f554d0:
                *(byte *)puVar113 = bVar156;
                puVar113 = (uint *)((long)puVar113 + 1);
                puVar124 = (uint *)((long)puVar124 + 1);
              }
            }
            goto LAB_01f554dc;
          }
          goto LAB_01f552a8;
        }
        *(byte *)local_110 = 0x22;
        puVar155 = (uint *)((long)local_110 + 2);
        for (uVar106 = uVar161; 0xf < uVar106; uVar106 = uVar106 - 0x10) {
          uVar114 = *(undefined8 *)(pbVar158 + 8);
          *(undefined8 *)((long)puVar155 + -1) = *(undefined8 *)pbVar158;
          *(undefined8 *)((long)puVar155 + 7) = uVar114;
          pbVar158 = pbVar158 + 0x10;
          puVar155 = puVar155 + 4;
        }
        for (uVar161 = uVar161 - (uVar107 >> 8 & 0xfffffffffffffff0); 3 < uVar161;
            uVar161 = uVar161 - 4) {
          *(undefined4 *)((long)puVar155 + -1) = *(undefined4 *)pbVar158;
          pbVar158 = pbVar158 + 4;
          puVar155 = puVar155 + 1;
        }
        for (uVar107 = 0; uVar161 != uVar107; uVar107 = uVar107 + 1) {
          *(byte *)((long)puVar155 + -1) = pbVar158[uVar107];
          puVar155 = (uint *)((long)puVar155 + 1);
        }
        *(byte *)((long)puVar155 + -1) = 0x22;
        goto LAB_01f565ec;
      }
      break;
    case 6:
switchD_01f4ef76_caseD_6:
      puVar155 = (uint *)(*p_Var4)(pvVar6,4);
      if (puVar155 != (uint *)0x0) {
        *(ushort *)puVar155 = 0x5d5b;
        local_110 = puVar155;
        goto LAB_01f54e3e;
      }
      break;
    case 7:
switchD_01f4ef76_caseD_7:
      puVar155 = (uint *)(*p_Var4)(pvVar6,4);
      if (puVar155 != (uint *)0x0) {
        *(ushort *)puVar155 = 0x7d7b;
        local_110 = puVar155;
        goto LAB_01f54e3e;
      }
    }
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar118 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar118 = err;
    }
    pyVar119->code = 2;
    pcVar109 = "memory allocation failed";
  }
  else {
    puVar160 = enc_table_esc_slash;
    if ((flg & 4) == 0) {
      puVar160 = enc_table_esc;
    }
    switch(bVar156 & 7) {
    case 1:
      goto switchD_01f4ef76_caseD_1;
    case 2:
      goto switchD_01f4ef76_caseD_2;
    case 3:
      goto switchD_01f4ef76_caseD_3;
    case 4:
      goto switchD_01f4ef76_caseD_4;
    case 5:
      goto switchD_01f4ef76_caseD_5;
    case 6:
      goto switchD_01f4ef76_caseD_6;
    case 7:
      goto switchD_01f4ef76_caseD_7;
    }
switchD_01f4ef76_caseD_0:
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar118 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar118 = err;
    }
    pyVar119->code = 3;
    pcVar109 = "invalid JSON value type";
  }
LAB_01f54e81:
  pyVar118->msg = pcVar109;
  return (char *)0x0;
LAB_01f5524e:
  *puVar113 = *puVar124;
  puVar113 = puVar113 + 1;
  puVar124 = puVar124 + 1;
  lVar153 = lVar153 + -4;
  goto LAB_01f55260;
LAB_01f552a8:
  if (puVar127 <= puVar124) {
    *(byte *)puVar113 = 0x22;
    puVar155 = (uint *)((long)puVar113 + 1);
    goto LAB_01f565ec;
  }
  uVar120 = *puVar124;
  if (puVar160[(byte)uVar120] != '\0') goto LAB_01f554dc;
  puVar124 = (uint *)((long)puVar124 + 1);
  *(byte *)puVar113 = (byte)uVar120;
  puVar113 = (uint *)((long)puVar113 + 1);
  goto LAB_01f552a8;
LAB_01f554dc:
  puVar155 = puVar124 + 1;
  if (puVar127 < puVar155) {
    if (puVar127 == puVar124) goto switchD_01f55507_default;
    bVar156 = (byte)*puVar124;
    uVar107 = (ulong)bVar156;
    bVar1 = puVar160[uVar107];
    if ((long)(ulong)(bVar1 >> 1) <= (long)puVar127 - (long)puVar124) goto LAB_01f554f4;
switchD_01f55507_caseD_1:
    if ((flg & 2) != 0) goto LAB_01f5562e;
    goto LAB_01f557e5;
  }
  bVar156 = (byte)*puVar124;
  uVar107 = (ulong)bVar156;
  bVar1 = puVar160[uVar107];
LAB_01f554f4:
  switch(bVar1) {
  case 0:
    goto switchD_01f55507_caseD_0;
  case 1:
    goto switchD_01f55507_caseD_1;
  case 2:
    *(ushort *)puVar113 = *(ushort *)(esc_single_char_table + uVar107 * 2);
    puVar113 = (uint *)((long)puVar113 + 2);
    puVar124 = (uint *)((long)puVar124 + 1);
    goto LAB_01f554dc;
  case 3:
    *puVar113 = 0x3030755c;
    *(ushort *)(puVar113 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar124 * 2);
    goto LAB_01f55644;
  case 4:
    uVar2 = (ushort)*puVar124;
    bVar156 = (byte)uVar2;
    if (((uVar2 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)puVar113 = uVar2;
      puVar113 = (uint *)((long)puVar113 + 2);
      puVar124 = (uint *)((long)puVar124 + 2);
      goto LAB_01f554dc;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar124;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_01f5562e;
    *(ushort *)puVar113 = 0x755c;
    *(ushort *)((long)puVar113 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(puVar113 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    puVar113 = (uint *)((long)puVar113 + 6);
    puVar124 = (uint *)((long)puVar124 + 2);
    goto LAB_01f554dc;
  case 6:
    if (puVar127 < puVar155) {
      uVar2 = (ushort)*puVar124;
      bVar156 = (byte)uVar2;
      uVar120 = (uint)(uint3)*puVar124;
      if ((((uVar120 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
         ((uVar2 & 0x200f) != 0x200d)) goto LAB_01f555e2;
    }
    else {
      uVar120 = *puVar124;
      bVar156 = (byte)uVar120;
      if ((((uVar120 & 0xc0c0f0) == 0x8080e0) && ((uVar120 & 0x200f) != 0)) &&
         ((uVar120 & 0x200f) != 0x200d)) {
LAB_01f555e2:
        *puVar113 = uVar120;
        puVar113 = (uint *)((long)puVar113 + 3);
        puVar124 = (uint *)((long)puVar124 + 3);
        goto LAB_01f554dc;
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar124;
    bVar156 = *(byte *)((long)puVar124 + 2);
    if ((((*puVar124 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar120 = *puVar124;
      *(ushort *)puVar113 = 0x755c;
      *(ushort *)((long)puVar113 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar120 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar113 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar156 & 0x3f) * 2);
      puVar113 = (uint *)((long)puVar113 + 6);
      puVar124 = (uint *)((long)puVar124 + 3);
    }
    else {
LAB_01f5562e:
      if ((flg & 0x20) == 0) goto LAB_01f55f40;
      *(ushort *)puVar113 = 0x755c;
      ((ushort *)((long)puVar113 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar113 + 2))[1] = 0x4446;
LAB_01f55644:
      puVar113 = (uint *)((long)puVar113 + 6);
      puVar124 = (uint *)((long)puVar124 + 1);
    }
    goto LAB_01f554dc;
  case 8:
    uVar120 = *puVar124;
    bVar156 = (byte)uVar120;
    if ((((uVar120 & 0xc0c0c0f8) == 0x808080f0) && ((uVar120 & 0x3007) != 0)) &&
       ((bVar156 >> 2 & (uVar120 & 0x3003) != 0) == 0)) {
      *puVar113 = uVar120;
      puVar113 = puVar113 + 1;
      puVar124 = puVar155;
      goto LAB_01f554dc;
    }
    break;
  case 9:
    uVar120 = *puVar124;
    if ((((uVar120 & 0xc0c0c0f8) != 0x808080f0) || ((uVar120 & 0x3007) == 0)) ||
       (((byte)uVar120 >> 2 & (uVar120 & 0x3003) != 0) != 0)) goto LAB_01f5562e;
    iVar141 = (uVar120 & 7) * 0x40000;
    iVar139 = (uVar120 & 0x3f00) * 0x10;
    *(ushort *)puVar113 = 0x755c;
    *(ushort *)((long)puVar113 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar141 + iVar139) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar113 + 1) =
         *(ushort *)
          (esc_hex_char_table +
          (((uVar120 >> 10 & 0xc00) - 0x10000) + iVar141 + iVar139 >> 9 & 0x1fe));
    *(ushort *)((long)puVar113 + 6) = 0x755c;
    *(ushort *)(puVar113 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar120 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar113 + 10) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(uVar120 >> 10 & 0xc0 | uVar120 >> 0x18 & 0x3f) * 2);
    puVar113 = puVar113 + 3;
    puVar124 = puVar155;
    goto LAB_01f554dc;
  default:
switchD_01f55507_default:
    *(byte *)puVar113 = 0x22;
    puVar155 = (uint *)((long)puVar113 + 1);
    goto LAB_01f565ec;
  }
LAB_01f557e5:
  if ((flg & 0x20) == 0) {
LAB_01f55f40:
    (*p_Var5)(pvVar6,local_110);
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar118 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar118 = err;
    }
    pyVar119->code = 7;
    pcVar109 = "invalid utf-8 encoding in string";
    goto LAB_01f54e81;
  }
  *(byte *)puVar113 = bVar156;
  puVar113 = (uint *)((long)puVar113 + 1);
  puVar124 = (uint *)((long)puVar124 + 1);
  goto LAB_01f554dc;
switchD_01f55507_caseD_0:
  pbVar158 = (byte *)((long)puVar124 + 1);
  *(byte *)puVar113 = bVar156;
  puVar155 = puVar113;
  goto LAB_01f55108;
LAB_01f527a4:
  *puVar129 = *puVar127;
  puVar129 = puVar129 + 1;
  puVar127 = puVar127 + 1;
  lVar150 = lVar150 + -4;
  goto LAB_01f527b4;
LAB_01f527f7:
  if (puVar155 <= puVar127) goto switchD_01f52a3a_default;
  uVar120 = *puVar127;
  if (puVar160[(byte)uVar120] != '\0') goto LAB_01f52a0d;
  puVar127 = (uint *)((long)puVar127 + 1);
  *(byte *)puVar129 = (byte)uVar120;
  puVar129 = (uint *)((long)puVar129 + 1);
  goto LAB_01f527f7;
LAB_01f52a0d:
  puVar124 = puVar127 + 1;
  if (puVar155 < puVar124) {
    if (puVar155 != puVar127) {
      bVar156 = (byte)*puVar127;
      uVar107 = (ulong)bVar156;
      bVar1 = puVar160[uVar107];
      if ((long)(ulong)(bVar1 >> 1) <= (long)puVar155 - (long)puVar127) goto LAB_01f52a24;
switchD_01f52a3a_caseD_1:
      if ((flg & 2) != 0) goto LAB_01f52b48;
      goto LAB_01f52cfd;
    }
    goto switchD_01f52a3a_default;
  }
  bVar156 = (byte)*puVar127;
  uVar107 = (ulong)bVar156;
  bVar1 = puVar160[uVar107];
LAB_01f52a24:
  switch(bVar1) {
  case 0:
    goto switchD_01f52a3a_caseD_0;
  case 1:
    goto switchD_01f52a3a_caseD_1;
  case 2:
    *(ushort *)puVar129 = *(ushort *)(esc_single_char_table + uVar107 * 2);
    puVar129 = (uint *)((long)puVar129 + 2);
    puVar127 = (uint *)((long)puVar127 + 1);
    goto LAB_01f52a0d;
  case 3:
    *puVar129 = 0x3030755c;
    *(ushort *)(puVar129 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar127 * 2);
    goto LAB_01f52b5e;
  case 4:
    uVar2 = (ushort)*puVar127;
    bVar156 = (byte)uVar2;
    if (((uVar2 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)puVar129 = uVar2;
      puVar129 = (uint *)((long)puVar129 + 2);
      puVar127 = (uint *)((long)puVar127 + 2);
      goto LAB_01f52a0d;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar127;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_01f52b48;
    *(ushort *)puVar129 = 0x755c;
    *(ushort *)((long)puVar129 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(puVar129 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    puVar129 = (uint *)((long)puVar129 + 6);
    puVar127 = (uint *)((long)puVar127 + 2);
    goto LAB_01f52a0d;
  case 6:
    if (puVar155 < puVar124) {
      uVar2 = (ushort)*puVar127;
      bVar156 = (byte)uVar2;
      uVar120 = (uint)(uint3)*puVar127;
      if (((uVar120 & 0xc0c0f0) == 0x8080e0) &&
         (uVar142 = uVar2 & 0x200f, uVar133 = (uint)uVar2, (uVar2 & 0x200f) != 0))
      goto LAB_01f52afb;
    }
    else {
      uVar120 = *puVar127;
      if (((uVar120 & 0xc0c0f0) == 0x8080e0) &&
         (uVar142 = uVar120 & 0x200f, uVar133 = uVar120, uVar142 != 0)) {
LAB_01f52afb:
        bVar156 = (byte)uVar133;
        if (uVar142 != 0x200d) {
          *puVar129 = uVar120;
          puVar129 = (uint *)((long)puVar129 + 3);
          puVar127 = (uint *)((long)puVar127 + 3);
          goto LAB_01f52a0d;
        }
      }
      else {
        bVar156 = (byte)uVar120;
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar127;
    bVar156 = *(byte *)((long)puVar127 + 2);
    if ((((*puVar127 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar120 = *puVar127;
      *(ushort *)puVar129 = 0x755c;
      *(ushort *)((long)puVar129 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar120 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar129 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar156 & 0x3f) * 2);
      puVar129 = (uint *)((long)puVar129 + 6);
      puVar127 = (uint *)((long)puVar127 + 3);
    }
    else {
LAB_01f52b48:
      if ((flg & 0x20) == 0) goto LAB_01f54ab2;
      *(ushort *)puVar129 = 0x755c;
      ((ushort *)((long)puVar129 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar129 + 2))[1] = 0x4446;
LAB_01f52b5e:
      puVar129 = (uint *)((long)puVar129 + 6);
      puVar127 = (uint *)((long)puVar127 + 1);
    }
    goto LAB_01f52a0d;
  case 8:
    uVar120 = *puVar127;
    bVar156 = (byte)uVar120;
    if ((((uVar120 & 0xc0c0c0f8) == 0x808080f0) && ((uVar120 & 0x3007) != 0)) &&
       ((bVar156 >> 2 & (uVar120 & 0x3003) != 0) == 0)) {
      *puVar129 = uVar120;
      puVar129 = puVar129 + 1;
      puVar127 = puVar124;
      goto LAB_01f52a0d;
    }
    break;
  case 9:
    uVar120 = *puVar127;
    if ((((uVar120 & 0xc0c0c0f8) != 0x808080f0) || ((uVar120 & 0x3007) == 0)) ||
       (((byte)uVar120 >> 2 & (uVar120 & 0x3003) != 0) != 0)) goto LAB_01f52b48;
    iVar141 = (uVar120 & 7) * 0x40000;
    iVar139 = (uVar120 & 0x3f00) * 0x10;
    *(ushort *)puVar129 = 0x755c;
    *(ushort *)((long)puVar129 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar141 + iVar139) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar129 + 1) =
         *(ushort *)
          (esc_hex_char_table +
          (((uVar120 >> 10 & 0xc00) + iVar141 + iVar139) - 0x10000 >> 9 & 0x1fe));
    *(ushort *)((long)puVar129 + 6) = 0x755c;
    *(ushort *)(puVar129 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar120 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar129 + 10) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(uVar120 >> 10 & 0xc0 | uVar120 >> 0x18 & 0x3f) * 2);
    puVar129 = puVar129 + 3;
    puVar127 = puVar124;
    goto LAB_01f52a0d;
  default:
    goto switchD_01f52a3a_default;
  }
LAB_01f52cfd:
  if ((flg & 0x20) == 0) goto LAB_01f54ab2;
  *(byte *)puVar129 = bVar156;
  puVar129 = (uint *)((long)puVar129 + 1);
  puVar127 = (uint *)((long)puVar127 + 1);
  goto LAB_01f52a0d;
switchD_01f52a3a_caseD_0:
  pbVar158 = (byte *)((long)puVar127 + 1);
  *(byte *)puVar129 = bVar156;
  puVar124 = puVar129;
  goto LAB_01f52666;
LAB_01f54b90:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar118 = &dummy_err;
  if (err != (yyjson_write_err *)0x0) {
    pyVar118 = err;
  }
  pyVar119->code = 4;
  pcVar109 = "nan or inf number is not allowed";
  goto LAB_01f54aec;
code_r0x01f4f797:
  *puVar113 = *puVar124;
  puVar113 = puVar113 + 1;
  puVar124 = puVar124 + 1;
  lVar140 = lVar140 + -4;
  goto LAB_01f4f75a;
LAB_01f4f7b0:
  if (puVar127 <= puVar124) goto switchD_01f4fa83_default;
  uVar142 = *puVar124;
  if (puVar132[(byte)uVar142] != '\0') goto LAB_01f4fa54;
  puVar124 = (uint *)((long)puVar124 + 1);
  *(byte *)puVar113 = (byte)uVar142;
  puVar113 = (uint *)((long)puVar113 + 1);
  goto LAB_01f4f7b0;
LAB_01f4fa54:
  puVar155 = puVar124 + 1;
  if (puVar127 < puVar155) {
    if (puVar127 != puVar124) {
      uVar142 = (uint)(byte)*puVar124;
      uVar123 = (ulong)(byte)*puVar124;
      bVar156 = puVar132[uVar123];
      if ((long)(ulong)(bVar156 >> 1) <= (long)puVar127 - (long)puVar124) goto LAB_01f4fa6d;
switchD_01f4fa83_caseD_1:
      if ((flg & 2) != 0) goto LAB_01f4fb86;
      goto LAB_01f4fd1e;
    }
    goto switchD_01f4fa83_default;
  }
  uVar142 = (uint)(byte)*puVar124;
  uVar123 = (ulong)(byte)*puVar124;
  bVar156 = puVar132[uVar123];
LAB_01f4fa6d:
  switch(bVar156) {
  case 0:
    goto switchD_01f4fa83_caseD_0;
  case 1:
    goto switchD_01f4fa83_caseD_1;
  case 2:
    *(ushort *)puVar113 = *(ushort *)(esc_single_char_table + uVar123 * 2);
    puVar113 = (uint *)((long)puVar113 + 2);
    puVar124 = (uint *)((long)puVar124 + 1);
    goto LAB_01f4fa54;
  case 3:
    *puVar113 = 0x3030755c;
    *(ushort *)(puVar113 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar124 * 2);
    goto LAB_01f4fb9c;
  case 4:
    uVar2 = (ushort)*puVar124;
    uVar142 = (uint)uVar2;
    if (((uVar142 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)puVar113 = uVar2;
      puVar113 = (uint *)((long)puVar113 + 2);
      puVar124 = (uint *)((long)puVar124 + 2);
      goto LAB_01f4fa54;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar124;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_01f4fb86;
    *(ushort *)puVar113 = 0x755c;
    *(ushort *)((long)puVar113 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(puVar113 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    puVar113 = (uint *)((long)puVar113 + 6);
    puVar124 = (uint *)((long)puVar124 + 2);
    goto LAB_01f4fa54;
  case 6:
    if (puVar127 < puVar155) {
      uVar2 = (ushort)*puVar124;
      uVar142 = (uint)uVar2;
      uVar148 = (uint)(uint3)*puVar124;
      if (((uVar148 & 0xc0c0f0) == 0x8080e0) && (uVar152 = uVar2 & 0x200f, (uVar2 & 0x200f) != 0))
      goto LAB_01f4fb3e;
    }
    else {
      uVar148 = *puVar124;
      uVar142 = uVar148;
      if (((uVar148 & 0xc0c0f0) == 0x8080e0) && (uVar152 = uVar148 & 0x200f, uVar152 != 0)) {
LAB_01f4fb3e:
        if (uVar152 != 0x200d) {
          *puVar113 = uVar148;
          puVar113 = (uint *)((long)puVar113 + 3);
          puVar124 = (uint *)((long)puVar124 + 3);
          goto LAB_01f4fa54;
        }
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar124;
    bVar156 = *(byte *)((long)puVar124 + 2);
    if ((((*puVar124 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar142 = *puVar124;
      *(ushort *)puVar113 = 0x755c;
      *(ushort *)((long)puVar113 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar142 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar113 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar156 & 0x3f) * 2);
      puVar113 = (uint *)((long)puVar113 + 6);
      puVar124 = (uint *)((long)puVar124 + 3);
    }
    else {
LAB_01f4fb86:
      if ((flg & 0x20) == 0) goto LAB_01f54ab2;
      *(ushort *)puVar113 = 0x755c;
      ((ushort *)((long)puVar113 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar113 + 2))[1] = 0x4446;
LAB_01f4fb9c:
      puVar113 = (uint *)((long)puVar113 + 6);
      puVar124 = (uint *)((long)puVar124 + 1);
    }
    goto LAB_01f4fa54;
  case 8:
    uVar142 = *puVar124;
    if ((((uVar142 & 0xc0c0c0f8) == 0x808080f0) && ((uVar142 & 0x3007) != 0)) &&
       (((byte)(uVar142 >> 2) & 0x3f & (uVar142 & 0x3003) != 0) == 0)) {
      *puVar113 = uVar142;
      puVar113 = puVar113 + 1;
      puVar124 = puVar155;
      goto LAB_01f4fa54;
    }
    break;
  case 9:
    uVar142 = *puVar124;
    if ((((uVar142 & 0xc0c0c0f8) != 0x808080f0) || ((uVar142 & 0x3007) == 0)) ||
       (((byte)uVar142 >> 2 & (uVar142 & 0x3003) != 0) != 0)) goto LAB_01f4fb86;
    iVar141 = (uVar142 & 7) * 0x40000;
    iVar139 = (uVar142 & 0x3f00) * 0x10;
    *(ushort *)puVar113 = 0x755c;
    *(ushort *)((long)puVar113 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar141 + iVar139) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar113 + 1) =
         *(ushort *)
          (esc_hex_char_table +
          (((uVar142 >> 10 & 0xc00) + iVar141 + iVar139) - 0x10000 >> 9 & 0x1fe));
    *(ushort *)((long)puVar113 + 6) = 0x755c;
    *(ushort *)(puVar113 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar142 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar113 + 10) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(uVar142 >> 10 & 0xc0 | uVar142 >> 0x18 & 0x3f) * 2);
    puVar113 = puVar113 + 3;
    puVar124 = puVar155;
    goto LAB_01f4fa54;
  default:
    goto switchD_01f4fa83_default;
  }
LAB_01f4fd1e:
  if ((flg & 0x20) == 0) goto LAB_01f54ab2;
  *(byte *)puVar113 = (byte)uVar142;
  puVar113 = (uint *)((long)puVar113 + 1);
  puVar124 = (uint *)((long)puVar124 + 1);
  goto LAB_01f4fa54;
LAB_01f54ab2:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar118 = &dummy_err;
  if (err != (yyjson_write_err *)0x0) {
    pyVar118 = err;
  }
  pyVar119->code = 7;
  pcVar109 = "invalid utf-8 encoding in string";
  goto LAB_01f54aec;
switchD_01f4fa83_caseD_0:
  pbVar158 = (byte *)((long)puVar124 + 1);
  *(byte *)puVar113 = (byte)uVar142;
  puVar155 = puVar113;
  goto LAB_01f4f616;
  while( true ) {
    pyVar136 = local_80->next;
    local_f8 = puVar128 + 2;
    uVar161 = *puVar128;
    local_80 = (yyjson_mut_val *)puVar128[1];
    local_40 = uVar161 & 0xffffffffffffff01;
    puVar155 = (uint *)(pbVar112 + 2);
    pbVar112[0] = 0x2c;
    pbVar112[1] = 10;
    lVar153 = (uVar161 >> 1) - 1;
    sVar159 = sVar135;
    lVar138 = lVar150;
    if (lVar153 != 0) break;
LAB_01f51f77:
    pbVar158 = (byte *)((long)puVar155 + -1);
    *(byte *)((long)puVar155 + -2) = 10;
    puVar128 = local_f8;
    sVar135 = sVar159;
    if (local_f8 <= (ulong *)(lVar138 * 4 + -1 + (long)puVar155)) {
      uVar161 = sVar159 >> 1;
      if (sVar159 >> 1 <= (ulong)(lVar138 * 4)) {
        uVar161 = lVar138 * 4;
      }
      sVar135 = (uVar161 + 0xf & 0xfffffffffffffff0) + sVar159;
      pbVar112 = (byte *)(*p_Var7)(pvVar6,local_110,sVar159,sVar135);
      if (pbVar112 == (byte *)0x0) goto LAB_01f54af9;
      puVar128 = (ulong *)(pbVar112 + (sVar135 - ((long)local_b0 - (long)local_f8)));
      memmove(puVar128,pbVar112 + ((long)local_f8 - (long)local_110),(long)local_b0 - (long)local_f8
             );
      pbVar158 = pbVar112 + ((long)pbVar158 - (long)local_110);
      local_b0 = (ulong *)(pbVar112 + sVar135);
      local_110 = (uint *)pbVar112;
    }
    lVar150 = lVar138 + -1;
    pbVar112 = pbVar158 + 1;
    pbVar158 = (byte *)((long)local_110 + ~(ulong)pbVar158);
    for (lVar153 = 1; lVar138 != lVar153; lVar153 = lVar153 + 1) {
      pbVar112[-1] = 0x20;
      pbVar112[0] = 0x20;
      pbVar112[1] = 0x20;
      pbVar112[2] = 0x20;
      pbVar112 = pbVar112 + lVar151;
      pbVar158 = pbVar158 + -lVar151;
    }
    pbVar112[-1] = (char)local_40 * ' ' + 0x5d;
    if (local_b0 <= puVar128) {
      if (local_fc < '\0') {
        if (puVar128 <= pbVar112 + 2) {
          uVar107 = 2;
          if (2 < sVar135 >> 1) {
            uVar107 = sVar135 >> 1;
          }
          sVar159 = (uVar107 + 0xf & 0xfffffffffffffff0) + sVar135;
          pbVar110 = (byte *)(*p_Var7)(pvVar6,local_110,sVar135,sVar159);
          if (pbVar110 == (byte *)0x0) goto LAB_01f54af9;
          memmove(pbVar110 + (sVar159 - ((long)local_b0 - (long)puVar128)),
                  pbVar110 + ((long)puVar128 - (long)local_110),(long)local_b0 - (long)puVar128);
          pbVar112 = pbVar110 + -(long)pbVar158;
          local_110 = (uint *)pbVar110;
        }
        *pbVar112 = 10;
        pbVar112 = pbVar112 + 1;
      }
      *pbVar112 = 0;
      if (dat_len != (usize *)0x0) {
        *dat_len = (long)pbVar112 - (long)local_110;
      }
LAB_01f56cca:
      pyVar119->code = 0;
      pyVar119 = &dummy_err;
      if (err != (yyjson_write_err *)0x0) {
        pyVar119 = err;
      }
      pyVar119->msg = "success";
      return (char *)(byte *)local_110;
    }
  }
  puVar155 = (uint *)(pbVar112 + 2);
  goto LAB_01f4f090;
LAB_01f54b51:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar118 = &dummy_err;
  if (err != (yyjson_write_err *)0x0) {
    pyVar118 = err;
  }
  pyVar119->code = 3;
  pcVar109 = "invalid JSON value type";
LAB_01f54aec:
  pyVar118->msg = pcVar109;
LAB_01f54b37:
  if (local_110 != (uint *)0x0) {
    (*p_Var5)(pvVar6,local_110);
  }
  return (char *)0x0;
}

Assistant:

static char *yyjson_mut_write_opts_impl(const yyjson_mut_val *val,
                                        usize estimated_val_num,
                                        yyjson_write_flag flg,
                                        const yyjson_alc *alc_ptr,
                                        usize *dat_len,
                                        yyjson_write_err *err) {
    yyjson_write_err dummy_err;
    usize dummy_dat_len;
    yyjson_alc alc = alc_ptr ? *alc_ptr : YYJSON_DEFAULT_ALC;
    yyjson_mut_val *root = constcast(yyjson_mut_val *)val;

    err = err ? err : &dummy_err;
    dat_len = dat_len ? dat_len : &dummy_dat_len;

    if (unlikely(!root)) {
        *dat_len = 0;
        err->msg = "input JSON is NULL";
        err->code = YYJSON_WRITE_ERROR_INVALID_PARAMETER;
        return NULL;
    }

    if (!unsafe_yyjson_is_ctn(root) || unsafe_yyjson_get_len(root) == 0) {
        return (char *)yyjson_mut_write_single(root, flg, alc, dat_len, err);
    } else if (flg & (YYJSON_WRITE_PRETTY | YYJSON_WRITE_PRETTY_TWO_SPACES)) {
        return (char *)yyjson_mut_write_pretty(root, estimated_val_num,
                                               flg, alc, dat_len, err);
    } else {
        return (char *)yyjson_mut_write_minify(root, estimated_val_num,
                                               flg, alc, dat_len, err);
    }
}